

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [28];
  undefined4 uVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  Primitive PVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  uint uVar122;
  int iVar123;
  RTCIntersectArguments *pRVar124;
  ulong uVar125;
  ulong uVar126;
  uint uVar127;
  long lVar128;
  long lVar129;
  float fVar130;
  vint4 bi_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar143;
  float fVar144;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar145;
  float fVar158;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar160;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar159;
  undefined1 auVar156 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar169;
  float fVar170;
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar171;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar172;
  undefined1 auVar168 [32];
  float fVar173;
  float fVar174;
  float fVar187;
  float fVar189;
  vint4 ai_1;
  undefined1 auVar175 [16];
  float fVar191;
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  float fVar188;
  float fVar193;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar177 [16];
  float fVar194;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar190;
  float fVar192;
  float fVar195;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar199;
  float fVar200;
  float fVar209;
  float fVar211;
  vint4 ai_2;
  undefined1 auVar201 [16];
  float fVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar210;
  float fVar212;
  undefined1 auVar204 [32];
  float fVar214;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar216;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar227;
  float fVar231;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar240;
  undefined1 auVar239 [32];
  float fVar241;
  float fVar242;
  float fVar250;
  float fVar251;
  vint4 ai;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [32];
  float fVar257;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar265;
  float fVar266;
  float fVar268;
  undefined1 auVar261 [32];
  float fVar267;
  undefined1 auVar262 [32];
  float fVar269;
  float fVar276;
  float fVar277;
  undefined1 auVar270 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar286;
  float fVar287;
  undefined1 auVar283 [16];
  float fVar288;
  float fVar289;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar292 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar293 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar317;
  undefined1 auVar318 [32];
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar319 [64];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_811;
  int local_804;
  undefined1 local_800 [4];
  undefined1 auStack_7fc [8];
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint local_7e0;
  undefined4 uStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  ulong local_7b0;
  Precalculations *local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [48];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [48];
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined4 local_698;
  float local_694;
  uint local_690;
  undefined4 local_68c;
  undefined4 local_688;
  uint local_684;
  uint local_680;
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 auStack_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar150 [24];
  
  PVar13 = prim[1];
  uVar125 = (ulong)(byte)PVar13;
  lVar18 = uVar125 * 0x25;
  fVar282 = *(float *)(prim + lVar18 + 0x12);
  auVar325 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar18 + 6));
  auVar243._0_4_ = fVar282 * (ray->dir).field_0.m128[0];
  auVar243._4_4_ = fVar282 * (ray->dir).field_0.m128[1];
  auVar243._8_4_ = fVar282 * (ray->dir).field_0.m128[2];
  auVar243._12_4_ = fVar282 * (ray->dir).field_0.m128[3];
  auVar161._0_4_ = fVar282 * auVar325._0_4_;
  auVar161._4_4_ = fVar282 * auVar325._4_4_;
  auVar161._8_4_ = fVar282 * auVar325._8_4_;
  auVar161._12_4_ = fVar282 * auVar325._12_4_;
  auVar325 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar325 = vcvtdq2ps_avx(auVar325);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar125 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vshufps_avx(auVar243,auVar243,0);
  auVar25 = vshufps_avx(auVar243,auVar243,0x55);
  auVar26 = vshufps_avx(auVar243,auVar243,0xaa);
  fVar282 = auVar26._0_4_;
  fVar160 = auVar26._4_4_;
  fVar171 = auVar26._8_4_;
  fVar227 = auVar26._12_4_;
  fVar199 = auVar25._0_4_;
  fVar209 = auVar25._4_4_;
  fVar211 = auVar25._8_4_;
  fVar213 = auVar25._12_4_;
  fVar174 = auVar24._0_4_;
  fVar187 = auVar24._4_4_;
  fVar189 = auVar24._8_4_;
  fVar191 = auVar24._12_4_;
  auVar306._0_4_ = fVar174 * auVar325._0_4_ + fVar199 * auVar179._0_4_ + fVar282 * auVar180._0_4_;
  auVar306._4_4_ = fVar187 * auVar325._4_4_ + fVar209 * auVar179._4_4_ + fVar160 * auVar180._4_4_;
  auVar306._8_4_ = fVar189 * auVar325._8_4_ + fVar211 * auVar179._8_4_ + fVar171 * auVar180._8_4_;
  auVar306._12_4_ =
       fVar191 * auVar325._12_4_ + fVar213 * auVar179._12_4_ + fVar227 * auVar180._12_4_;
  auVar313._0_4_ = fVar174 * auVar181._0_4_ + fVar199 * auVar19._0_4_ + auVar20._0_4_ * fVar282;
  auVar313._4_4_ = fVar187 * auVar181._4_4_ + fVar209 * auVar19._4_4_ + auVar20._4_4_ * fVar160;
  auVar313._8_4_ = fVar189 * auVar181._8_4_ + fVar211 * auVar19._8_4_ + auVar20._8_4_ * fVar171;
  auVar313._12_4_ = fVar191 * auVar181._12_4_ + fVar213 * auVar19._12_4_ + auVar20._12_4_ * fVar227;
  auVar244._0_4_ = fVar174 * auVar21._0_4_ + fVar199 * auVar22._0_4_ + auVar23._0_4_ * fVar282;
  auVar244._4_4_ = fVar187 * auVar21._4_4_ + fVar209 * auVar22._4_4_ + auVar23._4_4_ * fVar160;
  auVar244._8_4_ = fVar189 * auVar21._8_4_ + fVar211 * auVar22._8_4_ + auVar23._8_4_ * fVar171;
  auVar244._12_4_ = fVar191 * auVar21._12_4_ + fVar213 * auVar22._12_4_ + auVar23._12_4_ * fVar227;
  auVar24 = vshufps_avx(auVar161,auVar161,0);
  auVar25 = vshufps_avx(auVar161,auVar161,0x55);
  auVar26 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar282 = auVar26._0_4_;
  fVar160 = auVar26._4_4_;
  fVar171 = auVar26._8_4_;
  fVar227 = auVar26._12_4_;
  fVar199 = auVar25._0_4_;
  fVar209 = auVar25._4_4_;
  fVar211 = auVar25._8_4_;
  fVar213 = auVar25._12_4_;
  fVar174 = auVar24._0_4_;
  fVar187 = auVar24._4_4_;
  fVar189 = auVar24._8_4_;
  fVar191 = auVar24._12_4_;
  auVar162._0_4_ = fVar174 * auVar325._0_4_ + fVar199 * auVar179._0_4_ + fVar282 * auVar180._0_4_;
  auVar162._4_4_ = fVar187 * auVar325._4_4_ + fVar209 * auVar179._4_4_ + fVar160 * auVar180._4_4_;
  auVar162._8_4_ = fVar189 * auVar325._8_4_ + fVar211 * auVar179._8_4_ + fVar171 * auVar180._8_4_;
  auVar162._12_4_ =
       fVar191 * auVar325._12_4_ + fVar213 * auVar179._12_4_ + fVar227 * auVar180._12_4_;
  auVar146._0_4_ = fVar174 * auVar181._0_4_ + auVar20._0_4_ * fVar282 + fVar199 * auVar19._0_4_;
  auVar146._4_4_ = fVar187 * auVar181._4_4_ + auVar20._4_4_ * fVar160 + fVar209 * auVar19._4_4_;
  auVar146._8_4_ = fVar189 * auVar181._8_4_ + auVar20._8_4_ * fVar171 + fVar211 * auVar19._8_4_;
  auVar146._12_4_ = fVar191 * auVar181._12_4_ + auVar20._12_4_ * fVar227 + fVar213 * auVar19._12_4_;
  auVar131._0_4_ = fVar174 * auVar21._0_4_ + fVar199 * auVar22._0_4_ + auVar23._0_4_ * fVar282;
  auVar131._4_4_ = fVar187 * auVar21._4_4_ + fVar209 * auVar22._4_4_ + auVar23._4_4_ * fVar160;
  auVar131._8_4_ = fVar189 * auVar21._8_4_ + fVar211 * auVar22._8_4_ + auVar23._8_4_ * fVar171;
  auVar131._12_4_ = fVar191 * auVar21._12_4_ + fVar213 * auVar22._12_4_ + auVar23._12_4_ * fVar227;
  auVar232._8_4_ = 0x7fffffff;
  auVar232._0_8_ = 0x7fffffff7fffffff;
  auVar232._12_4_ = 0x7fffffff;
  auVar325 = vandps_avx(auVar306,auVar232);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  auVar325 = vcmpps_avx(auVar325,auVar201,1);
  auVar179 = vblendvps_avx(auVar306,auVar201,auVar325);
  auVar325 = vandps_avx(auVar313,auVar232);
  auVar325 = vcmpps_avx(auVar325,auVar201,1);
  auVar180 = vblendvps_avx(auVar313,auVar201,auVar325);
  auVar325 = vandps_avx(auVar244,auVar232);
  auVar325 = vcmpps_avx(auVar325,auVar201,1);
  auVar325 = vblendvps_avx(auVar244,auVar201,auVar325);
  auVar181 = vrcpps_avx(auVar179);
  fVar174 = auVar181._0_4_;
  auVar175._0_4_ = fVar174 * auVar179._0_4_;
  fVar187 = auVar181._4_4_;
  auVar175._4_4_ = fVar187 * auVar179._4_4_;
  fVar189 = auVar181._8_4_;
  auVar175._8_4_ = fVar189 * auVar179._8_4_;
  fVar191 = auVar181._12_4_;
  auVar175._12_4_ = fVar191 * auVar179._12_4_;
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = &DAT_3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar179 = vsubps_avx(auVar245,auVar175);
  fVar174 = fVar174 + fVar174 * auVar179._0_4_;
  fVar187 = fVar187 + fVar187 * auVar179._4_4_;
  fVar189 = fVar189 + fVar189 * auVar179._8_4_;
  fVar191 = fVar191 + fVar191 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar180);
  fVar199 = auVar179._0_4_;
  auVar217._0_4_ = fVar199 * auVar180._0_4_;
  fVar209 = auVar179._4_4_;
  auVar217._4_4_ = fVar209 * auVar180._4_4_;
  fVar211 = auVar179._8_4_;
  auVar217._8_4_ = fVar211 * auVar180._8_4_;
  fVar213 = auVar179._12_4_;
  auVar217._12_4_ = fVar213 * auVar180._12_4_;
  auVar179 = vsubps_avx(auVar245,auVar217);
  fVar199 = fVar199 + fVar199 * auVar179._0_4_;
  fVar209 = fVar209 + fVar209 * auVar179._4_4_;
  fVar211 = fVar211 + fVar211 * auVar179._8_4_;
  fVar213 = fVar213 + fVar213 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar325);
  fVar216 = auVar179._0_4_;
  auVar233._0_4_ = fVar216 * auVar325._0_4_;
  fVar224 = auVar179._4_4_;
  auVar233._4_4_ = fVar224 * auVar325._4_4_;
  fVar225 = auVar179._8_4_;
  auVar233._8_4_ = fVar225 * auVar325._8_4_;
  fVar226 = auVar179._12_4_;
  auVar233._12_4_ = fVar226 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar245,auVar233);
  fVar216 = fVar216 + fVar216 * auVar325._0_4_;
  fVar224 = fVar224 + fVar224 * auVar325._4_4_;
  fVar225 = fVar225 + fVar225 * auVar325._8_4_;
  fVar226 = fVar226 + fVar226 * auVar325._12_4_;
  auVar325 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar18 + 0x16)) *
                           *(float *)(prim + lVar18 + 0x1a)));
  auVar180 = vshufps_avx(auVar325,auVar325,0);
  auVar325._8_8_ = 0;
  auVar325._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar325 = vpmovsxwd_avx(auVar325);
  auVar325 = vcvtdq2ps_avx(auVar325);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar179 = vpmovsxwd_avx(auVar179);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar325);
  fVar282 = auVar180._0_4_;
  fVar160 = auVar180._4_4_;
  fVar171 = auVar180._8_4_;
  fVar227 = auVar180._12_4_;
  auVar246._0_4_ = auVar179._0_4_ * fVar282 + auVar325._0_4_;
  auVar246._4_4_ = auVar179._4_4_ * fVar160 + auVar325._4_4_;
  auVar246._8_4_ = auVar179._8_4_ * fVar171 + auVar325._8_4_;
  auVar246._12_4_ = auVar179._12_4_ * fVar227 + auVar325._12_4_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar325 = vpmovsxwd_avx(auVar180);
  auVar325 = vcvtdq2ps_avx(auVar325);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar179 = vpmovsxwd_avx(auVar181);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar325);
  auVar258._0_4_ = auVar179._0_4_ * fVar282 + auVar325._0_4_;
  auVar258._4_4_ = auVar179._4_4_ * fVar160 + auVar325._4_4_;
  auVar258._8_4_ = auVar179._8_4_ * fVar171 + auVar325._8_4_;
  auVar258._12_4_ = auVar179._12_4_ * fVar227 + auVar325._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar325 = vpmovsxwd_avx(auVar19);
  auVar325 = vcvtdq2ps_avx(auVar325);
  uVar126 = (ulong)(uint)((int)(uVar125 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar125 * 2 + uVar126 + 6);
  auVar179 = vpmovsxwd_avx(auVar20);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar325);
  auVar270._0_4_ = auVar179._0_4_ * fVar282 + auVar325._0_4_;
  auVar270._4_4_ = auVar179._4_4_ * fVar160 + auVar325._4_4_;
  auVar270._8_4_ = auVar179._8_4_ * fVar171 + auVar325._8_4_;
  auVar270._12_4_ = auVar179._12_4_ * fVar227 + auVar325._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar126 + 6);
  auVar325 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar179 = vpmovsxwd_avx(auVar22);
  auVar325 = vcvtdq2ps_avx(auVar325);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar325);
  auVar283._0_4_ = auVar179._0_4_ * fVar282 + auVar325._0_4_;
  auVar283._4_4_ = auVar179._4_4_ * fVar160 + auVar325._4_4_;
  auVar283._8_4_ = auVar179._8_4_ * fVar171 + auVar325._8_4_;
  auVar283._12_4_ = auVar179._12_4_ * fVar227 + auVar325._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar325 = vpmovsxwd_avx(auVar23);
  auVar325 = vcvtdq2ps_avx(auVar325);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar125 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar179 = vpmovsxwd_avx(auVar24);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar180 = vsubps_avx(auVar179,auVar325);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar125) + 6);
  auVar179 = vpmovsxwd_avx(auVar25);
  auVar292._0_4_ = auVar180._0_4_ * fVar282 + auVar325._0_4_;
  auVar292._4_4_ = auVar180._4_4_ * fVar160 + auVar325._4_4_;
  auVar292._8_4_ = auVar180._8_4_ * fVar171 + auVar325._8_4_;
  auVar292._12_4_ = auVar180._12_4_ * fVar227 + auVar325._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar180 = vpmovsxwd_avx(auVar26);
  auVar325 = vcvtdq2ps_avx(auVar179);
  auVar179 = vcvtdq2ps_avx(auVar180);
  auVar179 = vsubps_avx(auVar179,auVar325);
  auVar234._0_4_ = auVar325._0_4_ + auVar179._0_4_ * fVar282;
  auVar234._4_4_ = auVar325._4_4_ + auVar179._4_4_ * fVar160;
  auVar234._8_4_ = auVar325._8_4_ + auVar179._8_4_ * fVar171;
  auVar234._12_4_ = auVar325._12_4_ + auVar179._12_4_ * fVar227;
  auVar325 = vsubps_avx(auVar246,auVar162);
  auVar247._0_4_ = fVar174 * auVar325._0_4_;
  auVar247._4_4_ = fVar187 * auVar325._4_4_;
  auVar247._8_4_ = fVar189 * auVar325._8_4_;
  auVar247._12_4_ = fVar191 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar258,auVar162);
  auVar163._0_4_ = fVar174 * auVar325._0_4_;
  auVar163._4_4_ = fVar187 * auVar325._4_4_;
  auVar163._8_4_ = fVar189 * auVar325._8_4_;
  auVar163._12_4_ = fVar191 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar270,auVar146);
  auVar176._0_4_ = fVar199 * auVar325._0_4_;
  auVar176._4_4_ = fVar209 * auVar325._4_4_;
  auVar176._8_4_ = fVar211 * auVar325._8_4_;
  auVar176._12_4_ = fVar213 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar283,auVar146);
  auVar147._0_4_ = fVar199 * auVar325._0_4_;
  auVar147._4_4_ = fVar209 * auVar325._4_4_;
  auVar147._8_4_ = fVar211 * auVar325._8_4_;
  auVar147._12_4_ = fVar213 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar292,auVar131);
  auVar202._0_4_ = fVar216 * auVar325._0_4_;
  auVar202._4_4_ = fVar224 * auVar325._4_4_;
  auVar202._8_4_ = fVar225 * auVar325._8_4_;
  auVar202._12_4_ = fVar226 * auVar325._12_4_;
  auVar325 = vsubps_avx(auVar234,auVar131);
  auVar132._0_4_ = fVar216 * auVar325._0_4_;
  auVar132._4_4_ = fVar224 * auVar325._4_4_;
  auVar132._8_4_ = fVar225 * auVar325._8_4_;
  auVar132._12_4_ = fVar226 * auVar325._12_4_;
  auVar325 = vpminsd_avx(auVar247,auVar163);
  auVar179 = vpminsd_avx(auVar176,auVar147);
  auVar325 = vmaxps_avx(auVar325,auVar179);
  auVar179 = vpminsd_avx(auVar202,auVar132);
  uVar11 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar259._4_4_ = uVar11;
  auVar259._0_4_ = uVar11;
  auVar259._8_4_ = uVar11;
  auVar259._12_4_ = uVar11;
  auVar179 = vmaxps_avx(auVar179,auVar259);
  auVar325 = vmaxps_avx(auVar325,auVar179);
  local_2f0._0_4_ = auVar325._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar325._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar325._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar325._12_4_ * 0.99999964;
  auVar325 = vpmaxsd_avx(auVar247,auVar163);
  auVar179 = vpmaxsd_avx(auVar176,auVar147);
  auVar325 = vminps_avx(auVar325,auVar179);
  auVar179 = vpmaxsd_avx(auVar202,auVar132);
  fVar282 = ray->tfar;
  auVar164._4_4_ = fVar282;
  auVar164._0_4_ = fVar282;
  auVar164._8_4_ = fVar282;
  auVar164._12_4_ = fVar282;
  auVar179 = vminps_avx(auVar179,auVar164);
  auVar325 = vminps_avx(auVar325,auVar179);
  auVar133._0_4_ = auVar325._0_4_ * 1.0000004;
  auVar133._4_4_ = auVar325._4_4_ * 1.0000004;
  auVar133._8_4_ = auVar325._8_4_ * 1.0000004;
  auVar133._12_4_ = auVar325._12_4_ * 1.0000004;
  auVar325 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar179 = vpcmpgtd_avx(auVar325,_DAT_01ff0cf0);
  auVar325 = vcmpps_avx(local_2f0,auVar133,2);
  auVar325 = vandps_avx(auVar325,auVar179);
  uVar122 = vmovmskps_avx(auVar325);
  local_811 = uVar122 != 0;
  if (local_811) {
    local_500 = mm_lookupmask_ps._16_8_;
    uStack_4f8 = mm_lookupmask_ps._24_8_;
    uStack_4f0 = mm_lookupmask_ps._16_8_;
    uStack_4e8 = mm_lookupmask_ps._24_8_;
    uVar122 = uVar122 & 0xff;
    local_7a8 = pre;
    local_508 = prim;
    do {
      lVar18 = 0;
      if (uVar122 != 0) {
        for (; (uVar122 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      local_7b0 = (ulong)*(uint *)(local_508 + 2);
      local_668 = (ulong)*(uint *)(local_508 + lVar18 * 4 + 6);
      pGVar14 = (context->scene->geometries).items[local_7b0].ptr;
      uVar126 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                                local_668 *
                                pGVar14[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar282 = (pGVar14->time_range).lower;
      fVar282 = pGVar14->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar282) / ((pGVar14->time_range).upper - fVar282));
      auVar325 = vroundss_avx(ZEXT416((uint)fVar282),ZEXT416((uint)fVar282),9);
      auVar325 = vminss_avx(auVar325,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
      auVar325 = vmaxss_avx(ZEXT816(0) << 0x20,auVar325);
      fVar282 = fVar282 - auVar325._0_4_;
      _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar325._0_4_ * 0x38;
      lVar18 = *(long *)(_Var15 + 0x10 + lVar129);
      uVar125 = uVar126 + 3;
      lVar128 = *(long *)(_Var15 + 0x38 + lVar129);
      lVar16 = *(long *)(_Var15 + 0x48 + lVar129);
      auVar325 = vshufps_avx(ZEXT416((uint)fVar282),ZEXT416((uint)fVar282),0);
      pfVar1 = (float *)(lVar128 + uVar126 * lVar16);
      fVar160 = auVar325._0_4_;
      fVar171 = auVar325._4_4_;
      fVar227 = auVar325._8_4_;
      fVar174 = auVar325._12_4_;
      pfVar2 = (float *)(lVar128 + (uVar126 + 1) * lVar16);
      pfVar3 = (float *)(lVar128 + (uVar126 + 2) * lVar16);
      pfVar4 = (float *)(lVar128 + lVar16 * uVar125);
      lVar128 = *(long *)(_Var15 + lVar129);
      auVar325 = vshufps_avx(ZEXT416((uint)(1.0 - fVar282)),ZEXT416((uint)(1.0 - fVar282)),0);
      pfVar5 = (float *)(lVar128 + lVar18 * uVar126);
      fVar282 = auVar325._0_4_;
      fVar187 = auVar325._4_4_;
      fVar189 = auVar325._8_4_;
      fVar191 = auVar325._12_4_;
      pfVar6 = (float *)(lVar128 + lVar18 * (uVar126 + 1));
      pfVar7 = (float *)(lVar128 + lVar18 * (uVar126 + 2));
      pfVar8 = (float *)(lVar128 + lVar18 * uVar125);
      uVar127 = (uint)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar18 = (long)(int)uVar127 * 0x44;
      local_6b0 = (undefined1  [8])
                  CONCAT44(fVar171 * pfVar1[1] + fVar187 * pfVar5[1],
                           fVar160 * *pfVar1 + fVar282 * *pfVar5);
      uStack_6a8._0_4_ = fVar227 * pfVar1[2] + fVar189 * pfVar5[2];
      uStack_6a8._4_4_ = fVar174 * pfVar1[3] + fVar191 * pfVar5[3];
      local_3f0._0_8_ =
           CONCAT44(fVar187 * pfVar6[1] + fVar171 * pfVar2[1],fVar282 * *pfVar6 + fVar160 * *pfVar2)
      ;
      local_3f0._8_4_ = fVar189 * pfVar6[2] + fVar227 * pfVar2[2];
      local_3f0._12_4_ = fVar191 * pfVar6[3] + fVar174 * pfVar2[3];
      local_400._0_8_ =
           CONCAT44(fVar187 * pfVar7[1] + fVar171 * pfVar3[1],fVar282 * *pfVar7 + fVar160 * *pfVar3)
      ;
      local_400._8_4_ = fVar189 * pfVar7[2] + fVar227 * pfVar3[2];
      local_400._12_4_ = fVar191 * pfVar7[3] + fVar174 * pfVar3[3];
      local_410._0_8_ =
           CONCAT44(fVar187 * pfVar8[1] + fVar171 * pfVar4[1],fVar282 * *pfVar8 + fVar160 * *pfVar4)
      ;
      local_410._8_4_ = fVar189 * pfVar8[2] + fVar227 * pfVar4[2];
      local_410._12_4_ = fVar191 * pfVar8[3] + fVar174 * pfVar4[3];
      aVar12 = (ray->org).field_0;
      auVar180 = vsubps_avx(_local_6b0,(undefined1  [16])aVar12);
      auVar325 = vshufps_avx(auVar180,auVar180,0);
      auVar179 = vshufps_avx(auVar180,auVar180,0x55);
      auVar180 = vshufps_avx(auVar180,auVar180,0xaa);
      fVar282 = (local_7a8->ray_space).vx.field_0.m128[0];
      fVar160 = (local_7a8->ray_space).vx.field_0.m128[1];
      fVar171 = (local_7a8->ray_space).vx.field_0.m128[2];
      fVar227 = (local_7a8->ray_space).vx.field_0.m128[3];
      fVar174 = (local_7a8->ray_space).vy.field_0.m128[0];
      fVar187 = (local_7a8->ray_space).vy.field_0.m128[1];
      fVar189 = (local_7a8->ray_space).vy.field_0.m128[2];
      fVar191 = (local_7a8->ray_space).vy.field_0.m128[3];
      fVar199 = (local_7a8->ray_space).vz.field_0.m128[0];
      fVar209 = (local_7a8->ray_space).vz.field_0.m128[1];
      fVar211 = (local_7a8->ray_space).vz.field_0.m128[2];
      fVar213 = (local_7a8->ray_space).vz.field_0.m128[3];
      auVar177._0_8_ =
           CONCAT44(auVar325._4_4_ * fVar160 + auVar180._4_4_ * fVar209 + auVar179._4_4_ * fVar187,
                    auVar325._0_4_ * fVar282 + auVar180._0_4_ * fVar199 + auVar179._0_4_ * fVar174);
      auVar177._8_4_ =
           auVar325._8_4_ * fVar171 + auVar180._8_4_ * fVar211 + auVar179._8_4_ * fVar189;
      auVar177._12_4_ =
           auVar325._12_4_ * fVar227 + auVar180._12_4_ * fVar213 + auVar179._12_4_ * fVar191;
      auVar325 = vblendps_avx(auVar177,_local_6b0,8);
      auVar181 = vsubps_avx(local_3f0,(undefined1  [16])aVar12);
      auVar179 = vshufps_avx(auVar181,auVar181,0);
      auVar180 = vshufps_avx(auVar181,auVar181,0x55);
      auVar181 = vshufps_avx(auVar181,auVar181,0xaa);
      auVar248._0_4_ =
           auVar179._0_4_ * fVar282 + auVar180._0_4_ * fVar174 + auVar181._0_4_ * fVar199;
      auVar248._4_4_ =
           auVar179._4_4_ * fVar160 + auVar180._4_4_ * fVar187 + auVar181._4_4_ * fVar209;
      auVar248._8_4_ =
           auVar179._8_4_ * fVar171 + auVar180._8_4_ * fVar189 + auVar181._8_4_ * fVar211;
      auVar248._12_4_ =
           auVar179._12_4_ * fVar227 + auVar180._12_4_ * fVar191 + auVar181._12_4_ * fVar213;
      auVar179 = vblendps_avx(auVar248,local_3f0,8);
      auVar19 = vsubps_avx(local_400,(undefined1  [16])aVar12);
      auVar180 = vshufps_avx(auVar19,auVar19,0);
      auVar181 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar260._0_4_ = auVar180._0_4_ * fVar282 + auVar19._0_4_ * fVar199 + auVar181._0_4_ * fVar174
      ;
      auVar260._4_4_ = auVar180._4_4_ * fVar160 + auVar19._4_4_ * fVar209 + auVar181._4_4_ * fVar187
      ;
      auVar260._8_4_ = auVar180._8_4_ * fVar171 + auVar19._8_4_ * fVar211 + auVar181._8_4_ * fVar189
      ;
      auVar260._12_4_ =
           auVar180._12_4_ * fVar227 + auVar19._12_4_ * fVar213 + auVar181._12_4_ * fVar191;
      auVar180 = vblendps_avx(auVar260,local_400,8);
      auVar20 = vsubps_avx(local_410,(undefined1  [16])aVar12);
      auVar181 = vshufps_avx(auVar20,auVar20,0);
      auVar19 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar148._0_4_ = auVar181._0_4_ * fVar282 + auVar20._0_4_ * fVar199 + auVar19._0_4_ * fVar174;
      auVar148._4_4_ = auVar181._4_4_ * fVar160 + auVar20._4_4_ * fVar209 + auVar19._4_4_ * fVar187;
      auVar148._8_4_ = auVar181._8_4_ * fVar171 + auVar20._8_4_ * fVar211 + auVar19._8_4_ * fVar189;
      auVar148._12_4_ =
           auVar181._12_4_ * fVar227 + auVar20._12_4_ * fVar213 + auVar19._12_4_ * fVar191;
      auVar181 = vblendps_avx(auVar148,local_410,8);
      auVar203._8_4_ = 0x7fffffff;
      auVar203._0_8_ = 0x7fffffff7fffffff;
      auVar203._12_4_ = 0x7fffffff;
      auVar325 = vandps_avx(auVar325,auVar203);
      auVar179 = vandps_avx(auVar179,auVar203);
      auVar19 = vmaxps_avx(auVar325,auVar179);
      auVar325 = vandps_avx(auVar180,auVar203);
      auVar179 = vandps_avx(auVar181,auVar203);
      auVar325 = vmaxps_avx(auVar325,auVar179);
      auVar325 = vmaxps_avx(auVar19,auVar325);
      auVar179 = vmovshdup_avx(auVar325);
      auVar179 = vmaxss_avx(auVar179,auVar325);
      auVar325 = vshufpd_avx(auVar325,auVar325,1);
      auVar325 = vmaxss_avx(auVar325,auVar179);
      fVar191 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x908);
      fVar199 = *(float *)(catmullrom_basis0 + lVar18 + 0x90c);
      fVar211 = *(float *)(catmullrom_basis0 + lVar18 + 0x910);
      fVar213 = *(float *)(catmullrom_basis0 + lVar18 + 0x914);
      fVar216 = *(float *)(catmullrom_basis0 + lVar18 + 0x918);
      fVar224 = *(float *)(catmullrom_basis0 + lVar18 + 0x91c);
      fVar225 = *(float *)(catmullrom_basis0 + lVar18 + 0x920);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x908);
      local_780._0_16_ = auVar260;
      auVar179 = vshufps_avx(auVar260,auVar260,0);
      register0x00001250 = auVar179;
      _local_5a0 = auVar179;
      auVar180 = vshufps_avx(auVar260,auVar260,0x55);
      register0x00001290 = auVar180;
      _local_600 = auVar180;
      fVar226 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0xd8c);
      fVar288 = *(float *)(catmullrom_basis0 + lVar18 + 0xd90);
      fVar297 = *(float *)(catmullrom_basis0 + lVar18 + 0xd94);
      fVar300 = *(float *)(catmullrom_basis0 + lVar18 + 0xd98);
      fVar195 = *(float *)(catmullrom_basis0 + lVar18 + 0xd9c);
      fVar289 = *(float *)(catmullrom_basis0 + lVar18 + 0xda0);
      fVar304 = *(float *)(catmullrom_basis0 + lVar18 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0xd8c);
      auVar181 = vshufps_avx(auVar148,auVar148,0);
      register0x00001550 = auVar181;
      _local_3c0 = auVar181;
      fVar242 = auVar181._0_4_;
      fVar250 = auVar181._4_4_;
      fVar251 = auVar181._8_4_;
      fVar253 = auVar181._12_4_;
      fVar145 = auVar179._0_4_;
      fVar157 = auVar179._4_4_;
      fVar158 = auVar179._8_4_;
      fVar173 = auVar179._12_4_;
      auVar179 = vshufps_avx(auVar148,auVar148,0x55);
      register0x00001250 = auVar179;
      _local_620 = auVar179;
      fVar282 = auVar179._0_4_;
      fVar227 = auVar179._4_4_;
      fVar189 = auVar179._8_4_;
      fVar209 = auVar179._12_4_;
      fVar215 = auVar180._0_4_;
      fVar169 = auVar180._4_4_;
      fVar170 = auVar180._8_4_;
      fVar172 = auVar180._12_4_;
      auVar179 = vshufps_avx(local_400,local_400,0xff);
      register0x00001310 = auVar179;
      _local_80 = auVar179;
      auVar180 = vshufps_avx(local_410,local_410,0xff);
      register0x00001390 = auVar180;
      _local_a0 = auVar180;
      fVar160 = auVar180._0_4_;
      fVar171 = auVar180._4_4_;
      fVar174 = auVar180._8_4_;
      fVar187 = auVar180._12_4_;
      fVar200 = auVar179._0_4_;
      fVar210 = auVar179._4_4_;
      fVar212 = auVar179._8_4_;
      auVar180 = vshufps_avx(auVar248,auVar248,0);
      local_660._16_16_ = auVar180;
      local_660._0_16_ = auVar180;
      fVar291 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x484);
      fVar188 = *(float *)(catmullrom_basis0 + lVar18 + 0x488);
      fVar295 = *(float *)(catmullrom_basis0 + lVar18 + 0x48c);
      fVar193 = *(float *)(catmullrom_basis0 + lVar18 + 0x490);
      fVar298 = *(float *)(catmullrom_basis0 + lVar18 + 0x494);
      fVar197 = *(float *)(catmullrom_basis0 + lVar18 + 0x498);
      fVar301 = *(float *)(catmullrom_basis0 + lVar18 + 0x49c);
      auVar119 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar18 + 0x484);
      fVar130 = *(float *)(catmullrom_basis0 + lVar18 + 0x4a0);
      fVar257 = auVar180._0_4_;
      fVar263 = auVar180._4_4_;
      fVar264 = auVar180._8_4_;
      fVar266 = auVar180._12_4_;
      auVar181 = vshufps_avx(auVar248,auVar248,0x55);
      register0x000015d0 = auVar181;
      _local_4e0 = auVar181;
      fVar276 = auVar181._0_4_;
      fVar277 = auVar181._4_4_;
      fVar278 = auVar181._8_4_;
      fVar279 = auVar181._12_4_;
      auVar181 = vshufps_avx(local_3f0,local_3f0,0xff);
      register0x00001590 = auVar181;
      _local_140 = auVar181;
      fVar254 = auVar181._0_4_;
      fVar255 = auVar181._4_4_;
      fVar256 = auVar181._8_4_;
      fVar269 = auVar181._12_4_;
      auVar110._8_4_ = auVar177._8_4_;
      auVar110._0_8_ = auVar177._0_8_;
      auVar110._12_4_ = auVar177._12_4_;
      auVar181 = vshufps_avx(auVar110,auVar110,0);
      register0x000014d0 = auVar181;
      _local_160 = auVar181;
      local_340 = *(float *)(catmullrom_basis0 + lVar18);
      fStack_33c = *(float *)(catmullrom_basis0 + lVar18 + 4);
      fStack_338 = *(float *)(catmullrom_basis0 + lVar18 + 8);
      fStack_334 = *(float *)(catmullrom_basis0 + lVar18 + 0xc);
      fStack_330 = *(float *)(catmullrom_basis0 + lVar18 + 0x10);
      fStack_32c = *(float *)(catmullrom_basis0 + lVar18 + 0x14);
      fStack_328 = *(float *)(catmullrom_basis0 + lVar18 + 0x18);
      fStack_324 = *(float *)(catmullrom_basis0 + lVar18 + 0x1c);
      fVar290 = auVar181._0_4_;
      fVar294 = auVar181._4_4_;
      fVar296 = auVar181._8_4_;
      fVar299 = auVar181._12_4_;
      auVar307._0_4_ =
           fVar290 * local_340 + fVar257 * fVar291 + fVar145 * fVar191 + fVar242 * fVar226;
      auVar307._4_4_ =
           fVar294 * fStack_33c + fVar263 * fVar188 + fVar157 * fVar199 + fVar250 * fVar288;
      auVar307._8_4_ =
           fVar296 * fStack_338 + fVar264 * fVar295 + fVar158 * fVar211 + fVar251 * fVar297;
      auVar307._12_4_ =
           fVar299 * fStack_334 + fVar266 * fVar193 + fVar173 * fVar213 + fVar253 * fVar300;
      auVar307._16_4_ =
           fVar290 * fStack_330 + fVar257 * fVar298 + fVar145 * fVar216 + fVar242 * fVar195;
      auVar307._20_4_ =
           fVar294 * fStack_32c + fVar263 * fVar197 + fVar157 * fVar224 + fVar250 * fVar289;
      auVar307._24_4_ =
           fVar296 * fStack_328 + fVar264 * fVar301 + fVar158 * fVar225 + fVar251 * fVar304;
      auVar307._28_4_ = fVar130 + fVar173 + 0.0 + 0.0;
      auVar181 = vshufps_avx(auVar110,auVar110,0x55);
      register0x000013d0 = auVar181;
      _local_3a0 = auVar181;
      fVar241 = auVar181._0_4_;
      fVar144 = auVar181._4_4_;
      fVar240 = auVar181._8_4_;
      fVar252 = auVar181._12_4_;
      auVar271._0_4_ =
           fVar241 * local_340 + fVar276 * fVar291 + fVar215 * fVar191 + fVar226 * fVar282;
      auVar271._4_4_ =
           fVar144 * fStack_33c + fVar277 * fVar188 + fVar169 * fVar199 + fVar288 * fVar227;
      auVar271._8_4_ =
           fVar240 * fStack_338 + fVar278 * fVar295 + fVar170 * fVar211 + fVar297 * fVar189;
      auVar271._12_4_ =
           fVar252 * fStack_334 + fVar279 * fVar193 + fVar172 * fVar213 + fVar300 * fVar209;
      auVar271._16_4_ =
           fVar241 * fStack_330 + fVar276 * fVar298 + fVar215 * fVar216 + fVar195 * fVar282;
      auVar271._20_4_ =
           fVar144 * fStack_32c + fVar277 * fVar197 + fVar169 * fVar224 + fVar289 * fVar227;
      auVar271._24_4_ =
           fVar240 * fStack_328 + fVar278 * fVar301 + fVar170 * fVar225 + fVar304 * fVar189;
      auVar271._28_4_ = fVar172 + fVar209 + 0.0 + 0.0;
      auVar181 = vpermilps_avx(_local_6b0,0xff);
      register0x00001490 = auVar181;
      _local_c0 = auVar181;
      fVar214 = auVar181._0_4_;
      fVar286 = auVar181._4_4_;
      fVar287 = auVar181._8_4_;
      local_800 = (undefined1  [4])
                  (fVar214 * local_340 + fVar254 * fVar291 + fVar200 * fVar191 + fVar226 * fVar160);
      auStack_7fc._0_4_ =
           fVar286 * fStack_33c + fVar255 * fVar188 + fVar210 * fVar199 + fVar288 * fVar171;
      auStack_7fc._4_4_ =
           fVar287 * fStack_338 + fVar256 * fVar295 + fVar212 * fVar211 + fVar297 * fVar174;
      fStack_7f4 = auVar181._12_4_ * fStack_334 +
                   fVar269 * fVar193 + auVar179._12_4_ * fVar213 + fVar300 * fVar187;
      fStack_7f0 = fVar214 * fStack_330 + fVar254 * fVar298 + fVar200 * fVar216 + fVar195 * fVar160;
      fStack_7ec = fVar286 * fStack_32c + fVar255 * fVar197 + fVar210 * fVar224 + fVar289 * fVar171;
      fStack_7e8 = fVar287 * fStack_328 + fVar256 * fVar301 + fVar212 * fVar225 + fVar304 * fVar174;
      register0x0000121c = 0;
      fVar300 = *(float *)(catmullrom_basis1 + lVar18 + 0x908);
      fVar195 = *(float *)(catmullrom_basis1 + lVar18 + 0x90c);
      fVar289 = *(float *)(catmullrom_basis1 + lVar18 + 0x910);
      fVar304 = *(float *)(catmullrom_basis1 + lVar18 + 0x914);
      fVar291 = *(float *)(catmullrom_basis1 + lVar18 + 0x918);
      fVar188 = *(float *)(catmullrom_basis1 + lVar18 + 0x91c);
      fVar295 = *(float *)(catmullrom_basis1 + lVar18 + 0x920);
      fVar193 = *(float *)(catmullrom_basis1 + lVar18 + 0xd8c);
      fVar298 = *(float *)(catmullrom_basis1 + lVar18 + 0xd90);
      fVar197 = *(float *)(catmullrom_basis1 + lVar18 + 0xd94);
      fVar301 = *(float *)(catmullrom_basis1 + lVar18 + 0xd98);
      fVar143 = *(float *)(catmullrom_basis1 + lVar18 + 0xd9c);
      fVar228 = *(float *)(catmullrom_basis1 + lVar18 + 0xda0);
      fVar302 = *(float *)(catmullrom_basis1 + lVar18 + 0xda4);
      fVar230 = *(float *)(catmullrom_basis1 + lVar18 + 0x484);
      fVar303 = *(float *)(catmullrom_basis1 + lVar18 + 0x488);
      fVar229 = *(float *)(catmullrom_basis1 + lVar18 + 0x48c);
      fVar305 = *(float *)(catmullrom_basis1 + lVar18 + 0x490);
      fVar159 = *(float *)(catmullrom_basis1 + lVar18 + 0x494);
      fVar190 = *(float *)(catmullrom_basis1 + lVar18 + 0x498);
      fVar192 = *(float *)(catmullrom_basis1 + lVar18 + 0x49c);
      fVar199 = fVar253 + 0.0;
      fVar194 = *(float *)(catmullrom_basis1 + lVar18);
      fVar196 = *(float *)(catmullrom_basis1 + lVar18 + 4);
      fVar198 = *(float *)(catmullrom_basis1 + lVar18 + 8);
      fVar231 = *(float *)(catmullrom_basis1 + lVar18 + 0xc);
      fVar265 = *(float *)(catmullrom_basis1 + lVar18 + 0x10);
      fVar267 = *(float *)(catmullrom_basis1 + lVar18 + 0x14);
      fVar268 = *(float *)(catmullrom_basis1 + lVar18 + 0x18);
      auVar204._0_4_ = fVar290 * fVar194 + fVar257 * fVar230 + fVar300 * fVar145 + fVar242 * fVar193
      ;
      auVar204._4_4_ = fVar294 * fVar196 + fVar263 * fVar303 + fVar195 * fVar157 + fVar250 * fVar298
      ;
      auVar204._8_4_ = fVar296 * fVar198 + fVar264 * fVar229 + fVar289 * fVar158 + fVar251 * fVar197
      ;
      auVar204._12_4_ =
           fVar299 * fVar231 + fVar266 * fVar305 + fVar304 * fVar173 + fVar253 * fVar301;
      auVar204._16_4_ =
           fVar290 * fVar265 + fVar257 * fVar159 + fVar291 * fVar145 + fVar242 * fVar143;
      auVar204._20_4_ =
           fVar294 * fVar267 + fVar263 * fVar190 + fVar188 * fVar157 + fVar250 * fVar228;
      auVar204._24_4_ =
           fVar296 * fVar268 + fVar264 * fVar192 + fVar295 * fVar158 + fVar251 * fVar302;
      auVar204._28_4_ = fVar269 + fVar199;
      auVar182._0_4_ = fVar241 * fVar194 + fVar276 * fVar230 + fVar300 * fVar215 + fVar193 * fVar282
      ;
      auVar182._4_4_ = fVar144 * fVar196 + fVar277 * fVar303 + fVar195 * fVar169 + fVar298 * fVar227
      ;
      auVar182._8_4_ = fVar240 * fVar198 + fVar278 * fVar229 + fVar289 * fVar170 + fVar197 * fVar189
      ;
      auVar182._12_4_ =
           fVar252 * fVar231 + fVar279 * fVar305 + fVar304 * fVar172 + fVar301 * fVar209;
      auVar182._16_4_ =
           fVar241 * fVar265 + fVar276 * fVar159 + fVar291 * fVar215 + fVar143 * fVar282;
      auVar182._20_4_ =
           fVar144 * fVar267 + fVar277 * fVar190 + fVar188 * fVar169 + fVar228 * fVar227;
      auVar182._24_4_ =
           fVar240 * fVar268 + fVar278 * fVar192 + fVar295 * fVar170 + fVar302 * fVar189;
      auVar182._28_4_ = fVar199 + fVar253 + fVar130 + 0.0;
      local_6e0._0_4_ =
           fVar254 * fVar230 + fVar200 * fVar300 + fVar160 * fVar193 + fVar214 * fVar194;
      local_6e0._4_4_ =
           fVar255 * fVar303 + fVar210 * fVar195 + fVar171 * fVar298 + fVar286 * fVar196;
      local_6e0._8_4_ =
           fVar256 * fVar229 + fVar212 * fVar289 + fVar174 * fVar197 + fVar287 * fVar198;
      local_6e0._12_4_ =
           fVar269 * fVar305 + auVar179._12_4_ * fVar304 + fVar187 * fVar301 +
           auVar181._12_4_ * fVar231;
      local_6e0._16_4_ =
           fVar254 * fVar159 + fVar200 * fVar291 + fVar160 * fVar143 + fVar214 * fVar265;
      local_6e0._20_4_ =
           fVar255 * fVar190 + fVar210 * fVar188 + fVar171 * fVar228 + fVar286 * fVar267;
      local_6e0._24_4_ =
           fVar256 * fVar192 + fVar212 * fVar295 + fVar174 * fVar302 + fVar287 * fVar268;
      local_6e0._28_4_ = fVar253 + fVar187 + fVar130 + fVar199;
      auVar27 = vsubps_avx(auVar204,auVar307);
      auVar28 = vsubps_avx(auVar182,auVar271);
      _auStack_430 = auVar28._16_16_;
      fVar160 = auVar27._0_4_;
      fVar174 = auVar27._4_4_;
      auVar155._4_4_ = auVar271._4_4_ * fVar174;
      auVar155._0_4_ = auVar271._0_4_ * fVar160;
      fVar191 = auVar27._8_4_;
      auVar155._8_4_ = auVar271._8_4_ * fVar191;
      fVar211 = auVar27._12_4_;
      auVar155._12_4_ = auVar271._12_4_ * fVar211;
      fVar216 = auVar27._16_4_;
      auVar155._16_4_ = auVar271._16_4_ * fVar216;
      fVar225 = auVar27._20_4_;
      auVar155._20_4_ = auVar271._20_4_ * fVar225;
      fVar288 = auVar27._24_4_;
      auVar155._24_4_ = auVar271._24_4_ * fVar288;
      auVar155._28_4_ = fVar199;
      fVar171 = auVar28._0_4_;
      fVar187 = auVar28._4_4_;
      auVar29._4_4_ = auVar307._4_4_ * fVar187;
      auVar29._0_4_ = auVar307._0_4_ * fVar171;
      fVar199 = auVar28._8_4_;
      auVar29._8_4_ = auVar307._8_4_ * fVar199;
      fVar213 = auVar28._12_4_;
      auVar29._12_4_ = auVar307._12_4_ * fVar213;
      fVar224 = auVar28._16_4_;
      auVar29._16_4_ = auVar307._16_4_ * fVar224;
      fVar226 = auVar28._20_4_;
      auVar29._20_4_ = auVar307._20_4_ * fVar226;
      fVar297 = auVar28._24_4_;
      auVar29._24_4_ = auVar307._24_4_ * fVar297;
      auVar29._28_4_ = auVar182._28_4_;
      auVar29 = vsubps_avx(auVar155,auVar29);
      auVar155 = vmaxps_avx(_local_800,local_6e0._0_32_);
      auVar36._4_4_ = auVar155._4_4_ * auVar155._4_4_ * (fVar174 * fVar174 + fVar187 * fVar187);
      auVar36._0_4_ = auVar155._0_4_ * auVar155._0_4_ * (fVar160 * fVar160 + fVar171 * fVar171);
      auVar36._8_4_ = auVar155._8_4_ * auVar155._8_4_ * (fVar191 * fVar191 + fVar199 * fVar199);
      auVar36._12_4_ = auVar155._12_4_ * auVar155._12_4_ * (fVar211 * fVar211 + fVar213 * fVar213);
      auVar36._16_4_ = auVar155._16_4_ * auVar155._16_4_ * (fVar216 * fVar216 + fVar224 * fVar224);
      auVar36._20_4_ = auVar155._20_4_ * auVar155._20_4_ * (fVar225 * fVar225 + fVar226 * fVar226);
      auVar36._24_4_ = auVar155._24_4_ * auVar155._24_4_ * (fVar288 * fVar288 + fVar297 * fVar297);
      auVar36._28_4_ = auVar204._28_4_ + auVar182._28_4_;
      auVar30._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar30._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar30._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar30._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar30._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar30._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar30._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar30._28_4_ = auVar29._28_4_;
      auVar155 = vcmpps_avx(auVar30,auVar36,2);
      auVar178._0_4_ = (float)(int)uVar127;
      auVar178._4_12_ = auVar180._4_12_;
      _local_3e0 = auVar178;
      auVar179 = vshufps_avx(auVar178,auVar178,0);
      auVar183._16_16_ = auVar179;
      auVar183._0_16_ = auVar179;
      auVar29 = vcmpps_avx(_DAT_02020f40,auVar183,1);
      auVar111._8_4_ = auVar177._8_4_;
      auVar111._0_8_ = auVar177._0_8_;
      auVar111._12_4_ = auVar177._12_4_;
      auVar179 = vpermilps_avx(auVar111,0xaa);
      auVar308._16_16_ = auVar179;
      auVar308._0_16_ = auVar179;
      auVar180 = vpermilps_avx(auVar248,0xaa);
      register0x00001550 = auVar180;
      _local_320 = auVar180;
      auVar181 = vpermilps_avx(auVar260,0xaa);
      register0x00001590 = auVar181;
      _local_e0 = auVar181;
      auVar19 = vpermilps_avx(auVar148,0xaa);
      register0x00001310 = auVar19;
      _local_560 = auVar19;
      auVar36 = auVar29 & auVar155;
      local_7e0 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      uStack_7dc = 0;
      fStack_7d8 = 0.0;
      fStack_7d4 = 0.0;
      auVar325 = ZEXT416((uint)(auVar325._0_4_ * 4.7683716e-07));
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      {
        uVar125 = 0;
        auVar319 = ZEXT3264(local_660);
      }
      else {
        auVar155 = vandps_avx(auVar155,auVar29);
        fVar286 = auVar179._0_4_;
        fVar287 = auVar179._4_4_;
        fVar254 = auVar179._8_4_;
        fVar255 = auVar179._12_4_;
        fVar256 = auVar180._0_4_;
        fVar269 = auVar180._4_4_;
        fVar280 = auVar180._8_4_;
        fVar281 = auVar180._12_4_;
        fVar317 = auVar181._0_4_;
        fVar320 = auVar181._4_4_;
        fVar321 = auVar181._8_4_;
        fVar322 = auVar181._12_4_;
        fVar200 = auVar19._0_4_;
        fVar210 = auVar19._4_4_;
        fVar212 = auVar19._8_4_;
        fVar214 = auVar19._12_4_;
        fVar160 = auVar29._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar18 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar18 + 0x4a0);
        local_780._0_16_ = auVar325;
        local_480 = fVar286 * fVar194 + fVar256 * fVar230 + fVar317 * fVar300 + fVar200 * fVar193;
        fStack_47c = fVar287 * fVar196 + fVar269 * fVar303 + fVar320 * fVar195 + fVar210 * fVar298;
        fStack_478 = fVar254 * fVar198 + fVar280 * fVar229 + fVar321 * fVar289 + fVar212 * fVar197;
        fStack_474 = fVar255 * fVar231 + fVar281 * fVar305 + fVar322 * fVar304 + fVar214 * fVar301;
        fStack_470 = fVar286 * fVar265 + fVar256 * fVar159 + fVar317 * fVar291 + fVar200 * fVar143;
        fStack_46c = fVar287 * fVar267 + fVar269 * fVar190 + fVar320 * fVar188 + fVar210 * fVar228;
        fStack_468 = fVar254 * fVar268 + fVar280 * fVar192 + fVar321 * fVar295 + fVar212 * fVar302;
        fStack_464 = auVar155._28_4_ + fVar160;
        local_460._0_4_ = auVar119._0_4_;
        local_460._4_4_ = auVar119._4_4_;
        fStack_458 = auVar119._8_4_;
        fStack_454 = auVar119._12_4_;
        fStack_450 = auVar119._16_4_;
        fStack_44c = auVar119._20_4_;
        fStack_448 = auVar119._24_4_;
        local_540._0_4_ = auVar118._0_4_;
        local_540._4_4_ = auVar118._4_4_;
        fStack_538 = auVar118._8_4_;
        fStack_534 = auVar118._12_4_;
        fStack_530 = auVar118._16_4_;
        fStack_52c = auVar118._20_4_;
        fStack_528 = auVar118._24_4_;
        local_5e0._0_4_ = auVar117._0_4_;
        local_5e0._4_4_ = auVar117._4_4_;
        fStack_5d8 = auVar117._8_4_;
        fStack_5d4 = auVar117._12_4_;
        fStack_5d0 = auVar117._16_4_;
        fStack_5cc = auVar117._20_4_;
        fStack_5c8 = auVar117._24_4_;
        local_540._0_4_ =
             fVar286 * local_340 +
             fVar256 * (float)local_460._0_4_ +
             fVar317 * (float)local_540._0_4_ + fVar200 * (float)local_5e0._0_4_;
        local_540._4_4_ =
             fVar287 * fStack_33c +
             fVar269 * (float)local_460._4_4_ +
             fVar320 * (float)local_540._4_4_ + fVar210 * (float)local_5e0._4_4_;
        fStack_538 = fVar254 * fStack_338 +
                     fVar280 * fStack_458 + fVar321 * fStack_538 + fVar212 * fStack_5d8;
        fStack_534 = fVar255 * fStack_334 +
                     fVar281 * fStack_454 + fVar322 * fStack_534 + fVar214 * fStack_5d4;
        fStack_530 = fVar286 * fStack_330 +
                     fVar256 * fStack_450 + fVar317 * fStack_530 + fVar200 * fStack_5d0;
        fStack_52c = fVar287 * fStack_32c +
                     fVar269 * fStack_44c + fVar320 * fStack_52c + fVar210 * fStack_5cc;
        fStack_528 = fVar254 * fStack_328 +
                     fVar280 * fStack_448 + fVar321 * fStack_528 + fVar212 * fStack_5c8;
        fStack_524 = fStack_464 + fVar160 + auVar155._28_4_ + auVar29._28_4_;
        fVar160 = *(float *)(catmullrom_basis0 + lVar18 + 0x1210);
        fVar171 = *(float *)(catmullrom_basis0 + lVar18 + 0x1214);
        fVar174 = *(float *)(catmullrom_basis0 + lVar18 + 0x1218);
        fVar187 = *(float *)(catmullrom_basis0 + lVar18 + 0x121c);
        fVar191 = *(float *)(catmullrom_basis0 + lVar18 + 0x1220);
        fVar199 = *(float *)(catmullrom_basis0 + lVar18 + 0x1224);
        fVar211 = *(float *)(catmullrom_basis0 + lVar18 + 0x1228);
        fVar213 = *(float *)(catmullrom_basis0 + lVar18 + 0x1694);
        fVar216 = *(float *)(catmullrom_basis0 + lVar18 + 0x1698);
        fVar224 = *(float *)(catmullrom_basis0 + lVar18 + 0x169c);
        fVar225 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a0);
        fVar226 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a4);
        fVar288 = *(float *)(catmullrom_basis0 + lVar18 + 0x16a8);
        fVar297 = *(float *)(catmullrom_basis0 + lVar18 + 0x16ac);
        fVar300 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b18);
        fVar195 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b1c);
        fVar289 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b20);
        fVar304 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b24);
        fVar291 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b28);
        fVar188 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b2c);
        fVar295 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b30);
        fVar193 = *(float *)(catmullrom_basis0 + lVar18 + 0x1f9c);
        fVar298 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa0);
        fVar197 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa4);
        fVar301 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fa8);
        fVar130 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fac);
        fVar143 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fb0);
        fVar228 = *(float *)(catmullrom_basis0 + lVar18 + 0x1fb4);
        fVar230 = auVar271._28_4_ + *(float *)(catmullrom_basis1 + lVar18 + 0x4a0);
        fVar302 = *(float *)(catmullrom_basis0 + lVar18 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar18 + 0x1fb8);
        fVar303 = *(float *)(catmullrom_basis0 + lVar18 + 0x16b0) + fVar302;
        local_460._4_4_ =
             fVar294 * fVar171 + fVar263 * fVar216 + fVar157 * fVar195 + fVar250 * fVar298;
        local_460._0_4_ =
             fVar290 * fVar160 + fVar257 * fVar213 + fVar145 * fVar300 + fVar242 * fVar193;
        fStack_458 = fVar296 * fVar174 + fVar264 * fVar224 + fVar158 * fVar289 + fVar251 * fVar197;
        fStack_454 = fVar299 * fVar187 + fVar266 * fVar225 + fVar173 * fVar304 + fVar253 * fVar301;
        fStack_450 = fVar290 * fVar191 + fVar257 * fVar226 + fVar145 * fVar291 + fVar242 * fVar130;
        fStack_44c = fVar294 * fVar199 + fVar263 * fVar288 + fVar157 * fVar188 + fVar250 * fVar143;
        fStack_448 = fVar296 * fVar211 + fVar264 * fVar297 + fVar158 * fVar295 + fVar251 * fVar228;
        fStack_444 = *(float *)(catmullrom_basis0 + lVar18 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar18 + 0x1fb8) + fVar230;
        auVar151._0_4_ =
             fVar241 * fVar160 + fVar215 * fVar300 + fVar282 * fVar193 + fVar276 * fVar213;
        auVar151._4_4_ =
             fVar144 * fVar171 + fVar169 * fVar195 + fVar227 * fVar298 + fVar277 * fVar216;
        auVar151._8_4_ =
             fVar240 * fVar174 + fVar170 * fVar289 + fVar189 * fVar197 + fVar278 * fVar224;
        auVar151._12_4_ =
             fVar252 * fVar187 + fVar172 * fVar304 + fVar209 * fVar301 + fVar279 * fVar225;
        auVar151._16_4_ =
             fVar241 * fVar191 + fVar215 * fVar291 + fVar282 * fVar130 + fVar276 * fVar226;
        auVar151._20_4_ =
             fVar144 * fVar199 + fVar169 * fVar188 + fVar227 * fVar143 + fVar277 * fVar288;
        auVar151._24_4_ =
             fVar240 * fVar211 + fVar170 * fVar295 + fVar189 * fVar228 + fVar278 * fVar297;
        auVar151._28_4_ =
             fVar302 + auVar271._28_4_ + *(float *)(catmullrom_basis1 + lVar18 + 0x1c) + fVar230;
        auVar218._0_4_ =
             fVar256 * fVar213 + fVar317 * fVar300 + fVar200 * fVar193 + fVar286 * fVar160;
        auVar218._4_4_ =
             fVar269 * fVar216 + fVar320 * fVar195 + fVar210 * fVar298 + fVar287 * fVar171;
        auVar218._8_4_ =
             fVar280 * fVar224 + fVar321 * fVar289 + fVar212 * fVar197 + fVar254 * fVar174;
        auVar218._12_4_ =
             fVar281 * fVar225 + fVar322 * fVar304 + fVar214 * fVar301 + fVar255 * fVar187;
        auVar218._16_4_ =
             fVar256 * fVar226 + fVar317 * fVar291 + fVar200 * fVar130 + fVar286 * fVar191;
        auVar218._20_4_ =
             fVar269 * fVar288 + fVar320 * fVar188 + fVar210 * fVar143 + fVar287 * fVar199;
        auVar218._24_4_ =
             fVar280 * fVar297 + fVar321 * fVar295 + fVar212 * fVar228 + fVar254 * fVar211;
        auVar218._28_4_ = fVar303 + *(float *)(catmullrom_basis0 + lVar18 + 0x122c);
        fVar160 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b18);
        fVar171 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b1c);
        fVar174 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b20);
        fVar187 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b24);
        fVar191 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b28);
        fVar199 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b2c);
        fVar211 = *(float *)(catmullrom_basis1 + lVar18 + 0x1b30);
        fVar213 = *(float *)(catmullrom_basis1 + lVar18 + 0x1f9c);
        fVar216 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa0);
        fVar224 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa4);
        fVar225 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fa8);
        fVar226 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fac);
        fVar288 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fb0);
        fVar297 = *(float *)(catmullrom_basis1 + lVar18 + 0x1fb4);
        fVar300 = *(float *)(catmullrom_basis1 + lVar18 + 0x1694);
        fVar195 = *(float *)(catmullrom_basis1 + lVar18 + 0x1698);
        fVar289 = *(float *)(catmullrom_basis1 + lVar18 + 0x169c);
        fVar304 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a0);
        fVar291 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a4);
        fVar188 = *(float *)(catmullrom_basis1 + lVar18 + 0x16a8);
        fVar295 = *(float *)(catmullrom_basis1 + lVar18 + 0x16ac);
        fVar193 = *(float *)(catmullrom_basis1 + lVar18 + 0x1210);
        fVar298 = *(float *)(catmullrom_basis1 + lVar18 + 0x1214);
        fVar197 = *(float *)(catmullrom_basis1 + lVar18 + 0x1218);
        fVar301 = *(float *)(catmullrom_basis1 + lVar18 + 0x121c);
        fVar130 = *(float *)(catmullrom_basis1 + lVar18 + 0x1220);
        fVar143 = *(float *)(catmullrom_basis1 + lVar18 + 0x1224);
        fVar228 = *(float *)(catmullrom_basis1 + lVar18 + 0x1228);
        auVar235._0_4_ =
             fVar290 * fVar193 + fVar257 * fVar300 + fVar145 * fVar160 + fVar242 * fVar213;
        auVar235._4_4_ =
             fVar294 * fVar298 + fVar263 * fVar195 + fVar157 * fVar171 + fVar250 * fVar216;
        auVar235._8_4_ =
             fVar296 * fVar197 + fVar264 * fVar289 + fVar158 * fVar174 + fVar251 * fVar224;
        auVar235._12_4_ =
             fVar299 * fVar301 + fVar266 * fVar304 + fVar173 * fVar187 + fVar253 * fVar225;
        auVar235._16_4_ =
             fVar290 * fVar130 + fVar257 * fVar291 + fVar145 * fVar191 + fVar242 * fVar226;
        auVar235._20_4_ =
             fVar294 * fVar143 + fVar263 * fVar188 + fVar157 * fVar199 + fVar250 * fVar288;
        auVar235._24_4_ =
             fVar296 * fVar228 + fVar264 * fVar295 + fVar158 * fVar211 + fVar251 * fVar297;
        auVar235._28_4_ = fVar172 + fVar172 + fVar303 + fVar253;
        auVar272._0_4_ =
             fVar241 * fVar193 + fVar276 * fVar300 + fVar215 * fVar160 + fVar282 * fVar213;
        auVar272._4_4_ =
             fVar144 * fVar298 + fVar277 * fVar195 + fVar169 * fVar171 + fVar227 * fVar216;
        auVar272._8_4_ =
             fVar240 * fVar197 + fVar278 * fVar289 + fVar170 * fVar174 + fVar189 * fVar224;
        auVar272._12_4_ =
             fVar252 * fVar301 + fVar279 * fVar304 + fVar172 * fVar187 + fVar209 * fVar225;
        auVar272._16_4_ =
             fVar241 * fVar130 + fVar276 * fVar291 + fVar215 * fVar191 + fVar282 * fVar226;
        auVar272._20_4_ =
             fVar144 * fVar143 + fVar277 * fVar188 + fVar169 * fVar199 + fVar227 * fVar288;
        auVar272._24_4_ =
             fVar240 * fVar228 + fVar278 * fVar295 + fVar170 * fVar211 + fVar189 * fVar297;
        auVar272._28_4_ = fVar172 + fVar172 + fVar172 + fVar303;
        auVar168._0_4_ =
             fVar286 * fVar193 + fVar256 * fVar300 + fVar317 * fVar160 + fVar213 * fVar200;
        auVar168._4_4_ =
             fVar287 * fVar298 + fVar269 * fVar195 + fVar320 * fVar171 + fVar216 * fVar210;
        auVar168._8_4_ =
             fVar254 * fVar197 + fVar280 * fVar289 + fVar321 * fVar174 + fVar224 * fVar212;
        auVar168._12_4_ =
             fVar255 * fVar301 + fVar281 * fVar304 + fVar322 * fVar187 + fVar225 * fVar214;
        auVar168._16_4_ =
             fVar286 * fVar130 + fVar256 * fVar291 + fVar317 * fVar191 + fVar226 * fVar200;
        auVar168._20_4_ =
             fVar287 * fVar143 + fVar269 * fVar188 + fVar320 * fVar199 + fVar288 * fVar210;
        auVar168._24_4_ =
             fVar254 * fVar228 + fVar280 * fVar295 + fVar321 * fVar211 + fVar297 * fVar212;
        auVar168._28_4_ =
             *(float *)(catmullrom_basis1 + lVar18 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar18 + 0x1fb8);
        auVar205._8_4_ = 0x7fffffff;
        auVar205._0_8_ = 0x7fffffff7fffffff;
        auVar205._12_4_ = 0x7fffffff;
        auVar205._16_4_ = 0x7fffffff;
        auVar205._20_4_ = 0x7fffffff;
        auVar205._24_4_ = 0x7fffffff;
        auVar205._28_4_ = 0x7fffffff;
        auVar29 = vandps_avx(_local_460,auVar205);
        auVar36 = vandps_avx(auVar151,auVar205);
        auVar36 = vmaxps_avx(auVar29,auVar36);
        auVar29 = vandps_avx(auVar218,auVar205);
        auVar29 = vmaxps_avx(auVar36,auVar29);
        auVar325 = vpermilps_avx(auVar325,0);
        auVar219._16_16_ = auVar325;
        auVar219._0_16_ = auVar325;
        auVar29 = vcmpps_avx(auVar29,auVar219,1);
        auVar30 = vblendvps_avx(_local_460,auVar27,auVar29);
        auVar183 = vblendvps_avx(auVar151,auVar28,auVar29);
        auVar29 = vandps_avx(auVar235,auVar205);
        auVar36 = vandps_avx(auVar272,auVar205);
        auVar31 = vmaxps_avx(auVar29,auVar36);
        auVar29 = vandps_avx(auVar168,auVar205);
        auVar29 = vmaxps_avx(auVar31,auVar29);
        auVar31 = vcmpps_avx(auVar29,auVar219,1);
        auVar29 = vblendvps_avx(auVar235,auVar27,auVar31);
        auVar27 = vblendvps_avx(auVar272,auVar28,auVar31);
        fVar130 = auVar30._0_4_;
        fVar143 = auVar30._4_4_;
        fVar228 = auVar30._8_4_;
        fVar302 = auVar30._12_4_;
        fVar230 = auVar30._16_4_;
        fVar303 = auVar30._20_4_;
        fVar229 = auVar30._24_4_;
        fVar231 = -auVar30._28_4_;
        fVar305 = auVar29._0_4_;
        fVar159 = auVar29._4_4_;
        fVar190 = auVar29._8_4_;
        fVar192 = auVar29._12_4_;
        fVar194 = auVar29._16_4_;
        fVar196 = auVar29._20_4_;
        fVar198 = auVar29._24_4_;
        fVar282 = auVar183._0_4_;
        fVar174 = auVar183._4_4_;
        fVar199 = auVar183._8_4_;
        fVar216 = auVar183._12_4_;
        fVar288 = auVar183._16_4_;
        fVar289 = auVar183._20_4_;
        fVar295 = auVar183._24_4_;
        auVar136._0_4_ = fVar282 * fVar282 + fVar130 * fVar130;
        auVar136._4_4_ = fVar174 * fVar174 + fVar143 * fVar143;
        auVar136._8_4_ = fVar199 * fVar199 + fVar228 * fVar228;
        auVar136._12_4_ = fVar216 * fVar216 + fVar302 * fVar302;
        auVar136._16_4_ = fVar288 * fVar288 + fVar230 * fVar230;
        auVar136._20_4_ = fVar289 * fVar289 + fVar303 * fVar303;
        auVar136._24_4_ = fVar295 * fVar295 + fVar229 * fVar229;
        auVar136._28_4_ = auVar272._28_4_ + auVar30._28_4_;
        auVar28 = vrsqrtps_avx(auVar136);
        fVar160 = auVar28._0_4_;
        fVar171 = auVar28._4_4_;
        auVar31._4_4_ = fVar171 * 1.5;
        auVar31._0_4_ = fVar160 * 1.5;
        fVar227 = auVar28._8_4_;
        auVar31._8_4_ = fVar227 * 1.5;
        fVar187 = auVar28._12_4_;
        auVar31._12_4_ = fVar187 * 1.5;
        fVar189 = auVar28._16_4_;
        auVar31._16_4_ = fVar189 * 1.5;
        fVar191 = auVar28._20_4_;
        auVar31._20_4_ = fVar191 * 1.5;
        fVar209 = auVar28._24_4_;
        fVar301 = auVar36._28_4_;
        auVar31._24_4_ = fVar209 * 1.5;
        auVar31._28_4_ = fVar301;
        auVar28._4_4_ = fVar171 * fVar171 * fVar171 * auVar136._4_4_ * 0.5;
        auVar28._0_4_ = fVar160 * fVar160 * fVar160 * auVar136._0_4_ * 0.5;
        auVar28._8_4_ = fVar227 * fVar227 * fVar227 * auVar136._8_4_ * 0.5;
        auVar28._12_4_ = fVar187 * fVar187 * fVar187 * auVar136._12_4_ * 0.5;
        auVar28._16_4_ = fVar189 * fVar189 * fVar189 * auVar136._16_4_ * 0.5;
        auVar28._20_4_ = fVar191 * fVar191 * fVar191 * auVar136._20_4_ * 0.5;
        auVar28._24_4_ = fVar209 * fVar209 * fVar209 * auVar136._24_4_ * 0.5;
        auVar28._28_4_ = auVar136._28_4_;
        auVar28 = vsubps_avx(auVar31,auVar28);
        fVar160 = auVar28._0_4_;
        fVar187 = auVar28._4_4_;
        fVar209 = auVar28._8_4_;
        fVar224 = auVar28._12_4_;
        fVar297 = auVar28._16_4_;
        fVar304 = auVar28._20_4_;
        fVar193 = auVar28._24_4_;
        fVar171 = auVar27._0_4_;
        fVar189 = auVar27._4_4_;
        fVar211 = auVar27._8_4_;
        fVar225 = auVar27._12_4_;
        fVar300 = auVar27._16_4_;
        fVar291 = auVar27._20_4_;
        fVar298 = auVar27._24_4_;
        auVar137._0_4_ = fVar171 * fVar171 + fVar305 * fVar305;
        auVar137._4_4_ = fVar189 * fVar189 + fVar159 * fVar159;
        auVar137._8_4_ = fVar211 * fVar211 + fVar190 * fVar190;
        auVar137._12_4_ = fVar225 * fVar225 + fVar192 * fVar192;
        auVar137._16_4_ = fVar300 * fVar300 + fVar194 * fVar194;
        auVar137._20_4_ = fVar291 * fVar291 + fVar196 * fVar196;
        auVar137._24_4_ = fVar298 * fVar298 + fVar198 * fVar198;
        auVar137._28_4_ = auVar29._28_4_ + auVar28._28_4_;
        auVar29 = vrsqrtps_avx(auVar137);
        fVar227 = auVar29._0_4_;
        fVar191 = auVar29._4_4_;
        auVar32._4_4_ = fVar191 * 1.5;
        auVar32._0_4_ = fVar227 * 1.5;
        fVar213 = auVar29._8_4_;
        auVar32._8_4_ = fVar213 * 1.5;
        fVar226 = auVar29._12_4_;
        auVar32._12_4_ = fVar226 * 1.5;
        fVar195 = auVar29._16_4_;
        auVar32._16_4_ = fVar195 * 1.5;
        fVar188 = auVar29._20_4_;
        auVar32._20_4_ = fVar188 * 1.5;
        fVar197 = auVar29._24_4_;
        auVar32._24_4_ = fVar197 * 1.5;
        auVar32._28_4_ = fVar301;
        auVar33._4_4_ = fVar191 * fVar191 * fVar191 * auVar137._4_4_ * 0.5;
        auVar33._0_4_ = fVar227 * fVar227 * fVar227 * auVar137._0_4_ * 0.5;
        auVar33._8_4_ = fVar213 * fVar213 * fVar213 * auVar137._8_4_ * 0.5;
        auVar33._12_4_ = fVar226 * fVar226 * fVar226 * auVar137._12_4_ * 0.5;
        auVar33._16_4_ = fVar195 * fVar195 * fVar195 * auVar137._16_4_ * 0.5;
        auVar33._20_4_ = fVar188 * fVar188 * fVar188 * auVar137._20_4_ * 0.5;
        auVar33._24_4_ = fVar197 * fVar197 * fVar197 * auVar137._24_4_ * 0.5;
        auVar33._28_4_ = auVar137._28_4_;
        auVar29 = vsubps_avx(auVar32,auVar33);
        fVar227 = auVar29._0_4_;
        fVar191 = auVar29._4_4_;
        fVar213 = auVar29._8_4_;
        fVar226 = auVar29._12_4_;
        fVar195 = auVar29._16_4_;
        fVar188 = auVar29._20_4_;
        fVar197 = auVar29._24_4_;
        fVar282 = (float)local_800 * fVar282 * fVar160;
        fVar174 = (float)auStack_7fc._0_4_ * fVar174 * fVar187;
        auVar34._4_4_ = fVar174;
        auVar34._0_4_ = fVar282;
        fVar199 = (float)auStack_7fc._4_4_ * fVar199 * fVar209;
        auVar34._8_4_ = fVar199;
        fVar216 = fStack_7f4 * fVar216 * fVar224;
        auVar34._12_4_ = fVar216;
        fVar288 = fStack_7f0 * fVar288 * fVar297;
        auVar34._16_4_ = fVar288;
        fVar289 = fStack_7ec * fVar289 * fVar304;
        auVar34._20_4_ = fVar289;
        fVar295 = fStack_7e8 * fVar295 * fVar193;
        auVar34._24_4_ = fVar295;
        auVar34._28_4_ = fVar301;
        local_5e0._4_4_ = fVar174 + auVar307._4_4_;
        local_5e0._0_4_ = fVar282 + auVar307._0_4_;
        fStack_5d8 = fVar199 + auVar307._8_4_;
        fStack_5d4 = fVar216 + auVar307._12_4_;
        fStack_5d0 = fVar288 + auVar307._16_4_;
        fStack_5cc = fVar289 + auVar307._20_4_;
        fStack_5c8 = fVar295 + auVar307._24_4_;
        fStack_5c4 = fVar301 + auVar307._28_4_;
        fVar282 = (float)local_800 * fVar160 * -fVar130;
        fVar174 = (float)auStack_7fc._0_4_ * fVar187 * -fVar143;
        auVar35._4_4_ = fVar174;
        auVar35._0_4_ = fVar282;
        fVar199 = (float)auStack_7fc._4_4_ * fVar209 * -fVar228;
        auVar35._8_4_ = fVar199;
        fVar216 = fStack_7f4 * fVar224 * -fVar302;
        auVar35._12_4_ = fVar216;
        fVar288 = fStack_7f0 * fVar297 * -fVar230;
        auVar35._16_4_ = fVar288;
        fVar289 = fStack_7ec * fVar304 * -fVar303;
        auVar35._20_4_ = fVar289;
        fVar295 = fStack_7e8 * fVar193 * -fVar229;
        auVar35._24_4_ = fVar295;
        auVar35._28_4_ = fVar231;
        local_440._4_4_ = auVar271._4_4_ + fVar174;
        local_440._0_4_ = auVar271._0_4_ + fVar282;
        fStack_438 = auVar271._8_4_ + fVar199;
        fStack_434 = auVar271._12_4_ + fVar216;
        auStack_430._0_4_ = auVar271._16_4_ + fVar288;
        auStack_430._4_4_ = auVar271._20_4_ + fVar289;
        fStack_428 = auVar271._24_4_ + fVar295;
        fStack_424 = auVar271._28_4_ + fVar231;
        fVar282 = fVar160 * 0.0 * (float)local_800;
        fVar160 = fVar187 * 0.0 * (float)auStack_7fc._0_4_;
        auVar37._4_4_ = fVar160;
        auVar37._0_4_ = fVar282;
        fVar174 = fVar209 * 0.0 * (float)auStack_7fc._4_4_;
        auVar37._8_4_ = fVar174;
        fVar187 = fVar224 * 0.0 * fStack_7f4;
        auVar37._12_4_ = fVar187;
        fVar199 = fVar297 * 0.0 * fStack_7f0;
        auVar37._16_4_ = fVar199;
        fVar209 = fVar304 * 0.0 * fStack_7ec;
        auVar37._20_4_ = fVar209;
        fVar216 = fVar193 * 0.0 * fStack_7e8;
        auVar37._24_4_ = fVar216;
        auVar37._28_4_ = fVar281;
        auVar236._0_4_ = (float)local_540._0_4_ + fVar282;
        auVar236._4_4_ = (float)local_540._4_4_ + fVar160;
        auVar236._8_4_ = fStack_538 + fVar174;
        auVar236._12_4_ = fStack_534 + fVar187;
        auVar236._16_4_ = fStack_530 + fVar199;
        auVar236._20_4_ = fStack_52c + fVar209;
        auVar236._24_4_ = fStack_528 + fVar216;
        auVar236._28_4_ = fStack_524 + fVar281;
        fVar282 = local_6e0._0_4_ * fVar171 * fVar227;
        fVar160 = local_6e0._4_4_ * fVar189 * fVar191;
        auVar38._4_4_ = fVar160;
        auVar38._0_4_ = fVar282;
        fVar171 = local_6e0._8_4_ * fVar211 * fVar213;
        auVar38._8_4_ = fVar171;
        fVar174 = local_6e0._12_4_ * fVar225 * fVar226;
        auVar38._12_4_ = fVar174;
        fVar187 = local_6e0._16_4_ * fVar300 * fVar195;
        auVar38._16_4_ = fVar187;
        fVar189 = local_6e0._20_4_ * fVar291 * fVar188;
        auVar38._20_4_ = fVar189;
        fVar199 = local_6e0._24_4_ * fVar298 * fVar197;
        auVar38._24_4_ = fVar199;
        auVar38._28_4_ = auVar27._28_4_;
        auVar183 = vsubps_avx(auVar307,auVar34);
        auVar284._0_4_ = auVar204._0_4_ + fVar282;
        auVar284._4_4_ = auVar204._4_4_ + fVar160;
        auVar284._8_4_ = auVar204._8_4_ + fVar171;
        auVar284._12_4_ = auVar204._12_4_ + fVar174;
        auVar284._16_4_ = auVar204._16_4_ + fVar187;
        auVar284._20_4_ = auVar204._20_4_ + fVar189;
        auVar284._24_4_ = auVar204._24_4_ + fVar199;
        auVar284._28_4_ = auVar204._28_4_ + auVar27._28_4_;
        fVar282 = local_6e0._0_4_ * fVar227 * -fVar305;
        fVar160 = local_6e0._4_4_ * fVar191 * -fVar159;
        auVar27._4_4_ = fVar160;
        auVar27._0_4_ = fVar282;
        fVar171 = local_6e0._8_4_ * fVar213 * -fVar190;
        auVar27._8_4_ = fVar171;
        fVar174 = local_6e0._12_4_ * fVar226 * -fVar192;
        auVar27._12_4_ = fVar174;
        fVar187 = local_6e0._16_4_ * fVar195 * -fVar194;
        auVar27._16_4_ = fVar187;
        fVar189 = local_6e0._20_4_ * fVar188 * -fVar196;
        auVar27._20_4_ = fVar189;
        fVar199 = local_6e0._24_4_ * fVar197 * -fVar198;
        auVar27._24_4_ = fVar199;
        auVar27._28_4_ = fVar322;
        auVar271 = vsubps_avx(auVar271,auVar35);
        auVar293._0_4_ = fVar282 + auVar182._0_4_;
        auVar293._4_4_ = fVar160 + auVar182._4_4_;
        auVar293._8_4_ = fVar171 + auVar182._8_4_;
        auVar293._12_4_ = fVar174 + auVar182._12_4_;
        auVar293._16_4_ = fVar187 + auVar182._16_4_;
        auVar293._20_4_ = fVar189 + auVar182._20_4_;
        auVar293._24_4_ = fVar199 + auVar182._24_4_;
        auVar293._28_4_ = fVar322 + auVar182._28_4_;
        fVar282 = fVar227 * 0.0 * local_6e0._0_4_;
        fVar160 = fVar191 * 0.0 * local_6e0._4_4_;
        auVar39._4_4_ = fVar160;
        auVar39._0_4_ = fVar282;
        fVar171 = fVar213 * 0.0 * local_6e0._8_4_;
        auVar39._8_4_ = fVar171;
        fVar227 = fVar226 * 0.0 * local_6e0._12_4_;
        auVar39._12_4_ = fVar227;
        fVar174 = fVar195 * 0.0 * local_6e0._16_4_;
        auVar39._16_4_ = fVar174;
        fVar187 = fVar188 * 0.0 * local_6e0._20_4_;
        auVar39._20_4_ = fVar187;
        fVar189 = fVar197 * 0.0 * local_6e0._24_4_;
        auVar39._24_4_ = fVar189;
        auVar39._28_4_ = fVar231;
        auVar31 = vsubps_avx(_local_540,auVar37);
        auVar114._4_4_ = fStack_47c;
        auVar114._0_4_ = local_480;
        auVar114._8_4_ = fStack_478;
        auVar114._12_4_ = fStack_474;
        auVar114._16_4_ = fStack_470;
        auVar114._20_4_ = fStack_46c;
        auVar114._24_4_ = fStack_468;
        auVar114._28_4_ = fStack_464;
        auVar323._0_4_ = local_480 + fVar282;
        auVar323._4_4_ = fStack_47c + fVar160;
        auVar323._8_4_ = fStack_478 + fVar171;
        auVar323._12_4_ = fStack_474 + fVar227;
        auVar323._16_4_ = fStack_470 + fVar174;
        auVar323._20_4_ = fStack_46c + fVar187;
        auVar323._24_4_ = fStack_468 + fVar189;
        auVar323._28_4_ = fStack_464 + fVar231;
        auVar29 = vsubps_avx(auVar204,auVar38);
        auVar27 = vsubps_avx(auVar182,auVar27);
        auVar28 = vsubps_avx(auVar114,auVar39);
        auVar36 = vsubps_avx(auVar293,auVar271);
        auVar30 = vsubps_avx(auVar323,auVar31);
        auVar40._4_4_ = auVar31._4_4_ * auVar36._4_4_;
        auVar40._0_4_ = auVar31._0_4_ * auVar36._0_4_;
        auVar40._8_4_ = auVar31._8_4_ * auVar36._8_4_;
        auVar40._12_4_ = auVar31._12_4_ * auVar36._12_4_;
        auVar40._16_4_ = auVar31._16_4_ * auVar36._16_4_;
        auVar40._20_4_ = auVar31._20_4_ * auVar36._20_4_;
        auVar40._24_4_ = auVar31._24_4_ * auVar36._24_4_;
        auVar40._28_4_ = fVar322;
        auVar41._4_4_ = auVar271._4_4_ * auVar30._4_4_;
        auVar41._0_4_ = auVar271._0_4_ * auVar30._0_4_;
        auVar41._8_4_ = auVar271._8_4_ * auVar30._8_4_;
        auVar41._12_4_ = auVar271._12_4_ * auVar30._12_4_;
        auVar41._16_4_ = auVar271._16_4_ * auVar30._16_4_;
        auVar41._20_4_ = auVar271._20_4_ * auVar30._20_4_;
        auVar41._24_4_ = auVar271._24_4_ * auVar30._24_4_;
        auVar41._28_4_ = auVar182._28_4_;
        auVar307 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar183._4_4_ * auVar30._4_4_;
        auVar42._0_4_ = auVar183._0_4_ * auVar30._0_4_;
        auVar42._8_4_ = auVar183._8_4_ * auVar30._8_4_;
        auVar42._12_4_ = auVar183._12_4_ * auVar30._12_4_;
        auVar42._16_4_ = auVar183._16_4_ * auVar30._16_4_;
        auVar42._20_4_ = auVar183._20_4_ * auVar30._20_4_;
        auVar42._24_4_ = auVar183._24_4_ * auVar30._24_4_;
        auVar42._28_4_ = auVar30._28_4_;
        auVar32 = vsubps_avx(auVar284,auVar183);
        auVar43._4_4_ = auVar31._4_4_ * auVar32._4_4_;
        auVar43._0_4_ = auVar31._0_4_ * auVar32._0_4_;
        auVar43._8_4_ = auVar31._8_4_ * auVar32._8_4_;
        auVar43._12_4_ = auVar31._12_4_ * auVar32._12_4_;
        auVar43._16_4_ = auVar31._16_4_ * auVar32._16_4_;
        auVar43._20_4_ = auVar31._20_4_ * auVar32._20_4_;
        auVar43._24_4_ = auVar31._24_4_ * auVar32._24_4_;
        auVar43._28_4_ = auVar204._28_4_;
        auVar33 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar32._4_4_ * auVar271._4_4_;
        auVar44._0_4_ = auVar32._0_4_ * auVar271._0_4_;
        auVar44._8_4_ = auVar32._8_4_ * auVar271._8_4_;
        auVar44._12_4_ = auVar32._12_4_ * auVar271._12_4_;
        auVar44._16_4_ = auVar32._16_4_ * auVar271._16_4_;
        auVar44._20_4_ = auVar32._20_4_ * auVar271._20_4_;
        auVar44._24_4_ = auVar32._24_4_ * auVar271._24_4_;
        auVar44._28_4_ = auVar30._28_4_;
        auVar45._4_4_ = auVar183._4_4_ * auVar36._4_4_;
        auVar45._0_4_ = auVar183._0_4_ * auVar36._0_4_;
        auVar45._8_4_ = auVar183._8_4_ * auVar36._8_4_;
        auVar45._12_4_ = auVar183._12_4_ * auVar36._12_4_;
        auVar45._16_4_ = auVar183._16_4_ * auVar36._16_4_;
        auVar45._20_4_ = auVar183._20_4_ * auVar36._20_4_;
        auVar45._24_4_ = auVar183._24_4_ * auVar36._24_4_;
        auVar45._28_4_ = auVar36._28_4_;
        auVar36 = vsubps_avx(auVar45,auVar44);
        auVar138._0_4_ = auVar307._0_4_ * 0.0 + auVar36._0_4_ + auVar33._0_4_ * 0.0;
        auVar138._4_4_ = auVar307._4_4_ * 0.0 + auVar36._4_4_ + auVar33._4_4_ * 0.0;
        auVar138._8_4_ = auVar307._8_4_ * 0.0 + auVar36._8_4_ + auVar33._8_4_ * 0.0;
        auVar138._12_4_ = auVar307._12_4_ * 0.0 + auVar36._12_4_ + auVar33._12_4_ * 0.0;
        auVar138._16_4_ = auVar307._16_4_ * 0.0 + auVar36._16_4_ + auVar33._16_4_ * 0.0;
        auVar138._20_4_ = auVar307._20_4_ * 0.0 + auVar36._20_4_ + auVar33._20_4_ * 0.0;
        auVar138._24_4_ = auVar307._24_4_ * 0.0 + auVar36._24_4_ + auVar33._24_4_ * 0.0;
        auVar138._28_4_ = auVar36._28_4_ + auVar36._28_4_ + auVar33._28_4_;
        auVar307 = vcmpps_avx(auVar138,ZEXT432(0) << 0x20,2);
        local_640 = vblendvps_avx(auVar29,_local_5e0,auVar307);
        auVar29 = vblendvps_avx(auVar27,_local_440,auVar307);
        auVar27 = vblendvps_avx(auVar28,auVar236,auVar307);
        auVar28 = vblendvps_avx(auVar183,auVar284,auVar307);
        auVar36 = vblendvps_avx(auVar271,auVar293,auVar307);
        auVar30 = vblendvps_avx(auVar31,auVar323,auVar307);
        auVar183 = vblendvps_avx(auVar284,auVar183,auVar307);
        auVar271 = vblendvps_avx(auVar293,auVar271,auVar307);
        local_7a0._0_16_ = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        local_7a0._16_16_ = auVar155._16_16_;
        auVar155 = vblendvps_avx(auVar323,auVar31,auVar307);
        auVar183 = vsubps_avx(auVar183,local_640);
        auVar31 = vsubps_avx(auVar271,auVar29);
        auVar32 = vsubps_avx(auVar155,auVar27);
        auVar155 = vsubps_avx(auVar29,auVar36);
        fVar282 = auVar31._0_4_;
        fVar229 = auVar27._0_4_;
        fVar187 = auVar31._4_4_;
        fVar305 = auVar27._4_4_;
        auVar46._4_4_ = fVar305 * fVar187;
        auVar46._0_4_ = fVar229 * fVar282;
        fVar211 = auVar31._8_4_;
        fVar159 = auVar27._8_4_;
        auVar46._8_4_ = fVar159 * fVar211;
        fVar226 = auVar31._12_4_;
        fVar190 = auVar27._12_4_;
        auVar46._12_4_ = fVar190 * fVar226;
        fVar289 = auVar31._16_4_;
        fVar192 = auVar27._16_4_;
        auVar46._16_4_ = fVar192 * fVar289;
        fVar193 = auVar31._20_4_;
        fVar194 = auVar27._20_4_;
        auVar46._20_4_ = fVar194 * fVar193;
        fVar143 = auVar31._24_4_;
        fVar196 = auVar27._24_4_;
        auVar46._24_4_ = fVar196 * fVar143;
        auVar46._28_4_ = auVar271._28_4_;
        fVar160 = auVar29._0_4_;
        fVar158 = auVar32._0_4_;
        fVar189 = auVar29._4_4_;
        fVar173 = auVar32._4_4_;
        auVar47._4_4_ = fVar173 * fVar189;
        auVar47._0_4_ = fVar158 * fVar160;
        fVar213 = auVar29._8_4_;
        fVar215 = auVar32._8_4_;
        auVar47._8_4_ = fVar215 * fVar213;
        fVar288 = auVar29._12_4_;
        fVar169 = auVar32._12_4_;
        auVar47._12_4_ = fVar169 * fVar288;
        fVar304 = auVar29._16_4_;
        fVar170 = auVar32._16_4_;
        auVar47._16_4_ = fVar170 * fVar304;
        fVar298 = auVar29._20_4_;
        fVar172 = auVar32._20_4_;
        auVar47._20_4_ = fVar172 * fVar298;
        fVar228 = auVar29._24_4_;
        fVar200 = auVar32._24_4_;
        auVar47._24_4_ = fVar200 * fVar228;
        auVar47._28_4_ = auVar293._28_4_;
        auVar271 = vsubps_avx(auVar47,auVar46);
        fVar171 = local_640._0_4_;
        fVar191 = local_640._4_4_;
        auVar48._4_4_ = fVar173 * fVar191;
        auVar48._0_4_ = fVar158 * fVar171;
        fVar216 = local_640._8_4_;
        auVar48._8_4_ = fVar215 * fVar216;
        fVar297 = local_640._12_4_;
        auVar48._12_4_ = fVar169 * fVar297;
        fVar291 = local_640._16_4_;
        auVar48._16_4_ = fVar170 * fVar291;
        fVar197 = local_640._20_4_;
        auVar48._20_4_ = fVar172 * fVar197;
        fVar302 = local_640._24_4_;
        auVar48._24_4_ = fVar200 * fVar302;
        auVar48._28_4_ = auVar293._28_4_;
        fVar227 = auVar183._0_4_;
        auVar318._0_4_ = fVar229 * fVar227;
        fVar199 = auVar183._4_4_;
        auVar318._4_4_ = fVar305 * fVar199;
        fVar224 = auVar183._8_4_;
        auVar318._8_4_ = fVar159 * fVar224;
        fVar300 = auVar183._12_4_;
        auVar318._12_4_ = fVar190 * fVar300;
        fVar188 = auVar183._16_4_;
        auVar318._16_4_ = fVar192 * fVar188;
        fVar301 = auVar183._20_4_;
        auVar318._20_4_ = fVar194 * fVar301;
        fVar230 = auVar183._24_4_;
        auVar318._24_4_ = fVar196 * fVar230;
        auVar318._28_4_ = 0;
        auVar33 = vsubps_avx(auVar318,auVar48);
        auVar49._4_4_ = fVar189 * fVar199;
        auVar49._0_4_ = fVar160 * fVar227;
        auVar49._8_4_ = fVar213 * fVar224;
        auVar49._12_4_ = fVar288 * fVar300;
        auVar49._16_4_ = fVar304 * fVar188;
        auVar49._20_4_ = fVar298 * fVar301;
        auVar49._24_4_ = fVar228 * fVar230;
        auVar49._28_4_ = auVar293._28_4_;
        auVar50._4_4_ = fVar191 * fVar187;
        auVar50._0_4_ = fVar171 * fVar282;
        auVar50._8_4_ = fVar216 * fVar211;
        auVar50._12_4_ = fVar297 * fVar226;
        auVar50._16_4_ = fVar291 * fVar289;
        auVar50._20_4_ = fVar197 * fVar193;
        auVar50._24_4_ = fVar302 * fVar143;
        auVar50._28_4_ = auVar323._28_4_;
        auVar34 = vsubps_avx(auVar50,auVar49);
        auVar35 = vsubps_avx(auVar27,auVar30);
        fVar174 = auVar34._28_4_ + auVar33._28_4_;
        auVar152._0_4_ = auVar34._0_4_ + auVar33._0_4_ * 0.0 + auVar271._0_4_ * 0.0;
        auVar152._4_4_ = auVar34._4_4_ + auVar33._4_4_ * 0.0 + auVar271._4_4_ * 0.0;
        auVar152._8_4_ = auVar34._8_4_ + auVar33._8_4_ * 0.0 + auVar271._8_4_ * 0.0;
        auVar152._12_4_ = auVar34._12_4_ + auVar33._12_4_ * 0.0 + auVar271._12_4_ * 0.0;
        auVar152._16_4_ = auVar34._16_4_ + auVar33._16_4_ * 0.0 + auVar271._16_4_ * 0.0;
        auVar152._20_4_ = auVar34._20_4_ + auVar33._20_4_ * 0.0 + auVar271._20_4_ * 0.0;
        auVar152._24_4_ = auVar34._24_4_ + auVar33._24_4_ * 0.0 + auVar271._24_4_ * 0.0;
        auVar152._28_4_ = fVar174 + auVar271._28_4_;
        fVar198 = auVar155._0_4_;
        fVar231 = auVar155._4_4_;
        auVar51._4_4_ = fVar231 * auVar30._4_4_;
        auVar51._0_4_ = fVar198 * auVar30._0_4_;
        fVar265 = auVar155._8_4_;
        auVar51._8_4_ = fVar265 * auVar30._8_4_;
        fVar267 = auVar155._12_4_;
        auVar51._12_4_ = fVar267 * auVar30._12_4_;
        fVar268 = auVar155._16_4_;
        auVar51._16_4_ = fVar268 * auVar30._16_4_;
        fVar145 = auVar155._20_4_;
        auVar51._20_4_ = fVar145 * auVar30._20_4_;
        fVar157 = auVar155._24_4_;
        auVar51._24_4_ = fVar157 * auVar30._24_4_;
        auVar51._28_4_ = fVar174;
        fVar174 = auVar35._0_4_;
        fVar209 = auVar35._4_4_;
        auVar52._4_4_ = auVar36._4_4_ * fVar209;
        auVar52._0_4_ = auVar36._0_4_ * fVar174;
        fVar225 = auVar35._8_4_;
        auVar52._8_4_ = auVar36._8_4_ * fVar225;
        fVar195 = auVar35._12_4_;
        auVar52._12_4_ = auVar36._12_4_ * fVar195;
        fVar295 = auVar35._16_4_;
        auVar52._16_4_ = auVar36._16_4_ * fVar295;
        fVar130 = auVar35._20_4_;
        auVar52._20_4_ = auVar36._20_4_ * fVar130;
        fVar303 = auVar35._24_4_;
        auVar52._24_4_ = auVar36._24_4_ * fVar303;
        auVar52._28_4_ = auVar34._28_4_;
        auVar155 = vsubps_avx(auVar52,auVar51);
        auVar33 = vsubps_avx(local_640,auVar28);
        fVar210 = auVar33._0_4_;
        fVar212 = auVar33._4_4_;
        auVar53._4_4_ = fVar212 * auVar30._4_4_;
        auVar53._0_4_ = fVar210 * auVar30._0_4_;
        fVar241 = auVar33._8_4_;
        auVar53._8_4_ = fVar241 * auVar30._8_4_;
        fVar144 = auVar33._12_4_;
        auVar53._12_4_ = fVar144 * auVar30._12_4_;
        fVar240 = auVar33._16_4_;
        auVar53._16_4_ = fVar240 * auVar30._16_4_;
        fVar252 = auVar33._20_4_;
        auVar53._20_4_ = fVar252 * auVar30._20_4_;
        fVar257 = auVar33._24_4_;
        auVar53._24_4_ = fVar257 * auVar30._24_4_;
        auVar53._28_4_ = auVar30._28_4_;
        auVar54._4_4_ = auVar28._4_4_ * fVar209;
        auVar54._0_4_ = auVar28._0_4_ * fVar174;
        auVar54._8_4_ = auVar28._8_4_ * fVar225;
        auVar54._12_4_ = auVar28._12_4_ * fVar195;
        auVar54._16_4_ = auVar28._16_4_ * fVar295;
        auVar54._20_4_ = auVar28._20_4_ * fVar130;
        auVar54._24_4_ = auVar28._24_4_ * fVar303;
        auVar54._28_4_ = auVar271._28_4_;
        auVar271 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar36._4_4_ * fVar212;
        auVar55._0_4_ = auVar36._0_4_ * fVar210;
        auVar55._8_4_ = auVar36._8_4_ * fVar241;
        auVar55._12_4_ = auVar36._12_4_ * fVar144;
        auVar55._16_4_ = auVar36._16_4_ * fVar240;
        auVar55._20_4_ = auVar36._20_4_ * fVar252;
        auVar55._24_4_ = auVar36._24_4_ * fVar257;
        auVar55._28_4_ = auVar30._28_4_;
        auVar56._4_4_ = auVar28._4_4_ * fVar231;
        auVar56._0_4_ = auVar28._0_4_ * fVar198;
        auVar56._8_4_ = auVar28._8_4_ * fVar265;
        auVar56._12_4_ = auVar28._12_4_ * fVar267;
        auVar56._16_4_ = auVar28._16_4_ * fVar268;
        auVar56._20_4_ = auVar28._20_4_ * fVar145;
        auVar56._24_4_ = auVar28._24_4_ * fVar157;
        auVar56._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar56,auVar55);
        auVar206._0_4_ = auVar155._0_4_ * 0.0 + auVar28._0_4_ + auVar271._0_4_ * 0.0;
        auVar206._4_4_ = auVar155._4_4_ * 0.0 + auVar28._4_4_ + auVar271._4_4_ * 0.0;
        auVar206._8_4_ = auVar155._8_4_ * 0.0 + auVar28._8_4_ + auVar271._8_4_ * 0.0;
        auVar206._12_4_ = auVar155._12_4_ * 0.0 + auVar28._12_4_ + auVar271._12_4_ * 0.0;
        auVar206._16_4_ = auVar155._16_4_ * 0.0 + auVar28._16_4_ + auVar271._16_4_ * 0.0;
        auVar206._20_4_ = auVar155._20_4_ * 0.0 + auVar28._20_4_ + auVar271._20_4_ * 0.0;
        auVar206._24_4_ = auVar155._24_4_ * 0.0 + auVar28._24_4_ + auVar271._24_4_ * 0.0;
        auVar206._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar271._28_4_;
        auVar155 = vmaxps_avx(auVar152,auVar206);
        auVar155 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,2);
        auVar325 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auVar325 = vpand_avx(auVar325,local_7a0._0_16_);
        auVar179 = vpmovsxwd_avx(auVar325);
        auVar180 = vpunpckhwd_avx(auVar325,auVar325);
        auVar184._16_16_ = auVar180;
        auVar184._0_16_ = auVar179;
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0x7f,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar180 >> 0x3f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar180[0xf]) {
LAB_0107e1e0:
          auVar156 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        }
        else {
          auVar57._4_4_ = fVar209 * fVar187;
          auVar57._0_4_ = fVar174 * fVar282;
          auVar57._8_4_ = fVar225 * fVar211;
          auVar57._12_4_ = fVar195 * fVar226;
          auVar57._16_4_ = fVar295 * fVar289;
          auVar57._20_4_ = fVar130 * fVar193;
          auVar57._24_4_ = fVar303 * fVar143;
          auVar57._28_4_ = auVar180._12_4_;
          auVar309._0_4_ = fVar198 * fVar158;
          auVar309._4_4_ = fVar231 * fVar173;
          auVar309._8_4_ = fVar265 * fVar215;
          auVar309._12_4_ = fVar267 * fVar169;
          auVar309._16_4_ = fVar268 * fVar170;
          auVar309._20_4_ = fVar145 * fVar172;
          auVar309._24_4_ = fVar157 * fVar200;
          auVar309._28_4_ = 0;
          auVar155 = vsubps_avx(auVar309,auVar57);
          auVar58._4_4_ = fVar212 * fVar173;
          auVar58._0_4_ = fVar210 * fVar158;
          auVar58._8_4_ = fVar241 * fVar215;
          auVar58._12_4_ = fVar144 * fVar169;
          auVar58._16_4_ = fVar240 * fVar170;
          auVar58._20_4_ = fVar252 * fVar172;
          auVar58._24_4_ = fVar257 * fVar200;
          auVar58._28_4_ = auVar32._28_4_;
          auVar59._4_4_ = fVar209 * fVar199;
          auVar59._0_4_ = fVar174 * fVar227;
          auVar59._8_4_ = fVar225 * fVar224;
          auVar59._12_4_ = fVar195 * fVar300;
          auVar59._16_4_ = fVar295 * fVar188;
          auVar59._20_4_ = fVar130 * fVar301;
          auVar59._24_4_ = fVar303 * fVar230;
          auVar59._28_4_ = auVar35._28_4_;
          auVar36 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar231 * fVar199;
          auVar60._0_4_ = fVar198 * fVar227;
          auVar60._8_4_ = fVar265 * fVar224;
          auVar60._12_4_ = fVar267 * fVar300;
          auVar60._16_4_ = fVar268 * fVar188;
          auVar60._20_4_ = fVar145 * fVar301;
          auVar60._24_4_ = fVar157 * fVar230;
          auVar60._28_4_ = auVar152._28_4_;
          auVar61._4_4_ = fVar212 * fVar187;
          auVar61._0_4_ = fVar210 * fVar282;
          auVar61._8_4_ = fVar241 * fVar211;
          auVar61._12_4_ = fVar144 * fVar226;
          auVar61._16_4_ = fVar240 * fVar289;
          auVar61._20_4_ = fVar252 * fVar193;
          auVar61._24_4_ = fVar257 * fVar143;
          auVar61._28_4_ = auVar31._28_4_;
          auVar30 = vsubps_avx(auVar61,auVar60);
          auVar249._0_4_ = auVar155._0_4_ * 0.0 + auVar30._0_4_ + auVar36._0_4_ * 0.0;
          auVar249._4_4_ = auVar155._4_4_ * 0.0 + auVar30._4_4_ + auVar36._4_4_ * 0.0;
          auVar249._8_4_ = auVar155._8_4_ * 0.0 + auVar30._8_4_ + auVar36._8_4_ * 0.0;
          auVar249._12_4_ = auVar155._12_4_ * 0.0 + auVar30._12_4_ + auVar36._12_4_ * 0.0;
          auVar249._16_4_ = auVar155._16_4_ * 0.0 + auVar30._16_4_ + auVar36._16_4_ * 0.0;
          auVar249._20_4_ = auVar155._20_4_ * 0.0 + auVar30._20_4_ + auVar36._20_4_ * 0.0;
          auVar249._24_4_ = auVar155._24_4_ * 0.0 + auVar30._24_4_ + auVar36._24_4_ * 0.0;
          auVar249._28_4_ = auVar31._28_4_ + auVar30._28_4_ + auVar152._28_4_;
          auVar28 = vrcpps_avx(auVar249);
          fVar227 = auVar28._0_4_;
          fVar174 = auVar28._4_4_;
          auVar62._4_4_ = auVar249._4_4_ * fVar174;
          auVar62._0_4_ = auVar249._0_4_ * fVar227;
          fVar187 = auVar28._8_4_;
          auVar62._8_4_ = auVar249._8_4_ * fVar187;
          fVar199 = auVar28._12_4_;
          auVar62._12_4_ = auVar249._12_4_ * fVar199;
          fVar209 = auVar28._16_4_;
          auVar62._16_4_ = auVar249._16_4_ * fVar209;
          fVar211 = auVar28._20_4_;
          auVar62._20_4_ = auVar249._20_4_ * fVar211;
          fVar224 = auVar28._24_4_;
          auVar62._24_4_ = auVar249._24_4_ * fVar224;
          auVar62._28_4_ = auVar35._28_4_;
          auVar310._8_4_ = 0x3f800000;
          auVar310._0_8_ = &DAT_3f8000003f800000;
          auVar310._12_4_ = 0x3f800000;
          auVar310._16_4_ = 0x3f800000;
          auVar310._20_4_ = 0x3f800000;
          auVar310._24_4_ = 0x3f800000;
          auVar310._28_4_ = 0x3f800000;
          auVar271 = vsubps_avx(auVar310,auVar62);
          fVar227 = auVar271._0_4_ * fVar227 + fVar227;
          fVar174 = auVar271._4_4_ * fVar174 + fVar174;
          fVar187 = auVar271._8_4_ * fVar187 + fVar187;
          fVar199 = auVar271._12_4_ * fVar199 + fVar199;
          fVar209 = auVar271._16_4_ * fVar209 + fVar209;
          fVar211 = auVar271._20_4_ * fVar211 + fVar211;
          fVar224 = auVar271._24_4_ * fVar224 + fVar224;
          auVar63._4_4_ =
               (auVar155._4_4_ * fVar191 + auVar36._4_4_ * fVar189 + auVar30._4_4_ * fVar305) *
               fVar174;
          auVar63._0_4_ =
               (auVar155._0_4_ * fVar171 + auVar36._0_4_ * fVar160 + auVar30._0_4_ * fVar229) *
               fVar227;
          auVar63._8_4_ =
               (auVar155._8_4_ * fVar216 + auVar36._8_4_ * fVar213 + auVar30._8_4_ * fVar159) *
               fVar187;
          auVar63._12_4_ =
               (auVar155._12_4_ * fVar297 + auVar36._12_4_ * fVar288 + auVar30._12_4_ * fVar190) *
               fVar199;
          auVar63._16_4_ =
               (auVar155._16_4_ * fVar291 + auVar36._16_4_ * fVar304 + auVar30._16_4_ * fVar192) *
               fVar209;
          auVar63._20_4_ =
               (auVar155._20_4_ * fVar197 + auVar36._20_4_ * fVar298 + auVar30._20_4_ * fVar194) *
               fVar211;
          auVar63._24_4_ =
               (auVar155._24_4_ * fVar302 + auVar36._24_4_ * fVar228 + auVar30._24_4_ * fVar196) *
               fVar224;
          auVar63._28_4_ = local_640._28_4_ + auVar183._28_4_ + auVar27._28_4_;
          auVar179 = vpermilps_avx(ZEXT416(local_7e0),0);
          auVar185._16_16_ = auVar179;
          auVar185._0_16_ = auVar179;
          auVar155 = vcmpps_avx(auVar185,auVar63,2);
          fVar282 = ray->tfar;
          auVar220._4_4_ = fVar282;
          auVar220._0_4_ = fVar282;
          auVar220._8_4_ = fVar282;
          auVar220._12_4_ = fVar282;
          auVar220._16_4_ = fVar282;
          auVar220._20_4_ = fVar282;
          auVar220._24_4_ = fVar282;
          auVar220._28_4_ = fVar282;
          auVar27 = vcmpps_avx(auVar63,auVar220,2);
          auVar155 = vandps_avx(auVar27,auVar155);
          auVar179 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar325 = vpand_avx(auVar325,auVar179);
          auVar179 = vpmovsxwd_avx(auVar325);
          auVar180 = vpshufd_avx(auVar325,0xee);
          auVar180 = vpmovsxwd_avx(auVar180);
          auVar186._16_16_ = auVar180;
          auVar186._0_16_ = auVar179;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0x7f,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar180 >> 0x3f,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar180[0xf]) goto LAB_0107e1e0;
          auVar155 = vcmpps_avx(ZEXT832(0) << 0x20,auVar249,4);
          auVar179 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar325 = vpand_avx(auVar325,auVar179);
          auVar179 = vpmovsxwd_avx(auVar325);
          auVar325 = vpunpckhwd_avx(auVar325,auVar325);
          auVar237._16_16_ = auVar325;
          auVar237._0_16_ = auVar179;
          auVar156 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar237 >> 0x7f,0) != '\0') ||
                (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar325 >> 0x3f,0) != '\0') ||
              (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar325[0xf] < '\0') {
            auVar64._4_4_ = auVar152._4_4_ * fVar174;
            auVar64._0_4_ = auVar152._0_4_ * fVar227;
            auVar64._8_4_ = auVar152._8_4_ * fVar187;
            auVar64._12_4_ = auVar152._12_4_ * fVar199;
            auVar64._16_4_ = auVar152._16_4_ * fVar209;
            auVar64._20_4_ = auVar152._20_4_ * fVar211;
            auVar64._24_4_ = auVar152._24_4_ * fVar224;
            auVar64._28_4_ = local_4c0._28_4_;
            auVar65._4_4_ = auVar206._4_4_ * fVar174;
            auVar65._0_4_ = auVar206._0_4_ * fVar227;
            auVar65._8_4_ = auVar206._8_4_ * fVar187;
            auVar65._12_4_ = auVar206._12_4_ * fVar199;
            auVar65._16_4_ = auVar206._16_4_ * fVar209;
            auVar65._20_4_ = auVar206._20_4_ * fVar211;
            auVar65._24_4_ = auVar206._24_4_ * fVar224;
            auVar65._28_4_ = auVar271._28_4_ + auVar28._28_4_;
            auVar221._8_4_ = 0x3f800000;
            auVar221._0_8_ = &DAT_3f8000003f800000;
            auVar221._12_4_ = 0x3f800000;
            auVar221._16_4_ = 0x3f800000;
            auVar221._20_4_ = 0x3f800000;
            auVar221._24_4_ = 0x3f800000;
            auVar221._28_4_ = 0x3f800000;
            auVar155 = vsubps_avx(auVar221,auVar64);
            local_4a0 = vblendvps_avx(auVar155,auVar64,auVar307);
            auVar155 = vsubps_avx(auVar221,auVar65);
            _local_360 = vblendvps_avx(auVar155,auVar65,auVar307);
            auVar156 = ZEXT3264(auVar237);
            local_4c0 = auVar63;
          }
        }
        auVar319 = ZEXT3264(local_660);
        auVar142 = ZEXT3264(auVar308);
        auVar155 = auVar156._0_32_;
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar155 >> 0x7f,0) == '\0') &&
              (auVar156 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar155 >> 0xbf,0) == '\0') &&
            (auVar156 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar156[0x1f]) {
          uVar125 = 0;
        }
        else {
          auVar27 = vsubps_avx(local_6e0._0_32_,_local_800);
          fVar160 = (float)local_800 + auVar27._0_4_ * local_4a0._0_4_;
          fVar171 = (float)auStack_7fc._0_4_ + auVar27._4_4_ * local_4a0._4_4_;
          fVar227 = (float)auStack_7fc._4_4_ + auVar27._8_4_ * local_4a0._8_4_;
          fVar174 = fStack_7f4 + auVar27._12_4_ * local_4a0._12_4_;
          fVar187 = fStack_7f0 + auVar27._16_4_ * local_4a0._16_4_;
          fVar189 = fStack_7ec + auVar27._20_4_ * local_4a0._20_4_;
          fVar191 = fStack_7e8 + auVar27._24_4_ * local_4a0._24_4_;
          fVar199 = auVar27._28_4_ + 0.0;
          fVar282 = local_7a8->depth_scale;
          auVar66._4_4_ = (fVar171 + fVar171) * fVar282;
          auVar66._0_4_ = (fVar160 + fVar160) * fVar282;
          auVar66._8_4_ = (fVar227 + fVar227) * fVar282;
          auVar66._12_4_ = (fVar174 + fVar174) * fVar282;
          auVar66._16_4_ = (fVar187 + fVar187) * fVar282;
          auVar66._20_4_ = (fVar189 + fVar189) * fVar282;
          auVar66._24_4_ = (fVar191 + fVar191) * fVar282;
          auVar66._28_4_ = fVar199 + fVar199;
          auVar27 = vcmpps_avx(local_4c0,auVar66,6);
          auVar28 = auVar155 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            local_220 = vandps_avx(auVar27,auVar155);
            local_2c0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_2c0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_2b8 = (float)uStack_358 + (float)uStack_358 + -1.0;
            fStack_2b4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            fStack_2b0 = (float)uStack_350 + (float)uStack_350 + -1.0;
            fStack_2ac = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            fStack_2a8 = (float)uStack_348 + (float)uStack_348 + -1.0;
            fStack_2a4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_280 = 0;
            uStack_268 = uStack_6a8;
            uStack_258 = local_3f0._8_8_;
            uStack_248 = local_400._8_8_;
            uStack_238 = local_410._8_8_;
            local_360._4_4_ = local_2c0._4_4_;
            local_360._0_4_ = local_2c0._0_4_;
            uStack_358._0_4_ = fStack_2b8;
            uStack_358._4_4_ = fStack_2b4;
            uStack_350._0_4_ = fStack_2b0;
            uStack_350._4_4_ = fStack_2ac;
            auVar150 = _local_360;
            uStack_348._0_4_ = fStack_2a8;
            uStack_348._4_4_ = fStack_2a4;
            auVar155 = _local_360;
            if ((pGVar14->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar125 = CONCAT71((int7)(uVar125 >> 8),1),
                 pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar166._0_4_ = 1.0 / auVar178._0_4_;
                auVar166._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar325 = vshufps_avx(auVar166,auVar166,0);
                local_200[0] = auVar325._0_4_ * (local_4a0._0_4_ + 0.0);
                local_200[1] = auVar325._4_4_ * (local_4a0._4_4_ + 1.0);
                local_200[2] = auVar325._8_4_ * (local_4a0._8_4_ + 2.0);
                local_200[3] = auVar325._12_4_ * (local_4a0._12_4_ + 3.0);
                fStack_1f0 = auVar325._0_4_ * (local_4a0._16_4_ + 4.0);
                fStack_1ec = auVar325._4_4_ * (local_4a0._20_4_ + 5.0);
                fStack_1e8 = auVar325._8_4_ * (local_4a0._24_4_ + 6.0);
                fStack_1e4 = local_4a0._28_4_ + 7.0;
                uStack_350 = auVar150._16_8_;
                uStack_348 = auVar155._24_8_;
                local_1e0 = local_360;
                uStack_1d8 = uStack_358;
                uStack_1d0 = uStack_350;
                uStack_1c8 = uStack_348;
                local_1c0 = local_4c0;
                iVar123 = vmovmskps_avx(local_220);
                uVar126 = CONCAT44((int)((ulong)context->args >> 0x20),iVar123);
                lVar128 = 0;
                if (uVar126 != 0) {
                  for (; (uVar126 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
                  }
                }
                uVar125 = CONCAT71((int7)(uVar125 >> 8),iVar123 != 0);
                _local_360 = auVar155;
                if (iVar123 != 0) {
                  local_7a0._0_8_ = uVar126;
                  _auStack_6f0 = auVar29._16_16_;
                  uStack_6f8 = local_3f0._8_8_;
                  local_700 = (undefined1  [8])local_3f0._0_8_;
                  _auStack_5b0 = auVar204._16_16_;
                  uStack_5b8 = local_400._8_8_;
                  local_5c0 = (undefined1  [8])local_400._0_8_;
                  _auStack_710 = auVar182._16_16_;
                  uStack_718 = local_410._8_8_;
                  local_720 = (undefined1  [8])local_410._0_8_;
                  _local_580 = auVar308;
                  local_2e0 = local_4a0;
                  local_2a0 = local_4c0;
                  local_27c = uVar127;
                  local_270 = local_6b0;
                  local_260 = local_3f0._0_8_;
                  local_250 = local_400._0_8_;
                  local_240 = local_410._0_8_;
                  do {
                    local_694 = local_200[lVar128];
                    local_690 = *(undefined4 *)((long)&local_1e0 + lVar128 * 4);
                    local_640._0_4_ = ray->tfar;
                    local_6e0._0_8_ = lVar128;
                    ray->tfar = *(float *)(local_1c0 + lVar128 * 4);
                    fVar160 = 1.0 - local_694;
                    fVar282 = local_694 * 3.0;
                    auVar325 = ZEXT416((uint)((fVar160 * -2.0 * local_694 + local_694 * local_694) *
                                             0.5));
                    auVar325 = vshufps_avx(auVar325,auVar325,0);
                    auVar179 = ZEXT416((uint)(((fVar160 + fVar160) * (fVar282 + 2.0) +
                                              fVar160 * fVar160 * -3.0) * 0.5));
                    auVar179 = vshufps_avx(auVar179,auVar179,0);
                    auVar180 = ZEXT416((uint)(((local_694 + local_694) * (fVar282 + -5.0) +
                                              local_694 * fVar282) * 0.5));
                    auVar180 = vshufps_avx(auVar180,auVar180,0);
                    auVar181 = ZEXT416((uint)((local_694 * (fVar160 + fVar160) - fVar160 * fVar160)
                                             * 0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar167._0_4_ =
                         auVar181._0_4_ * (float)local_6b0._0_4_ +
                         auVar180._0_4_ * (float)local_700._0_4_ +
                         auVar325._0_4_ * (float)local_720._0_4_ +
                         auVar179._0_4_ * (float)local_5c0._0_4_;
                    auVar167._4_4_ =
                         auVar181._4_4_ * (float)local_6b0._4_4_ +
                         auVar180._4_4_ * (float)local_700._4_4_ +
                         auVar325._4_4_ * (float)local_720._4_4_ +
                         auVar179._4_4_ * (float)local_5c0._4_4_;
                    auVar167._8_4_ =
                         auVar181._8_4_ * (float)uStack_6a8 +
                         auVar180._8_4_ * (float)uStack_6f8 +
                         auVar325._8_4_ * (float)uStack_718 + auVar179._8_4_ * (float)uStack_5b8;
                    auVar167._12_4_ =
                         auVar181._12_4_ * uStack_6a8._4_4_ +
                         auVar180._12_4_ * uStack_6f8._4_4_ +
                         auVar325._12_4_ * uStack_718._4_4_ + auVar179._12_4_ * uStack_5b8._4_4_;
                    local_750.context = context->user;
                    local_6a0 = vmovlps_avx(auVar167);
                    local_698 = vextractps_avx(auVar167,2);
                    local_68c = (undefined4)local_668;
                    local_688 = (undefined4)local_7b0;
                    local_684 = (local_750.context)->instID[0];
                    local_680 = (local_750.context)->instPrimID[0];
                    local_804 = -1;
                    local_750.valid = &local_804;
                    local_750.geometryUserPtr = pGVar14->userPtr;
                    local_750.hit = (RTCHitN *)&local_6a0;
                    local_750.N = 1;
                    local_800 = (undefined1  [4])(int)uVar125;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0107e4d0:
                      auVar308 = auVar142._0_32_;
                      p_Var17 = context->args->filter;
                      if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var17)(&local_750);
                        uVar125 = (ulong)(uint)local_800;
                        auVar142 = ZEXT3264(_local_580);
                        auVar319 = ZEXT3264(local_660);
                      }
                      auVar308 = auVar142._0_32_;
                      if (*local_750.valid != 0) break;
                    }
                    else {
                      (*pGVar14->occlusionFilterN)(&local_750);
                      uVar125 = (ulong)(uint)local_800;
                      auVar142 = ZEXT3264(_local_580);
                      auVar319 = ZEXT3264(local_660);
                      if (*local_750.valid != 0) goto LAB_0107e4d0;
                    }
                    auVar308 = auVar142._0_32_;
                    ray->tfar = (float)local_640._0_4_;
                    uVar126 = local_7a0._0_8_ ^ 1L << (local_6e0._0_8_ & 0x3f);
                    lVar128 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
                      }
                    }
                    local_7a0._0_8_ = uVar126;
                    uVar125 = CONCAT71((int7)(uVar125 >> 8),uVar126 != 0);
                  } while (uVar126 != 0);
                }
                uVar125 = uVar125 & 0xffffffffffffff01;
              }
              goto LAB_0107d33f;
            }
          }
          uVar125 = 0;
        }
LAB_0107d33f:
        auVar325 = local_780._0_16_;
      }
      auVar156 = ZEXT1664(auVar325);
      if (8 < (int)uVar127) {
        _local_440 = vpshufd_avx(ZEXT416(uVar127),0);
        auVar325 = vshufps_avx(auVar325,auVar325,0);
        local_100._16_16_ = auVar325;
        local_100._0_16_ = auVar325;
        auVar112._4_4_ = uStack_7dc;
        auVar112._0_4_ = local_7e0;
        auVar112._8_4_ = fStack_7d8;
        auVar112._12_4_ = fStack_7d4;
        auVar325 = vpermilps_avx(auVar112,0);
        local_120._16_16_ = auVar325;
        local_120._0_16_ = auVar325;
        auVar135._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar135._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar325 = vshufps_avx(auVar135,auVar135,0);
        _fStack_3d0 = auVar325;
        _local_3e0 = auVar325;
        auVar142 = ZEXT3264(_local_3e0);
        lVar128 = 8;
        local_660 = auVar319._0_32_;
        fVar282 = (float)local_620._0_4_;
        fVar160 = (float)local_620._4_4_;
        fVar171 = fStack_618;
        fVar227 = fStack_614;
        fVar174 = fStack_610;
        fVar187 = fStack_60c;
        fVar189 = fStack_608;
        fVar191 = fStack_604;
        fVar199 = (float)local_5a0._0_4_;
        fVar209 = (float)local_5a0._4_4_;
        fVar211 = fStack_598;
        fVar213 = fStack_594;
        fVar216 = fStack_590;
        fVar224 = fStack_58c;
        fVar225 = fStack_588;
        fVar226 = (float)local_4e0._0_4_;
        fVar288 = (float)local_4e0._4_4_;
        fVar297 = fStack_4d8;
        fVar300 = fStack_4d4;
        fVar195 = fStack_4d0;
        fVar289 = fStack_4cc;
        fVar304 = fStack_4c8;
        _local_580 = auVar308;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar128 * 4 + lVar18);
          fVar291 = *(float *)*pauVar9;
          fVar188 = *(float *)(*pauVar9 + 4);
          fVar295 = *(float *)(*pauVar9 + 8);
          fVar193 = *(float *)(*pauVar9 + 0xc);
          fVar298 = *(float *)(*pauVar9 + 0x10);
          fVar197 = *(float *)(*pauVar9 + 0x14);
          fVar301 = *(float *)(*pauVar9 + 0x18);
          auVar120 = *pauVar9;
          pauVar10 = (undefined1 (*) [28])(lVar18 + 0x22307f0 + lVar128 * 4);
          fVar130 = *(float *)*pauVar10;
          fVar143 = *(float *)(*pauVar10 + 4);
          fVar228 = *(float *)(*pauVar10 + 8);
          fVar302 = *(float *)(*pauVar10 + 0xc);
          fVar230 = *(float *)(*pauVar10 + 0x10);
          fVar303 = *(float *)(*pauVar10 + 0x14);
          fVar229 = *(float *)(*pauVar10 + 0x18);
          auVar119 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar18 + 0x2230c74 + lVar128 * 4);
          fVar305 = *(float *)*pauVar10;
          fVar159 = *(float *)(*pauVar10 + 4);
          fVar190 = *(float *)(*pauVar10 + 8);
          fVar192 = *(float *)(*pauVar10 + 0xc);
          fVar194 = *(float *)(*pauVar10 + 0x10);
          fVar196 = *(float *)(*pauVar10 + 0x14);
          fVar198 = *(float *)(*pauVar10 + 0x18);
          auVar118 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar18 + 0x22310f8 + lVar128 * 4);
          fVar231 = *(float *)*pauVar10;
          fVar265 = *(float *)(*pauVar10 + 4);
          fVar267 = *(float *)(*pauVar10 + 8);
          fVar268 = *(float *)(*pauVar10 + 0xc);
          fVar145 = *(float *)(*pauVar10 + 0x10);
          fVar157 = *(float *)(*pauVar10 + 0x14);
          fVar158 = *(float *)(*pauVar10 + 0x18);
          auVar117 = *pauVar10;
          fVar173 = fVar191 + *(float *)pauVar10[1];
          fVar169 = auVar319._0_4_;
          fVar170 = auVar319._4_4_;
          fVar172 = auVar319._8_4_;
          fVar200 = auVar319._12_4_;
          fVar210 = auVar319._16_4_;
          fVar212 = auVar319._20_4_;
          fVar241 = auVar319._24_4_;
          fStack_7c4 = fVar191 + fVar191 + auVar142._28_4_;
          fVar215 = fVar191 + fVar173;
          auVar273._0_4_ =
               (float)local_160._0_4_ * fVar291 +
               fVar169 * fVar130 + fVar199 * fVar305 + (float)local_3c0._0_4_ * fVar231;
          auVar273._4_4_ =
               (float)local_160._4_4_ * fVar188 +
               fVar170 * fVar143 + fVar209 * fVar159 + (float)local_3c0._4_4_ * fVar265;
          auVar273._8_4_ =
               fStack_158 * fVar295 + fVar172 * fVar228 + fVar211 * fVar190 + fStack_3b8 * fVar267;
          auVar273._12_4_ =
               fStack_154 * fVar193 + fVar200 * fVar302 + fVar213 * fVar192 + fStack_3b4 * fVar268;
          auVar273._16_4_ =
               fStack_150 * fVar298 + fVar210 * fVar230 + fVar216 * fVar194 + fStack_3b0 * fVar145;
          auVar273._20_4_ =
               fStack_14c * fVar197 + fVar212 * fVar303 + fVar224 * fVar196 + fStack_3ac * fVar157;
          auVar273._24_4_ =
               fStack_148 * fVar301 + fVar241 * fVar229 + fVar225 * fVar198 + fStack_3a8 * fVar158;
          auVar273._28_4_ = fVar173 + fStack_7c4;
          local_780._0_4_ =
               (float)local_3a0._0_4_ * fVar291 +
               fVar226 * fVar130 + (float)local_600._0_4_ * fVar305 + fVar282 * fVar231;
          local_780._4_4_ =
               (float)local_3a0._4_4_ * fVar188 +
               fVar288 * fVar143 + (float)local_600._4_4_ * fVar159 + fVar160 * fVar265;
          local_780._8_4_ =
               fStack_398 * fVar295 + fVar297 * fVar228 + fStack_5f8 * fVar190 + fVar171 * fVar267;
          local_780._12_4_ =
               fStack_394 * fVar193 + fVar300 * fVar302 + fStack_5f4 * fVar192 + fVar227 * fVar268;
          local_780._16_4_ =
               fStack_390 * fVar298 + fVar195 * fVar230 + fStack_5f0 * fVar194 + fVar174 * fVar145;
          local_780._20_4_ =
               fStack_38c * fVar197 + fVar289 * fVar303 + fStack_5ec * fVar196 + fVar187 * fVar157;
          local_780._24_4_ =
               fStack_388 * fVar301 + fVar304 * fVar229 + fStack_5e8 * fVar198 + fVar189 * fVar158;
          local_780._28_4_ = fStack_7c4 + fVar191 + fVar191 + auVar156._28_4_;
          fVar130 = (float)local_c0._0_4_ * fVar291 +
                    fVar130 * (float)local_140._0_4_ +
                    (float)local_80._0_4_ * fVar305 + (float)local_a0._0_4_ * fVar231;
          fVar143 = (float)local_c0._4_4_ * fVar188 +
                    fVar143 * (float)local_140._4_4_ +
                    (float)local_80._4_4_ * fVar159 + (float)local_a0._4_4_ * fVar265;
          fStack_7d8 = fStack_b8 * fVar295 +
                       fVar228 * fStack_138 + fStack_78 * fVar190 + fStack_98 * fVar267;
          fStack_7d4 = fStack_b4 * fVar193 +
                       fVar302 * fStack_134 + fStack_74 * fVar192 + fStack_94 * fVar268;
          fStack_7d0 = fStack_b0 * fVar298 +
                       fVar230 * fStack_130 + fStack_70 * fVar194 + fStack_90 * fVar145;
          fStack_7cc = fStack_ac * fVar197 +
                       fVar303 * fStack_12c + fStack_6c * fVar196 + fStack_8c * fVar157;
          fStack_7c8 = fStack_a8 * fVar301 +
                       fVar229 * fStack_128 + fStack_68 * fVar198 + fStack_88 * fVar158;
          fStack_7c4 = fStack_7c4 + fVar215;
          auVar150 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar128 * 4 + lVar18);
          auVar155 = *(undefined1 (*) [32])(lVar18 + 0x2232c10 + lVar128 * 4);
          auVar142 = ZEXT3264(auVar155);
          auVar29 = *(undefined1 (*) [32])(lVar18 + 0x2233094 + lVar128 * 4);
          auVar156 = ZEXT3264(auVar29);
          pauVar10 = (undefined1 (*) [28])(lVar18 + 0x2233518 + lVar128 * 4);
          fVar199 = *(float *)*pauVar10;
          fVar209 = *(float *)(*pauVar10 + 4);
          fVar211 = *(float *)(*pauVar10 + 8);
          fVar213 = *(float *)(*pauVar10 + 0xc);
          fVar216 = *(float *)(*pauVar10 + 0x10);
          fVar224 = *(float *)(*pauVar10 + 0x14);
          fVar225 = *(float *)(*pauVar10 + 0x18);
          auVar121 = *pauVar10;
          fVar228 = auVar29._0_4_;
          fVar302 = auVar29._4_4_;
          fVar230 = auVar29._8_4_;
          fVar303 = auVar29._12_4_;
          fVar229 = auVar29._16_4_;
          fVar305 = auVar29._20_4_;
          fVar159 = auVar29._24_4_;
          local_800 = auVar150._0_4_;
          auStack_7fc._0_4_ = auVar150._4_4_;
          auStack_7fc._4_4_ = auVar150._8_4_;
          fStack_7f4 = auVar150._12_4_;
          fStack_7f0 = auVar150._16_4_;
          fStack_7ec = auVar150._20_4_;
          fStack_7e8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(catmullrom_basis1 + lVar128 * 4 + lVar18))[1];
          fVar291 = auVar155._0_4_;
          fVar188 = auVar155._4_4_;
          fVar295 = auVar155._8_4_;
          fVar193 = auVar155._12_4_;
          fVar298 = auVar155._16_4_;
          fVar197 = auVar155._20_4_;
          fVar301 = auVar155._24_4_;
          fVar226 = fVar191 + fVar191 + fVar215;
          auVar238._0_4_ =
               (float)local_160._0_4_ * (float)local_800 +
               fVar169 * fVar291 +
               fVar228 * (float)local_5a0._0_4_ + (float)local_3c0._0_4_ * fVar199;
          auVar238._4_4_ =
               (float)local_160._4_4_ * (float)auStack_7fc._0_4_ +
               fVar170 * fVar188 +
               fVar302 * (float)local_5a0._4_4_ + (float)local_3c0._4_4_ * fVar209;
          auVar238._8_4_ =
               fStack_158 * (float)auStack_7fc._4_4_ +
               fVar172 * fVar295 + fVar230 * fStack_598 + fStack_3b8 * fVar211;
          auVar238._12_4_ =
               fStack_154 * fStack_7f4 +
               fVar200 * fVar193 + fVar303 * fStack_594 + fStack_3b4 * fVar213;
          auVar238._16_4_ =
               fStack_150 * fStack_7f0 +
               fVar210 * fVar298 + fVar229 * fStack_590 + fStack_3b0 * fVar216;
          auVar238._20_4_ =
               fStack_14c * fStack_7ec +
               fVar212 * fVar197 + fVar305 * fStack_58c + fStack_3ac * fVar224;
          auVar238._24_4_ =
               fStack_148 * fStack_7e8 +
               fVar241 * fVar301 + fVar159 * fStack_588 + fStack_3a8 * fVar225;
          auVar238._28_4_ = fVar191 + fStack_84 + fVar226;
          auVar222._0_4_ =
               (float)local_3a0._0_4_ * (float)local_800 +
               (float)local_4e0._0_4_ * fVar291 +
               (float)local_600._0_4_ * fVar228 + fVar199 * fVar282;
          auVar222._4_4_ =
               (float)local_3a0._4_4_ * (float)auStack_7fc._0_4_ +
               (float)local_4e0._4_4_ * fVar188 +
               (float)local_600._4_4_ * fVar302 + fVar209 * fVar160;
          auVar222._8_4_ =
               fStack_398 * (float)auStack_7fc._4_4_ +
               fStack_4d8 * fVar295 + fStack_5f8 * fVar230 + fVar211 * fVar171;
          auVar222._12_4_ =
               fStack_394 * fStack_7f4 +
               fStack_4d4 * fVar193 + fStack_5f4 * fVar303 + fVar213 * fVar227;
          auVar222._16_4_ =
               fStack_390 * fStack_7f0 +
               fStack_4d0 * fVar298 + fStack_5f0 * fVar229 + fVar216 * fVar174;
          auVar222._20_4_ =
               fStack_38c * fStack_7ec +
               fStack_4cc * fVar197 + fStack_5ec * fVar305 + fVar224 * fVar187;
          auVar222._24_4_ =
               fStack_388 * fStack_7e8 +
               fStack_4c8 * fVar301 + fStack_5e8 * fVar159 + fVar225 * fVar189;
          auVar222._28_4_ = fVar226 + fVar191 + fVar191 + *(float *)pauVar9[1];
          auVar314._0_4_ =
               fVar291 * (float)local_140._0_4_ +
               (float)local_80._0_4_ * fVar228 + fVar199 * (float)local_a0._0_4_ +
               (float)local_800 * (float)local_c0._0_4_;
          auVar314._4_4_ =
               fVar188 * (float)local_140._4_4_ +
               (float)local_80._4_4_ * fVar302 + fVar209 * (float)local_a0._4_4_ +
               (float)auStack_7fc._0_4_ * (float)local_c0._4_4_;
          auVar314._8_4_ =
               fVar295 * fStack_138 + fStack_78 * fVar230 + fVar211 * fStack_98 +
               (float)auStack_7fc._4_4_ * fStack_b8;
          auVar314._12_4_ =
               fVar193 * fStack_134 + fStack_74 * fVar303 + fVar213 * fStack_94 +
               fStack_7f4 * fStack_b4;
          auVar314._16_4_ =
               fVar298 * fStack_130 + fStack_70 * fVar229 + fVar216 * fStack_90 +
               fStack_7f0 * fStack_b0;
          auVar314._20_4_ =
               fVar197 * fStack_12c + fStack_6c * fVar305 + fVar224 * fStack_8c +
               fStack_7ec * fStack_ac;
          auVar314._24_4_ =
               fVar301 * fStack_128 + fStack_68 * fVar159 + fVar225 * fStack_88 +
               fStack_7e8 * fStack_a8;
          auVar314._28_4_ = fVar191 + fVar191 + fStack_84 + fVar226;
          auVar28 = vsubps_avx(auVar238,auVar273);
          auVar36 = vsubps_avx(auVar222,local_780._0_32_);
          fVar191 = auVar28._0_4_;
          fVar199 = auVar28._4_4_;
          auVar67._4_4_ = fVar199 * local_780._4_4_;
          auVar67._0_4_ = fVar191 * local_780._0_4_;
          fVar209 = auVar28._8_4_;
          auVar67._8_4_ = fVar209 * local_780._8_4_;
          fVar211 = auVar28._12_4_;
          auVar67._12_4_ = fVar211 * local_780._12_4_;
          fVar213 = auVar28._16_4_;
          auVar67._16_4_ = fVar213 * local_780._16_4_;
          fVar216 = auVar28._20_4_;
          auVar67._20_4_ = fVar216 * local_780._20_4_;
          fVar224 = auVar28._24_4_;
          auVar67._24_4_ = fVar224 * local_780._24_4_;
          auVar67._28_4_ = fVar226;
          fVar282 = auVar36._0_4_;
          fVar160 = auVar36._4_4_;
          auVar68._4_4_ = auVar273._4_4_ * fVar160;
          auVar68._0_4_ = auVar273._0_4_ * fVar282;
          fVar171 = auVar36._8_4_;
          auVar68._8_4_ = auVar273._8_4_ * fVar171;
          fVar227 = auVar36._12_4_;
          auVar68._12_4_ = auVar273._12_4_ * fVar227;
          fVar174 = auVar36._16_4_;
          auVar68._16_4_ = auVar273._16_4_ * fVar174;
          fVar187 = auVar36._20_4_;
          auVar68._20_4_ = auVar273._20_4_ * fVar187;
          fVar189 = auVar36._24_4_;
          auVar68._24_4_ = auVar273._24_4_ * fVar189;
          auVar68._28_4_ = auVar222._28_4_;
          auVar30 = vsubps_avx(auVar67,auVar68);
          auVar113._4_4_ = fVar143;
          auVar113._0_4_ = fVar130;
          auVar113._8_4_ = fStack_7d8;
          auVar113._12_4_ = fStack_7d4;
          auVar113._16_4_ = fStack_7d0;
          auVar113._20_4_ = fStack_7cc;
          auVar113._24_4_ = fStack_7c8;
          auVar113._28_4_ = fStack_7c4;
          auVar27 = vmaxps_avx(auVar113,auVar314);
          auVar69._4_4_ = auVar27._4_4_ * auVar27._4_4_ * (fVar199 * fVar199 + fVar160 * fVar160);
          auVar69._0_4_ = auVar27._0_4_ * auVar27._0_4_ * (fVar191 * fVar191 + fVar282 * fVar282);
          auVar69._8_4_ = auVar27._8_4_ * auVar27._8_4_ * (fVar209 * fVar209 + fVar171 * fVar171);
          auVar69._12_4_ = auVar27._12_4_ * auVar27._12_4_ * (fVar211 * fVar211 + fVar227 * fVar227)
          ;
          auVar69._16_4_ = auVar27._16_4_ * auVar27._16_4_ * (fVar213 * fVar213 + fVar174 * fVar174)
          ;
          auVar69._20_4_ = auVar27._20_4_ * auVar27._20_4_ * (fVar216 * fVar216 + fVar187 * fVar187)
          ;
          auVar69._24_4_ = auVar27._24_4_ * auVar27._24_4_ * (fVar224 * fVar224 + fVar189 * fVar189)
          ;
          auVar69._28_4_ = auVar238._28_4_ + auVar222._28_4_;
          auVar70._4_4_ = auVar30._4_4_ * auVar30._4_4_;
          auVar70._0_4_ = auVar30._0_4_ * auVar30._0_4_;
          auVar70._8_4_ = auVar30._8_4_ * auVar30._8_4_;
          auVar70._12_4_ = auVar30._12_4_ * auVar30._12_4_;
          auVar70._16_4_ = auVar30._16_4_ * auVar30._16_4_;
          auVar70._20_4_ = auVar30._20_4_ * auVar30._20_4_;
          auVar70._24_4_ = auVar30._24_4_ * auVar30._24_4_;
          auVar70._28_4_ = auVar30._28_4_;
          auVar27 = vcmpps_avx(auVar70,auVar69,2);
          local_280 = (uint)lVar128;
          auVar179 = vpshufd_avx(ZEXT416(local_280),0);
          auVar325 = vpor_avx(auVar179,_DAT_01ff0cf0);
          auVar179 = vpor_avx(auVar179,_DAT_02020ea0);
          auVar325 = vpcmpgtd_avx(_local_440,auVar325);
          auVar179 = vpcmpgtd_avx(_local_440,auVar179);
          register0x000012d0 = auVar179;
          _local_460 = auVar325;
          auVar30 = _local_460 & auVar27;
          fVar282 = (float)local_620._0_4_;
          fVar160 = (float)local_620._4_4_;
          fVar171 = fStack_618;
          fVar227 = fStack_614;
          fVar174 = fStack_610;
          fVar187 = fStack_60c;
          fVar189 = fStack_608;
          fVar191 = fStack_604;
          fVar199 = (float)local_5a0._0_4_;
          fVar209 = (float)local_5a0._4_4_;
          fVar211 = fStack_598;
          fVar213 = fStack_594;
          fVar216 = fStack_590;
          fVar224 = fStack_58c;
          fVar225 = fStack_588;
          fVar226 = (float)local_4e0._0_4_;
          fVar288 = (float)local_4e0._4_4_;
          fVar297 = fStack_4d8;
          fVar300 = fStack_4d4;
          fVar195 = fStack_4d0;
          fVar289 = fStack_4cc;
          fVar304 = fStack_4c8;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            local_5e0._0_4_ = auVar121._0_4_;
            local_5e0._4_4_ = auVar121._4_4_;
            fStack_5d8 = auVar121._8_4_;
            fStack_5d4 = auVar121._12_4_;
            fStack_5d0 = auVar121._16_4_;
            fStack_5cc = auVar121._20_4_;
            fStack_5c8 = auVar121._24_4_;
            local_5e0._0_4_ =
                 (float)local_800 * (float)local_580._0_4_ +
                 (float)local_320._0_4_ * fVar291 +
                 (float)local_e0._0_4_ * fVar228 + (float)local_560._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 (float)auStack_7fc._0_4_ * (float)local_580._4_4_ +
                 (float)local_320._4_4_ * fVar188 +
                 (float)local_e0._4_4_ * fVar302 + (float)local_560._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = (float)auStack_7fc._4_4_ * fStack_578 +
                         fStack_318 * fVar295 + fStack_d8 * fVar230 + fStack_558 * fStack_5d8;
            fStack_5d4 = fStack_7f4 * fStack_574 +
                         fStack_314 * fVar193 + fStack_d4 * fVar303 + fStack_554 * fStack_5d4;
            fStack_5d0 = fStack_7f0 * fStack_570 +
                         fStack_310 * fVar298 + fStack_d0 * fVar229 + fStack_550 * fStack_5d0;
            fStack_5cc = fStack_7ec * fStack_56c +
                         fStack_30c * fVar197 + fStack_cc * fVar305 + fStack_54c * fStack_5cc;
            fStack_5c8 = fStack_7e8 * fStack_568 +
                         fStack_308 * fVar301 + fStack_c8 * fVar159 + fStack_548 * fStack_5c8;
            fStack_5c4 = auVar273._28_4_ + auVar155._28_4_ + auVar29._28_4_ + 0.0;
            local_5c0._0_4_ = auVar119._0_4_;
            local_5c0._4_4_ = auVar119._4_4_;
            uStack_5b8._0_4_ = auVar119._8_4_;
            uStack_5b8._4_4_ = auVar119._12_4_;
            auStack_5b0._0_4_ = auVar119._16_4_;
            auStack_5b0._4_4_ = auVar119._20_4_;
            fStack_5a8 = auVar119._24_4_;
            local_720._0_4_ = auVar118._0_4_;
            local_720._4_4_ = auVar118._4_4_;
            uStack_718._0_4_ = auVar118._8_4_;
            uStack_718._4_4_ = auVar118._12_4_;
            auStack_710._0_4_ = auVar118._16_4_;
            auStack_710._4_4_ = auVar118._20_4_;
            fStack_708 = auVar118._24_4_;
            local_540._0_4_ = auVar117._0_4_;
            local_540._4_4_ = auVar117._4_4_;
            fStack_538 = auVar117._8_4_;
            fStack_534 = auVar117._12_4_;
            fStack_530 = auVar117._16_4_;
            fStack_52c = auVar117._20_4_;
            fStack_528 = auVar117._24_4_;
            pfVar1 = (float *)(lVar18 + 0x2231e84 + lVar128 * 4);
            fVar291 = *pfVar1;
            fVar188 = pfVar1[1];
            fVar295 = pfVar1[2];
            fVar193 = pfVar1[3];
            fVar298 = pfVar1[4];
            fVar197 = pfVar1[5];
            fVar301 = pfVar1[6];
            pfVar2 = (float *)(lVar18 + 0x2232308 + lVar128 * 4);
            fVar228 = *pfVar2;
            fVar302 = pfVar2[1];
            fVar230 = pfVar2[2];
            fVar303 = pfVar2[3];
            fVar229 = pfVar2[4];
            fVar305 = pfVar2[5];
            fVar159 = pfVar2[6];
            fVar240 = auVar319._28_4_ + 0.0;
            pfVar3 = (float *)(lVar18 + 0x2231a00 + lVar128 * 4);
            fVar190 = *pfVar3;
            fVar192 = pfVar3[1];
            fVar194 = pfVar3[2];
            fVar196 = pfVar3[3];
            fVar198 = pfVar3[4];
            fVar231 = pfVar3[5];
            fVar265 = pfVar3[6];
            fVar144 = pfVar1[7] + pfVar2[7];
            fStack_464 = pfVar2[7] + fVar240;
            fVar240 = auVar319._28_4_ + fStack_144 + fVar240;
            pfVar1 = (float *)(lVar18 + 0x223157c + lVar128 * 4);
            fVar267 = *pfVar1;
            fVar268 = pfVar1[1];
            fVar145 = pfVar1[2];
            fVar157 = pfVar1[3];
            fVar158 = pfVar1[4];
            fVar173 = pfVar1[5];
            fVar215 = pfVar1[6];
            local_340 = (float)local_160._0_4_ * fVar267 +
                        fVar190 * fVar169 +
                        (float)local_5a0._0_4_ * fVar291 + (float)local_3c0._0_4_ * fVar228;
            fStack_33c = (float)local_160._4_4_ * fVar268 +
                         fVar192 * fVar170 +
                         (float)local_5a0._4_4_ * fVar188 + (float)local_3c0._4_4_ * fVar302;
            fStack_338 = fStack_158 * fVar145 +
                         fVar194 * fVar172 + fStack_598 * fVar295 + fStack_3b8 * fVar230;
            fStack_334 = fStack_154 * fVar157 +
                         fVar196 * fVar200 + fStack_594 * fVar193 + fStack_3b4 * fVar303;
            fStack_330 = fStack_150 * fVar158 +
                         fVar198 * fVar210 + fStack_590 * fVar298 + fStack_3b0 * fVar229;
            fStack_32c = fStack_14c * fVar173 +
                         fVar231 * fVar212 + fStack_58c * fVar197 + fStack_3ac * fVar305;
            fStack_328 = fStack_148 * fVar215 +
                         fVar265 * fVar241 + fStack_588 * fVar301 + fStack_3a8 * fVar159;
            fStack_324 = fVar144 + fStack_464;
            local_480 = fVar267 * (float)local_3a0._0_4_ +
                        fVar291 * (float)local_600._0_4_ + (float)local_620._0_4_ * fVar228 +
                        (float)local_4e0._0_4_ * fVar190;
            fStack_47c = fVar268 * (float)local_3a0._4_4_ +
                         fVar188 * (float)local_600._4_4_ + (float)local_620._4_4_ * fVar302 +
                         (float)local_4e0._4_4_ * fVar192;
            fStack_478 = fVar145 * fStack_398 +
                         fVar295 * fStack_5f8 + fStack_618 * fVar230 + fStack_4d8 * fVar194;
            fStack_474 = fVar157 * fStack_394 +
                         fVar193 * fStack_5f4 + fStack_614 * fVar303 + fStack_4d4 * fVar196;
            fStack_470 = fVar158 * fStack_390 +
                         fVar298 * fStack_5f0 + fStack_610 * fVar229 + fStack_4d0 * fVar198;
            fStack_46c = fVar173 * fStack_38c +
                         fVar197 * fStack_5ec + fStack_60c * fVar305 + fStack_4cc * fVar231;
            fStack_468 = fVar215 * fStack_388 +
                         fVar301 * fStack_5e8 + fStack_608 * fVar159 + fStack_4c8 * fVar265;
            fStack_464 = fStack_464 + fVar240;
            auVar315._0_4_ =
                 fVar190 * (float)local_320._0_4_ +
                 (float)local_e0._0_4_ * fVar291 + (float)local_560._0_4_ * fVar228 +
                 fVar267 * (float)local_580._0_4_;
            auVar315._4_4_ =
                 fVar192 * (float)local_320._4_4_ +
                 (float)local_e0._4_4_ * fVar188 + (float)local_560._4_4_ * fVar302 +
                 fVar268 * (float)local_580._4_4_;
            auVar315._8_4_ =
                 fVar194 * fStack_318 + fStack_d8 * fVar295 + fStack_558 * fVar230 +
                 fVar145 * fStack_578;
            auVar315._12_4_ =
                 fVar196 * fStack_314 + fStack_d4 * fVar193 + fStack_554 * fVar303 +
                 fVar157 * fStack_574;
            auVar315._16_4_ =
                 fVar198 * fStack_310 + fStack_d0 * fVar298 + fStack_550 * fVar229 +
                 fVar158 * fStack_570;
            auVar315._20_4_ =
                 fVar231 * fStack_30c + fStack_cc * fVar197 + fStack_54c * fVar305 +
                 fVar173 * fStack_56c;
            auVar315._24_4_ =
                 fVar265 * fStack_308 + fStack_c8 * fVar301 + fStack_548 * fVar159 +
                 fVar215 * fStack_568;
            auVar315._28_4_ = pfVar3[7] + fVar144 + fVar240;
            pfVar1 = (float *)(lVar18 + 0x22342a4 + lVar128 * 4);
            fVar291 = *pfVar1;
            fVar188 = pfVar1[1];
            fVar295 = pfVar1[2];
            fVar193 = pfVar1[3];
            fVar298 = pfVar1[4];
            fVar197 = pfVar1[5];
            fVar301 = pfVar1[6];
            pfVar2 = (float *)(lVar18 + 0x2234728 + lVar128 * 4);
            fVar228 = *pfVar2;
            fVar302 = pfVar2[1];
            fVar230 = pfVar2[2];
            fVar303 = pfVar2[3];
            fVar229 = pfVar2[4];
            fVar305 = pfVar2[5];
            fVar159 = pfVar2[6];
            pfVar3 = (float *)(lVar18 + 0x2233e20 + lVar128 * 4);
            fVar190 = *pfVar3;
            fVar192 = pfVar3[1];
            fVar194 = pfVar3[2];
            fVar196 = pfVar3[3];
            fVar198 = pfVar3[4];
            fVar231 = pfVar3[5];
            fVar265 = pfVar3[6];
            pfVar4 = (float *)(lVar18 + 0x223399c + lVar128 * 4);
            fVar267 = *pfVar4;
            fVar268 = pfVar4[1];
            fVar145 = pfVar4[2];
            fVar157 = pfVar4[3];
            fVar158 = pfVar4[4];
            fVar173 = pfVar4[5];
            fVar215 = pfVar4[6];
            auVar274._0_4_ =
                 fVar267 * (float)local_160._0_4_ +
                 fVar190 * fVar169 +
                 (float)local_5a0._0_4_ * fVar291 + (float)local_3c0._0_4_ * fVar228;
            auVar274._4_4_ =
                 fVar268 * (float)local_160._4_4_ +
                 fVar192 * fVar170 +
                 (float)local_5a0._4_4_ * fVar188 + (float)local_3c0._4_4_ * fVar302;
            auVar274._8_4_ =
                 fVar145 * fStack_158 +
                 fVar194 * fVar172 + fStack_598 * fVar295 + fStack_3b8 * fVar230;
            auVar274._12_4_ =
                 fVar157 * fStack_154 +
                 fVar196 * fVar200 + fStack_594 * fVar193 + fStack_3b4 * fVar303;
            auVar274._16_4_ =
                 fVar158 * fStack_150 +
                 fVar198 * fVar210 + fStack_590 * fVar298 + fStack_3b0 * fVar229;
            auVar274._20_4_ =
                 fVar173 * fStack_14c +
                 fVar231 * fVar212 + fStack_58c * fVar197 + fStack_3ac * fVar305;
            auVar274._24_4_ =
                 fVar215 * fStack_148 +
                 fVar265 * fVar241 + fStack_588 * fVar301 + fStack_3a8 * fVar159;
            auVar274._28_4_ = fStack_4c4 + fStack_4c4 + fStack_3a4 + fStack_4c4;
            auVar311._0_4_ =
                 fVar267 * (float)local_3a0._0_4_ +
                 fVar190 * (float)local_4e0._0_4_ +
                 fVar291 * (float)local_600._0_4_ + (float)local_620._0_4_ * fVar228;
            auVar311._4_4_ =
                 fVar268 * (float)local_3a0._4_4_ +
                 fVar192 * (float)local_4e0._4_4_ +
                 fVar188 * (float)local_600._4_4_ + (float)local_620._4_4_ * fVar302;
            auVar311._8_4_ =
                 fVar145 * fStack_398 +
                 fVar194 * fStack_4d8 + fVar295 * fStack_5f8 + fStack_618 * fVar230;
            auVar311._12_4_ =
                 fVar157 * fStack_394 +
                 fVar196 * fStack_4d4 + fVar193 * fStack_5f4 + fStack_614 * fVar303;
            auVar311._16_4_ =
                 fVar158 * fStack_390 +
                 fVar198 * fStack_4d0 + fVar298 * fStack_5f0 + fStack_610 * fVar229;
            auVar311._20_4_ =
                 fVar173 * fStack_38c +
                 fVar231 * fStack_4cc + fVar197 * fStack_5ec + fStack_60c * fVar305;
            auVar311._24_4_ =
                 fVar215 * fStack_388 +
                 fVar265 * fStack_4c8 + fVar301 * fStack_5e8 + fStack_608 * fVar159;
            auVar311._28_4_ = fStack_4c4 + fStack_4c4 + fStack_144 + fStack_4c4;
            auVar223._8_4_ = 0x7fffffff;
            auVar223._0_8_ = 0x7fffffff7fffffff;
            auVar223._12_4_ = 0x7fffffff;
            auVar223._16_4_ = 0x7fffffff;
            auVar223._20_4_ = 0x7fffffff;
            auVar223._24_4_ = 0x7fffffff;
            auVar223._28_4_ = 0x7fffffff;
            auVar116._4_4_ = fStack_33c;
            auVar116._0_4_ = local_340;
            auVar116._8_4_ = fStack_338;
            auVar116._12_4_ = fStack_334;
            auVar116._16_4_ = fStack_330;
            auVar116._20_4_ = fStack_32c;
            auVar116._24_4_ = fStack_328;
            auVar116._28_4_ = fStack_324;
            auVar155 = vandps_avx(auVar116,auVar223);
            auVar115._4_4_ = fStack_47c;
            auVar115._0_4_ = local_480;
            auVar115._8_4_ = fStack_478;
            auVar115._12_4_ = fStack_474;
            auVar115._16_4_ = fStack_470;
            auVar115._20_4_ = fStack_46c;
            auVar115._24_4_ = fStack_468;
            auVar115._28_4_ = fStack_464;
            auVar30 = vandps_avx(auVar115,auVar223);
            auVar30 = vmaxps_avx(auVar155,auVar30);
            auVar155 = vandps_avx(auVar315,auVar223);
            auVar30 = vmaxps_avx(auVar30,auVar155);
            auVar30 = vcmpps_avx(auVar30,local_100,1);
            auVar182 = vblendvps_avx(auVar116,auVar28,auVar30);
            auVar139._0_4_ =
                 fVar267 * (float)local_580._0_4_ +
                 fVar190 * (float)local_320._0_4_ +
                 fVar228 * (float)local_560._0_4_ + (float)local_e0._0_4_ * fVar291;
            auVar139._4_4_ =
                 fVar268 * (float)local_580._4_4_ +
                 fVar192 * (float)local_320._4_4_ +
                 fVar302 * (float)local_560._4_4_ + (float)local_e0._4_4_ * fVar188;
            auVar139._8_4_ =
                 fVar145 * fStack_578 +
                 fVar194 * fStack_318 + fVar230 * fStack_558 + fStack_d8 * fVar295;
            auVar139._12_4_ =
                 fVar157 * fStack_574 +
                 fVar196 * fStack_314 + fVar303 * fStack_554 + fStack_d4 * fVar193;
            auVar139._16_4_ =
                 fVar158 * fStack_570 +
                 fVar198 * fStack_310 + fVar229 * fStack_550 + fStack_d0 * fVar298;
            auVar139._20_4_ =
                 fVar173 * fStack_56c +
                 fVar231 * fStack_30c + fVar305 * fStack_54c + fStack_cc * fVar197;
            auVar139._24_4_ =
                 fVar215 * fStack_568 +
                 fVar265 * fStack_308 + fVar159 * fStack_548 + fStack_c8 * fVar301;
            auVar139._28_4_ = auVar155._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar183 = vblendvps_avx(auVar115,auVar36,auVar30);
            auVar155 = vandps_avx(auVar274,auVar223);
            auVar30 = vandps_avx(auVar311,auVar223);
            auVar204 = vmaxps_avx(auVar155,auVar30);
            auVar155 = vandps_avx(auVar139,auVar223);
            auVar155 = vmaxps_avx(auVar204,auVar155);
            local_700._0_4_ = auVar120._0_4_;
            local_700._4_4_ = auVar120._4_4_;
            uStack_6f8._0_4_ = auVar120._8_4_;
            uStack_6f8._4_4_ = auVar120._12_4_;
            auStack_6f0._0_4_ = auVar120._16_4_;
            auStack_6f0._4_4_ = auVar120._20_4_;
            fStack_6e8 = auVar120._24_4_;
            auVar30 = vcmpps_avx(auVar155,local_100,1);
            auVar155 = vblendvps_avx(auVar274,auVar28,auVar30);
            auVar140._0_4_ =
                 (float)local_580._0_4_ * (float)local_700._0_4_ +
                 (float)local_320._0_4_ * (float)local_5c0._0_4_ +
                 (float)local_e0._0_4_ * (float)local_720._0_4_ +
                 (float)local_560._0_4_ * (float)local_540._0_4_;
            auVar140._4_4_ =
                 (float)local_580._4_4_ * (float)local_700._4_4_ +
                 (float)local_320._4_4_ * (float)local_5c0._4_4_ +
                 (float)local_e0._4_4_ * (float)local_720._4_4_ +
                 (float)local_560._4_4_ * (float)local_540._4_4_;
            auVar140._8_4_ =
                 fStack_578 * (float)uStack_6f8 +
                 fStack_318 * (float)uStack_5b8 +
                 fStack_d8 * (float)uStack_718 + fStack_558 * fStack_538;
            auVar140._12_4_ =
                 fStack_574 * uStack_6f8._4_4_ +
                 fStack_314 * uStack_5b8._4_4_ +
                 fStack_d4 * uStack_718._4_4_ + fStack_554 * fStack_534;
            auVar140._16_4_ =
                 fStack_570 * (float)auStack_6f0._0_4_ +
                 fStack_310 * (float)auStack_5b0._0_4_ +
                 fStack_d0 * (float)auStack_710._0_4_ + fStack_550 * fStack_530;
            auVar140._20_4_ =
                 fStack_56c * (float)auStack_6f0._4_4_ +
                 fStack_30c * (float)auStack_5b0._4_4_ +
                 fStack_cc * (float)auStack_710._4_4_ + fStack_54c * fStack_52c;
            auVar140._24_4_ =
                 fStack_568 * fStack_6e8 +
                 fStack_308 * fStack_5a8 + fStack_c8 * fStack_708 + fStack_548 * fStack_528;
            auVar140._28_4_ = auVar204._28_4_ + fStack_5c4 + auVar29._28_4_ + 0.0;
            auVar29 = vblendvps_avx(auVar311,auVar36,auVar30);
            fVar144 = auVar182._0_4_;
            fVar240 = auVar182._4_4_;
            fVar252 = auVar182._8_4_;
            fVar257 = auVar182._12_4_;
            fVar263 = auVar182._16_4_;
            fVar264 = auVar182._20_4_;
            fVar266 = auVar182._24_4_;
            fVar214 = auVar182._28_4_;
            fVar190 = auVar155._0_4_;
            fVar194 = auVar155._4_4_;
            fVar198 = auVar155._8_4_;
            fVar265 = auVar155._12_4_;
            fVar268 = auVar155._16_4_;
            fVar157 = auVar155._20_4_;
            fVar173 = auVar155._24_4_;
            fVar291 = auVar183._0_4_;
            fVar295 = auVar183._4_4_;
            fVar298 = auVar183._8_4_;
            fVar301 = auVar183._12_4_;
            fVar302 = auVar183._16_4_;
            fVar303 = auVar183._20_4_;
            fVar305 = auVar183._24_4_;
            auVar285._0_4_ = fVar291 * fVar291 + fVar144 * fVar144;
            auVar285._4_4_ = fVar295 * fVar295 + fVar240 * fVar240;
            auVar285._8_4_ = fVar298 * fVar298 + fVar252 * fVar252;
            auVar285._12_4_ = fVar301 * fVar301 + fVar257 * fVar257;
            auVar285._16_4_ = fVar302 * fVar302 + fVar263 * fVar263;
            auVar285._20_4_ = fVar303 * fVar303 + fVar264 * fVar264;
            auVar285._24_4_ = fVar305 * fVar305 + fVar266 * fVar266;
            auVar285._28_4_ = auVar28._28_4_ + auVar36._28_4_;
            auVar28 = vrsqrtps_avx(auVar285);
            fVar188 = auVar28._0_4_;
            fVar193 = auVar28._4_4_;
            auVar71._4_4_ = fVar193 * 1.5;
            auVar71._0_4_ = fVar188 * 1.5;
            fVar197 = auVar28._8_4_;
            auVar71._8_4_ = fVar197 * 1.5;
            fVar228 = auVar28._12_4_;
            auVar71._12_4_ = fVar228 * 1.5;
            fVar230 = auVar28._16_4_;
            auVar71._16_4_ = fVar230 * 1.5;
            fVar229 = auVar28._20_4_;
            auVar71._20_4_ = fVar229 * 1.5;
            fVar159 = auVar28._24_4_;
            auVar71._24_4_ = fVar159 * 1.5;
            auVar71._28_4_ = auVar311._28_4_;
            auVar72._4_4_ = fVar193 * fVar193 * fVar193 * auVar285._4_4_ * 0.5;
            auVar72._0_4_ = fVar188 * fVar188 * fVar188 * auVar285._0_4_ * 0.5;
            auVar72._8_4_ = fVar197 * fVar197 * fVar197 * auVar285._8_4_ * 0.5;
            auVar72._12_4_ = fVar228 * fVar228 * fVar228 * auVar285._12_4_ * 0.5;
            auVar72._16_4_ = fVar230 * fVar230 * fVar230 * auVar285._16_4_ * 0.5;
            auVar72._20_4_ = fVar229 * fVar229 * fVar229 * auVar285._20_4_ * 0.5;
            auVar72._24_4_ = fVar159 * fVar159 * fVar159 * auVar285._24_4_ * 0.5;
            auVar72._28_4_ = auVar285._28_4_;
            auVar30 = vsubps_avx(auVar71,auVar72);
            fVar169 = auVar30._0_4_;
            fVar170 = auVar30._4_4_;
            fVar172 = auVar30._8_4_;
            fVar200 = auVar30._12_4_;
            fVar210 = auVar30._16_4_;
            fVar212 = auVar30._20_4_;
            fVar241 = auVar30._24_4_;
            fVar188 = auVar29._0_4_;
            fVar193 = auVar29._4_4_;
            fVar197 = auVar29._8_4_;
            fVar228 = auVar29._12_4_;
            fVar230 = auVar29._16_4_;
            fVar229 = auVar29._20_4_;
            fVar159 = auVar29._24_4_;
            auVar261._0_4_ = fVar188 * fVar188 + fVar190 * fVar190;
            auVar261._4_4_ = fVar193 * fVar193 + fVar194 * fVar194;
            auVar261._8_4_ = fVar197 * fVar197 + fVar198 * fVar198;
            auVar261._12_4_ = fVar228 * fVar228 + fVar265 * fVar265;
            auVar261._16_4_ = fVar230 * fVar230 + fVar268 * fVar268;
            auVar261._20_4_ = fVar229 * fVar229 + fVar157 * fVar157;
            auVar261._24_4_ = fVar159 * fVar159 + fVar173 * fVar173;
            auVar261._28_4_ = auVar28._28_4_ + auVar155._28_4_;
            auVar155 = vrsqrtps_avx(auVar261);
            fVar192 = auVar155._0_4_;
            fVar196 = auVar155._4_4_;
            auVar73._4_4_ = fVar196 * 1.5;
            auVar73._0_4_ = fVar192 * 1.5;
            fVar231 = auVar155._8_4_;
            auVar73._8_4_ = fVar231 * 1.5;
            fVar267 = auVar155._12_4_;
            auVar73._12_4_ = fVar267 * 1.5;
            fVar145 = auVar155._16_4_;
            auVar73._16_4_ = fVar145 * 1.5;
            fVar158 = auVar155._20_4_;
            auVar73._20_4_ = fVar158 * 1.5;
            fVar215 = auVar155._24_4_;
            auVar73._24_4_ = fVar215 * 1.5;
            auVar73._28_4_ = auVar311._28_4_;
            auVar74._4_4_ = fVar196 * fVar196 * fVar196 * auVar261._4_4_ * 0.5;
            auVar74._0_4_ = fVar192 * fVar192 * fVar192 * auVar261._0_4_ * 0.5;
            auVar74._8_4_ = fVar231 * fVar231 * fVar231 * auVar261._8_4_ * 0.5;
            auVar74._12_4_ = fVar267 * fVar267 * fVar267 * auVar261._12_4_ * 0.5;
            auVar74._16_4_ = fVar145 * fVar145 * fVar145 * auVar261._16_4_ * 0.5;
            auVar74._20_4_ = fVar158 * fVar158 * fVar158 * auVar261._20_4_ * 0.5;
            auVar74._24_4_ = fVar215 * fVar215 * fVar215 * auVar261._24_4_ * 0.5;
            auVar74._28_4_ = auVar261._28_4_;
            auVar29 = vsubps_avx(auVar73,auVar74);
            fVar192 = auVar29._0_4_;
            fVar196 = auVar29._4_4_;
            fVar231 = auVar29._8_4_;
            fVar267 = auVar29._12_4_;
            fVar145 = auVar29._16_4_;
            fVar158 = auVar29._20_4_;
            fVar215 = auVar29._24_4_;
            fVar291 = fVar130 * fVar169 * fVar291;
            fVar295 = fVar143 * fVar170 * fVar295;
            auVar75._4_4_ = fVar295;
            auVar75._0_4_ = fVar291;
            fVar298 = fStack_7d8 * fVar172 * fVar298;
            auVar75._8_4_ = fVar298;
            fVar301 = fStack_7d4 * fVar200 * fVar301;
            auVar75._12_4_ = fVar301;
            fVar302 = fStack_7d0 * fVar210 * fVar302;
            auVar75._16_4_ = fVar302;
            fVar303 = fStack_7cc * fVar212 * fVar303;
            auVar75._20_4_ = fVar303;
            fVar305 = fStack_7c8 * fVar241 * fVar305;
            auVar75._24_4_ = fVar305;
            auVar75._28_4_ = auVar155._28_4_;
            local_700._4_4_ = fVar295 + auVar273._4_4_;
            local_700._0_4_ = fVar291 + auVar273._0_4_;
            uStack_6f8._0_4_ = fVar298 + auVar273._8_4_;
            uStack_6f8._4_4_ = fVar301 + auVar273._12_4_;
            auStack_6f0._0_4_ = fVar302 + auVar273._16_4_;
            auStack_6f0._4_4_ = fVar303 + auVar273._20_4_;
            fStack_6e8 = fVar305 + auVar273._24_4_;
            fStack_6e4 = auVar155._28_4_ + auVar273._28_4_;
            fVar291 = fVar130 * fVar169 * -fVar144;
            fVar295 = fVar143 * fVar170 * -fVar240;
            auVar76._4_4_ = fVar295;
            auVar76._0_4_ = fVar291;
            fVar298 = fStack_7d8 * fVar172 * -fVar252;
            auVar76._8_4_ = fVar298;
            fVar301 = fStack_7d4 * fVar200 * -fVar257;
            auVar76._12_4_ = fVar301;
            fVar302 = fStack_7d0 * fVar210 * -fVar263;
            auVar76._16_4_ = fVar302;
            fVar303 = fStack_7cc * fVar212 * -fVar264;
            auVar76._20_4_ = fVar303;
            fVar305 = fStack_7c8 * fVar241 * -fVar266;
            auVar76._24_4_ = fVar305;
            auVar76._28_4_ = -fVar214;
            local_720._4_4_ = local_780._4_4_ + fVar295;
            local_720._0_4_ = local_780._0_4_ + fVar291;
            uStack_718._0_4_ = local_780._8_4_ + fVar298;
            uStack_718._4_4_ = local_780._12_4_ + fVar301;
            auStack_710._0_4_ = local_780._16_4_ + fVar302;
            auStack_710._4_4_ = local_780._20_4_ + fVar303;
            fStack_708 = local_780._24_4_ + fVar305;
            fStack_704 = local_780._28_4_ + -fVar214;
            fVar291 = fVar169 * 0.0 * fVar130;
            fVar295 = fVar170 * 0.0 * fVar143;
            auVar77._4_4_ = fVar295;
            auVar77._0_4_ = fVar291;
            fVar298 = fVar172 * 0.0 * fStack_7d8;
            auVar77._8_4_ = fVar298;
            fVar301 = fVar200 * 0.0 * fStack_7d4;
            auVar77._12_4_ = fVar301;
            fVar302 = fVar210 * 0.0 * fStack_7d0;
            auVar77._16_4_ = fVar302;
            fVar303 = fVar212 * 0.0 * fStack_7cc;
            auVar77._20_4_ = fVar303;
            fVar305 = fVar241 * 0.0 * fStack_7c8;
            auVar77._24_4_ = fVar305;
            auVar77._28_4_ = fVar214;
            auVar204 = vsubps_avx(auVar273,auVar75);
            auVar324._0_4_ = fVar291 + auVar140._0_4_;
            auVar324._4_4_ = fVar295 + auVar140._4_4_;
            auVar324._8_4_ = fVar298 + auVar140._8_4_;
            auVar324._12_4_ = fVar301 + auVar140._12_4_;
            auVar324._16_4_ = fVar302 + auVar140._16_4_;
            auVar324._20_4_ = fVar303 + auVar140._20_4_;
            auVar324._24_4_ = fVar305 + auVar140._24_4_;
            auVar324._28_4_ = fVar214 + auVar140._28_4_;
            fVar291 = auVar314._0_4_ * fVar192 * fVar188;
            fVar188 = auVar314._4_4_ * fVar196 * fVar193;
            auVar78._4_4_ = fVar188;
            auVar78._0_4_ = fVar291;
            fVar295 = auVar314._8_4_ * fVar231 * fVar197;
            auVar78._8_4_ = fVar295;
            fVar193 = auVar314._12_4_ * fVar267 * fVar228;
            auVar78._12_4_ = fVar193;
            fVar298 = auVar314._16_4_ * fVar145 * fVar230;
            auVar78._16_4_ = fVar298;
            fVar197 = auVar314._20_4_ * fVar158 * fVar229;
            auVar78._20_4_ = fVar197;
            fVar301 = auVar314._24_4_ * fVar215 * fVar159;
            auVar78._24_4_ = fVar301;
            auVar78._28_4_ = fStack_7c4;
            auVar31 = vsubps_avx(local_780._0_32_,auVar76);
            auVar316._0_4_ = auVar238._0_4_ + fVar291;
            auVar316._4_4_ = auVar238._4_4_ + fVar188;
            auVar316._8_4_ = auVar238._8_4_ + fVar295;
            auVar316._12_4_ = auVar238._12_4_ + fVar193;
            auVar316._16_4_ = auVar238._16_4_ + fVar298;
            auVar316._20_4_ = auVar238._20_4_ + fVar197;
            auVar316._24_4_ = auVar238._24_4_ + fVar301;
            auVar316._28_4_ = auVar238._28_4_ + fStack_7c4;
            fVar291 = fVar192 * -fVar190 * auVar314._0_4_;
            fVar188 = fVar196 * -fVar194 * auVar314._4_4_;
            auVar79._4_4_ = fVar188;
            auVar79._0_4_ = fVar291;
            fVar295 = fVar231 * -fVar198 * auVar314._8_4_;
            auVar79._8_4_ = fVar295;
            fVar193 = fVar267 * -fVar265 * auVar314._12_4_;
            auVar79._12_4_ = fVar193;
            fVar298 = fVar145 * -fVar268 * auVar314._16_4_;
            auVar79._16_4_ = fVar298;
            fVar197 = fVar158 * -fVar157 * auVar314._20_4_;
            auVar79._20_4_ = fVar197;
            fVar301 = fVar215 * -fVar173 * auVar314._24_4_;
            auVar79._24_4_ = fVar301;
            auVar79._28_4_ = auVar273._28_4_;
            auVar32 = vsubps_avx(auVar140,auVar77);
            auVar207._0_4_ = auVar222._0_4_ + fVar291;
            auVar207._4_4_ = auVar222._4_4_ + fVar188;
            auVar207._8_4_ = auVar222._8_4_ + fVar295;
            auVar207._12_4_ = auVar222._12_4_ + fVar193;
            auVar207._16_4_ = auVar222._16_4_ + fVar298;
            auVar207._20_4_ = auVar222._20_4_ + fVar197;
            auVar207._24_4_ = auVar222._24_4_ + fVar301;
            auVar207._28_4_ = auVar222._28_4_ + auVar273._28_4_;
            fVar291 = fVar192 * 0.0 * auVar314._0_4_;
            fVar188 = fVar196 * 0.0 * auVar314._4_4_;
            auVar80._4_4_ = fVar188;
            auVar80._0_4_ = fVar291;
            fVar295 = fVar231 * 0.0 * auVar314._8_4_;
            auVar80._8_4_ = fVar295;
            fVar193 = fVar267 * 0.0 * auVar314._12_4_;
            auVar80._12_4_ = fVar193;
            fVar298 = fVar145 * 0.0 * auVar314._16_4_;
            auVar80._16_4_ = fVar298;
            fVar197 = fVar158 * 0.0 * auVar314._20_4_;
            auVar80._20_4_ = fVar197;
            fVar301 = fVar215 * 0.0 * auVar314._24_4_;
            auVar80._24_4_ = fVar301;
            auVar80._28_4_ = auVar140._28_4_;
            auVar155 = vsubps_avx(auVar238,auVar78);
            auVar275._0_4_ = (float)local_5e0._0_4_ + fVar291;
            auVar275._4_4_ = (float)local_5e0._4_4_ + fVar188;
            auVar275._8_4_ = fStack_5d8 + fVar295;
            auVar275._12_4_ = fStack_5d4 + fVar193;
            auVar275._16_4_ = fStack_5d0 + fVar298;
            auVar275._20_4_ = fStack_5cc + fVar197;
            auVar275._24_4_ = fStack_5c8 + fVar301;
            auVar275._28_4_ = fStack_5c4 + auVar140._28_4_;
            auVar28 = vsubps_avx(auVar222,auVar79);
            auVar30 = vsubps_avx(_local_5e0,auVar80);
            auVar182 = vsubps_avx(auVar207,auVar31);
            auVar183 = vsubps_avx(auVar275,auVar32);
            auVar81._4_4_ = auVar32._4_4_ * auVar182._4_4_;
            auVar81._0_4_ = auVar32._0_4_ * auVar182._0_4_;
            auVar81._8_4_ = auVar32._8_4_ * auVar182._8_4_;
            auVar81._12_4_ = auVar32._12_4_ * auVar182._12_4_;
            auVar81._16_4_ = auVar32._16_4_ * auVar182._16_4_;
            auVar81._20_4_ = auVar32._20_4_ * auVar182._20_4_;
            auVar81._24_4_ = auVar32._24_4_ * auVar182._24_4_;
            auVar81._28_4_ = auVar311._28_4_;
            auVar82._4_4_ = auVar31._4_4_ * auVar183._4_4_;
            auVar82._0_4_ = auVar31._0_4_ * auVar183._0_4_;
            auVar82._8_4_ = auVar31._8_4_ * auVar183._8_4_;
            auVar82._12_4_ = auVar31._12_4_ * auVar183._12_4_;
            auVar82._16_4_ = auVar31._16_4_ * auVar183._16_4_;
            auVar82._20_4_ = auVar31._20_4_ * auVar183._20_4_;
            auVar82._24_4_ = auVar31._24_4_ * auVar183._24_4_;
            auVar82._28_4_ = fStack_5c4;
            auVar271 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar204._4_4_ * auVar183._4_4_;
            auVar83._0_4_ = auVar204._0_4_ * auVar183._0_4_;
            auVar83._8_4_ = auVar204._8_4_ * auVar183._8_4_;
            auVar83._12_4_ = auVar204._12_4_ * auVar183._12_4_;
            auVar83._16_4_ = auVar204._16_4_ * auVar183._16_4_;
            auVar83._20_4_ = auVar204._20_4_ * auVar183._20_4_;
            auVar83._24_4_ = auVar204._24_4_ * auVar183._24_4_;
            auVar83._28_4_ = auVar183._28_4_;
            auVar183 = vsubps_avx(auVar316,auVar204);
            auVar84._4_4_ = auVar32._4_4_ * auVar183._4_4_;
            auVar84._0_4_ = auVar32._0_4_ * auVar183._0_4_;
            auVar84._8_4_ = auVar32._8_4_ * auVar183._8_4_;
            auVar84._12_4_ = auVar32._12_4_ * auVar183._12_4_;
            auVar84._16_4_ = auVar32._16_4_ * auVar183._16_4_;
            auVar84._20_4_ = auVar32._20_4_ * auVar183._20_4_;
            auVar84._24_4_ = auVar32._24_4_ * auVar183._24_4_;
            auVar84._28_4_ = auVar29._28_4_;
            auVar308 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar31._4_4_ * auVar183._4_4_;
            auVar85._0_4_ = auVar31._0_4_ * auVar183._0_4_;
            auVar85._8_4_ = auVar31._8_4_ * auVar183._8_4_;
            auVar85._12_4_ = auVar31._12_4_ * auVar183._12_4_;
            auVar85._16_4_ = auVar31._16_4_ * auVar183._16_4_;
            auVar85._20_4_ = auVar31._20_4_ * auVar183._20_4_;
            auVar85._24_4_ = auVar31._24_4_ * auVar183._24_4_;
            auVar85._28_4_ = auVar29._28_4_;
            auVar86._4_4_ = auVar204._4_4_ * auVar182._4_4_;
            auVar86._0_4_ = auVar204._0_4_ * auVar182._0_4_;
            auVar86._8_4_ = auVar204._8_4_ * auVar182._8_4_;
            auVar86._12_4_ = auVar204._12_4_ * auVar182._12_4_;
            auVar86._16_4_ = auVar204._16_4_ * auVar182._16_4_;
            auVar86._20_4_ = auVar204._20_4_ * auVar182._20_4_;
            auVar86._24_4_ = auVar204._24_4_ * auVar182._24_4_;
            auVar86._28_4_ = auVar182._28_4_;
            auVar29 = vsubps_avx(auVar86,auVar85);
            auVar153._0_4_ = auVar271._0_4_ * 0.0 + auVar29._0_4_ + auVar308._0_4_ * 0.0;
            auVar153._4_4_ = auVar271._4_4_ * 0.0 + auVar29._4_4_ + auVar308._4_4_ * 0.0;
            auVar153._8_4_ = auVar271._8_4_ * 0.0 + auVar29._8_4_ + auVar308._8_4_ * 0.0;
            auVar153._12_4_ = auVar271._12_4_ * 0.0 + auVar29._12_4_ + auVar308._12_4_ * 0.0;
            auVar153._16_4_ = auVar271._16_4_ * 0.0 + auVar29._16_4_ + auVar308._16_4_ * 0.0;
            auVar153._20_4_ = auVar271._20_4_ * 0.0 + auVar29._20_4_ + auVar308._20_4_ * 0.0;
            auVar153._24_4_ = auVar271._24_4_ * 0.0 + auVar29._24_4_ + auVar308._24_4_ * 0.0;
            auVar153._28_4_ = auVar271._28_4_ + auVar29._28_4_ + auVar308._28_4_;
            auVar307 = vcmpps_avx(auVar153,ZEXT832(0) << 0x20,2);
            auVar155 = vblendvps_avx(auVar155,_local_700,auVar307);
            auVar29 = vblendvps_avx(auVar28,_local_720,auVar307);
            auVar28 = vblendvps_avx(auVar30,auVar324,auVar307);
            auVar30 = vblendvps_avx(auVar204,auVar316,auVar307);
            auVar182 = vblendvps_avx(auVar31,auVar207,auVar307);
            auVar183 = vblendvps_avx(auVar32,auVar275,auVar307);
            auVar204 = vblendvps_avx(auVar316,auVar204,auVar307);
            auVar271 = vblendvps_avx(auVar207,auVar31,auVar307);
            auVar308 = vblendvps_avx(auVar275,auVar32,auVar307);
            local_780._0_32_ = vandps_avx(auVar27,_local_460);
            auVar204 = vsubps_avx(auVar204,auVar155);
            auVar33 = vsubps_avx(auVar271,auVar29);
            auVar308 = vsubps_avx(auVar308,auVar28);
            auVar34 = vsubps_avx(auVar29,auVar182);
            fVar291 = auVar33._0_4_;
            fVar242 = auVar28._0_4_;
            fVar228 = auVar33._4_4_;
            fVar250 = auVar28._4_4_;
            auVar87._4_4_ = fVar250 * fVar228;
            auVar87._0_4_ = fVar242 * fVar291;
            fVar190 = auVar33._8_4_;
            fVar251 = auVar28._8_4_;
            auVar87._8_4_ = fVar251 * fVar190;
            fVar267 = auVar33._12_4_;
            fVar253 = auVar28._12_4_;
            auVar87._12_4_ = fVar253 * fVar267;
            fVar169 = auVar33._16_4_;
            fVar254 = auVar28._16_4_;
            auVar87._16_4_ = fVar254 * fVar169;
            fVar144 = auVar33._20_4_;
            fVar255 = auVar28._20_4_;
            auVar87._20_4_ = fVar255 * fVar144;
            fVar214 = auVar33._24_4_;
            fVar256 = auVar28._24_4_;
            auVar87._24_4_ = fVar256 * fVar214;
            auVar87._28_4_ = auVar271._28_4_;
            fVar188 = auVar29._0_4_;
            fVar269 = auVar308._0_4_;
            fVar302 = auVar29._4_4_;
            fVar276 = auVar308._4_4_;
            auVar88._4_4_ = fVar276 * fVar302;
            auVar88._0_4_ = fVar269 * fVar188;
            fVar192 = auVar29._8_4_;
            fVar277 = auVar308._8_4_;
            auVar88._8_4_ = fVar277 * fVar192;
            fVar268 = auVar29._12_4_;
            fVar278 = auVar308._12_4_;
            auVar88._12_4_ = fVar278 * fVar268;
            fVar170 = auVar29._16_4_;
            fVar279 = auVar308._16_4_;
            auVar88._16_4_ = fVar279 * fVar170;
            fVar240 = auVar29._20_4_;
            fVar280 = auVar308._20_4_;
            auVar88._20_4_ = fVar280 * fVar240;
            fVar286 = auVar29._24_4_;
            fVar281 = auVar308._24_4_;
            uVar11 = auVar31._28_4_;
            auVar88._24_4_ = fVar281 * fVar286;
            auVar88._28_4_ = uVar11;
            auVar271 = vsubps_avx(auVar88,auVar87);
            fVar295 = auVar155._0_4_;
            fVar230 = auVar155._4_4_;
            auVar89._4_4_ = fVar276 * fVar230;
            auVar89._0_4_ = fVar269 * fVar295;
            fVar194 = auVar155._8_4_;
            auVar89._8_4_ = fVar277 * fVar194;
            fVar145 = auVar155._12_4_;
            auVar89._12_4_ = fVar278 * fVar145;
            fVar172 = auVar155._16_4_;
            auVar89._16_4_ = fVar279 * fVar172;
            fVar252 = auVar155._20_4_;
            auVar89._20_4_ = fVar280 * fVar252;
            fVar287 = auVar155._24_4_;
            auVar89._24_4_ = fVar281 * fVar287;
            auVar89._28_4_ = uVar11;
            fVar193 = auVar204._0_4_;
            fVar303 = auVar204._4_4_;
            auVar90._4_4_ = fVar250 * fVar303;
            auVar90._0_4_ = fVar242 * fVar193;
            fVar196 = auVar204._8_4_;
            auVar90._8_4_ = fVar251 * fVar196;
            fVar157 = auVar204._12_4_;
            auVar90._12_4_ = fVar253 * fVar157;
            fVar200 = auVar204._16_4_;
            auVar90._16_4_ = fVar254 * fVar200;
            fVar257 = auVar204._20_4_;
            auVar90._20_4_ = fVar255 * fVar257;
            fVar290 = auVar204._24_4_;
            auVar90._24_4_ = fVar256 * fVar290;
            auVar90._28_4_ = auVar316._28_4_;
            auVar31 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar302 * fVar303;
            auVar91._0_4_ = fVar188 * fVar193;
            auVar91._8_4_ = fVar192 * fVar196;
            auVar91._12_4_ = fVar268 * fVar157;
            auVar91._16_4_ = fVar170 * fVar200;
            auVar91._20_4_ = fVar240 * fVar257;
            auVar91._24_4_ = fVar286 * fVar290;
            auVar91._28_4_ = uVar11;
            auVar92._4_4_ = fVar230 * fVar228;
            auVar92._0_4_ = fVar295 * fVar291;
            auVar92._8_4_ = fVar194 * fVar190;
            auVar92._12_4_ = fVar145 * fVar267;
            auVar92._16_4_ = fVar172 * fVar169;
            auVar92._20_4_ = fVar252 * fVar144;
            auVar92._24_4_ = fVar287 * fVar214;
            auVar92._28_4_ = auVar32._28_4_;
            auVar32 = vsubps_avx(auVar92,auVar91);
            auVar35 = vsubps_avx(auVar28,auVar183);
            fVar197 = auVar32._28_4_ + auVar31._28_4_;
            local_7a0._0_4_ = auVar32._0_4_ + auVar31._0_4_ * 0.0 + auVar271._0_4_ * 0.0;
            local_7a0._4_4_ = auVar32._4_4_ + auVar31._4_4_ * 0.0 + auVar271._4_4_ * 0.0;
            local_7a0._8_4_ = auVar32._8_4_ + auVar31._8_4_ * 0.0 + auVar271._8_4_ * 0.0;
            local_7a0._12_4_ = auVar32._12_4_ + auVar31._12_4_ * 0.0 + auVar271._12_4_ * 0.0;
            local_7a0._16_4_ = auVar32._16_4_ + auVar31._16_4_ * 0.0 + auVar271._16_4_ * 0.0;
            local_7a0._20_4_ = auVar32._20_4_ + auVar31._20_4_ * 0.0 + auVar271._20_4_ * 0.0;
            local_7a0._24_4_ = auVar32._24_4_ + auVar31._24_4_ * 0.0 + auVar271._24_4_ * 0.0;
            local_7a0._28_4_ = fVar197 + auVar271._28_4_;
            fVar298 = auVar34._0_4_;
            fVar229 = auVar34._4_4_;
            auVar93._4_4_ = auVar183._4_4_ * fVar229;
            auVar93._0_4_ = auVar183._0_4_ * fVar298;
            fVar198 = auVar34._8_4_;
            auVar93._8_4_ = auVar183._8_4_ * fVar198;
            fVar158 = auVar34._12_4_;
            auVar93._12_4_ = auVar183._12_4_ * fVar158;
            fVar210 = auVar34._16_4_;
            auVar93._16_4_ = auVar183._16_4_ * fVar210;
            fVar263 = auVar34._20_4_;
            auVar93._20_4_ = auVar183._20_4_ * fVar263;
            fVar294 = auVar34._24_4_;
            auVar93._24_4_ = auVar183._24_4_ * fVar294;
            auVar93._28_4_ = fVar197;
            fVar197 = auVar35._0_4_;
            fVar305 = auVar35._4_4_;
            auVar94._4_4_ = auVar182._4_4_ * fVar305;
            auVar94._0_4_ = auVar182._0_4_ * fVar197;
            fVar231 = auVar35._8_4_;
            auVar94._8_4_ = auVar182._8_4_ * fVar231;
            fVar173 = auVar35._12_4_;
            auVar94._12_4_ = auVar182._12_4_ * fVar173;
            fVar212 = auVar35._16_4_;
            auVar94._16_4_ = auVar182._16_4_ * fVar212;
            fVar264 = auVar35._20_4_;
            auVar94._20_4_ = auVar182._20_4_ * fVar264;
            fVar296 = auVar35._24_4_;
            auVar94._24_4_ = auVar182._24_4_ * fVar296;
            auVar94._28_4_ = auVar32._28_4_;
            auVar31 = vsubps_avx(auVar94,auVar93);
            auVar32 = vsubps_avx(auVar155,auVar30);
            fVar301 = auVar32._0_4_;
            fVar159 = auVar32._4_4_;
            auVar95._4_4_ = auVar183._4_4_ * fVar159;
            auVar95._0_4_ = auVar183._0_4_ * fVar301;
            fVar265 = auVar32._8_4_;
            auVar95._8_4_ = auVar183._8_4_ * fVar265;
            fVar215 = auVar32._12_4_;
            auVar95._12_4_ = auVar183._12_4_ * fVar215;
            fVar241 = auVar32._16_4_;
            auVar95._16_4_ = auVar183._16_4_ * fVar241;
            fVar266 = auVar32._20_4_;
            auVar95._20_4_ = auVar183._20_4_ * fVar266;
            fVar299 = auVar32._24_4_;
            auVar95._24_4_ = auVar183._24_4_ * fVar299;
            auVar95._28_4_ = auVar183._28_4_;
            auVar96._4_4_ = fVar305 * auVar30._4_4_;
            auVar96._0_4_ = fVar197 * auVar30._0_4_;
            auVar96._8_4_ = fVar231 * auVar30._8_4_;
            auVar96._12_4_ = fVar173 * auVar30._12_4_;
            auVar96._16_4_ = fVar212 * auVar30._16_4_;
            auVar96._20_4_ = fVar264 * auVar30._20_4_;
            auVar96._24_4_ = fVar296 * auVar30._24_4_;
            auVar96._28_4_ = auVar271._28_4_;
            auVar183 = vsubps_avx(auVar95,auVar96);
            auVar97._4_4_ = auVar182._4_4_ * fVar159;
            auVar97._0_4_ = auVar182._0_4_ * fVar301;
            auVar97._8_4_ = auVar182._8_4_ * fVar265;
            auVar97._12_4_ = auVar182._12_4_ * fVar215;
            auVar97._16_4_ = auVar182._16_4_ * fVar241;
            auVar97._20_4_ = auVar182._20_4_ * fVar266;
            auVar97._24_4_ = auVar182._24_4_ * fVar299;
            auVar97._28_4_ = auVar182._28_4_;
            auVar98._4_4_ = fVar229 * auVar30._4_4_;
            auVar98._0_4_ = fVar298 * auVar30._0_4_;
            auVar98._8_4_ = fVar198 * auVar30._8_4_;
            auVar98._12_4_ = fVar158 * auVar30._12_4_;
            auVar98._16_4_ = fVar210 * auVar30._16_4_;
            auVar98._20_4_ = fVar263 * auVar30._20_4_;
            auVar98._24_4_ = fVar294 * auVar30._24_4_;
            auVar98._28_4_ = auVar30._28_4_;
            auVar30 = vsubps_avx(auVar98,auVar97);
            auVar141._0_4_ = auVar31._0_4_ * 0.0 + auVar30._0_4_ + auVar183._0_4_ * 0.0;
            auVar141._4_4_ = auVar31._4_4_ * 0.0 + auVar30._4_4_ + auVar183._4_4_ * 0.0;
            auVar141._8_4_ = auVar31._8_4_ * 0.0 + auVar30._8_4_ + auVar183._8_4_ * 0.0;
            auVar141._12_4_ = auVar31._12_4_ * 0.0 + auVar30._12_4_ + auVar183._12_4_ * 0.0;
            auVar141._16_4_ = auVar31._16_4_ * 0.0 + auVar30._16_4_ + auVar183._16_4_ * 0.0;
            auVar141._20_4_ = auVar31._20_4_ * 0.0 + auVar30._20_4_ + auVar183._20_4_ * 0.0;
            auVar141._24_4_ = auVar31._24_4_ * 0.0 + auVar30._24_4_ + auVar183._24_4_ * 0.0;
            auVar141._28_4_ = auVar183._28_4_ + auVar30._28_4_ + auVar183._28_4_;
            auVar142 = ZEXT3264(auVar141);
            auVar30 = vmaxps_avx(local_7a0,auVar141);
            auVar30 = vcmpps_avx(auVar30,ZEXT432(0) << 0x20,2);
            auVar182 = local_780._0_32_ & auVar30;
            if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar182 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar182 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar182 >> 0x7f,0) == '\0') &&
                  (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar182 >> 0xbf,0) == '\0') &&
                (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar182[0x1f]) {
LAB_0107e1a4:
              auVar156 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar262._4_4_ = fVar143;
              auVar262._0_4_ = fVar130;
              auVar262._8_4_ = fStack_7d8;
              auVar262._12_4_ = fStack_7d4;
              auVar262._16_4_ = fStack_7d0;
              auVar262._20_4_ = fStack_7cc;
              auVar262._24_4_ = fStack_7c8;
              auVar262._28_4_ = fStack_7c4;
            }
            else {
              auVar182 = vandps_avx(auVar30,local_780._0_32_);
              auVar99._4_4_ = fVar305 * fVar228;
              auVar99._0_4_ = fVar197 * fVar291;
              auVar99._8_4_ = fVar231 * fVar190;
              auVar99._12_4_ = fVar173 * fVar267;
              auVar99._16_4_ = fVar212 * fVar169;
              auVar99._20_4_ = fVar264 * fVar144;
              auVar99._24_4_ = fVar296 * fVar214;
              auVar99._28_4_ = local_780._28_4_;
              auVar100._4_4_ = fVar229 * fVar276;
              auVar100._0_4_ = fVar298 * fVar269;
              auVar100._8_4_ = fVar198 * fVar277;
              auVar100._12_4_ = fVar158 * fVar278;
              auVar100._16_4_ = fVar210 * fVar279;
              auVar100._20_4_ = fVar263 * fVar280;
              auVar100._24_4_ = fVar294 * fVar281;
              auVar100._28_4_ = auVar30._28_4_;
              auVar183 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar159 * fVar276;
              auVar101._0_4_ = fVar301 * fVar269;
              auVar101._8_4_ = fVar265 * fVar277;
              auVar101._12_4_ = fVar215 * fVar278;
              auVar101._16_4_ = fVar241 * fVar279;
              auVar101._20_4_ = fVar266 * fVar280;
              auVar101._24_4_ = fVar299 * fVar281;
              auVar101._28_4_ = auVar308._28_4_;
              auVar102._4_4_ = fVar305 * fVar303;
              auVar102._0_4_ = fVar197 * fVar193;
              auVar102._8_4_ = fVar231 * fVar196;
              auVar102._12_4_ = fVar173 * fVar157;
              auVar102._16_4_ = fVar212 * fVar200;
              auVar102._20_4_ = fVar264 * fVar257;
              auVar102._24_4_ = fVar296 * fVar290;
              auVar102._28_4_ = auVar35._28_4_;
              auVar271 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar229 * fVar303;
              auVar103._0_4_ = fVar298 * fVar193;
              auVar103._8_4_ = fVar198 * fVar196;
              auVar103._12_4_ = fVar158 * fVar157;
              auVar103._16_4_ = fVar210 * fVar200;
              auVar103._20_4_ = fVar263 * fVar257;
              auVar103._24_4_ = fVar294 * fVar290;
              auVar103._28_4_ = auVar204._28_4_;
              auVar104._4_4_ = fVar159 * fVar228;
              auVar104._0_4_ = fVar301 * fVar291;
              auVar104._8_4_ = fVar265 * fVar190;
              auVar104._12_4_ = fVar215 * fVar267;
              auVar104._16_4_ = fVar241 * fVar169;
              auVar104._20_4_ = fVar266 * fVar144;
              auVar104._24_4_ = fVar299 * fVar214;
              auVar104._28_4_ = auVar33._28_4_;
              auVar308 = vsubps_avx(auVar104,auVar103);
              auVar154._0_4_ = auVar183._0_4_ * 0.0 + auVar308._0_4_ + auVar271._0_4_ * 0.0;
              auVar154._4_4_ = auVar183._4_4_ * 0.0 + auVar308._4_4_ + auVar271._4_4_ * 0.0;
              auVar154._8_4_ = auVar183._8_4_ * 0.0 + auVar308._8_4_ + auVar271._8_4_ * 0.0;
              auVar154._12_4_ = auVar183._12_4_ * 0.0 + auVar308._12_4_ + auVar271._12_4_ * 0.0;
              auVar154._16_4_ = auVar183._16_4_ * 0.0 + auVar308._16_4_ + auVar271._16_4_ * 0.0;
              auVar154._20_4_ = auVar183._20_4_ * 0.0 + auVar308._20_4_ + auVar271._20_4_ * 0.0;
              auVar154._24_4_ = auVar183._24_4_ * 0.0 + auVar308._24_4_ + auVar271._24_4_ * 0.0;
              auVar154._28_4_ = auVar33._28_4_ + auVar308._28_4_ + auVar204._28_4_;
              auVar30 = vrcpps_avx(auVar154);
              fVar193 = auVar30._0_4_;
              fVar298 = auVar30._4_4_;
              auVar105._4_4_ = auVar154._4_4_ * fVar298;
              auVar105._0_4_ = auVar154._0_4_ * fVar193;
              fVar197 = auVar30._8_4_;
              auVar105._8_4_ = auVar154._8_4_ * fVar197;
              fVar301 = auVar30._12_4_;
              auVar105._12_4_ = auVar154._12_4_ * fVar301;
              fVar228 = auVar30._16_4_;
              auVar105._16_4_ = auVar154._16_4_ * fVar228;
              fVar303 = auVar30._20_4_;
              auVar105._20_4_ = auVar154._20_4_ * fVar303;
              fVar229 = auVar30._24_4_;
              auVar105._24_4_ = auVar154._24_4_ * fVar229;
              auVar105._28_4_ = auVar35._28_4_;
              auVar312._8_4_ = 0x3f800000;
              auVar312._0_8_ = &DAT_3f8000003f800000;
              auVar312._12_4_ = 0x3f800000;
              auVar312._16_4_ = 0x3f800000;
              auVar312._20_4_ = 0x3f800000;
              auVar312._24_4_ = 0x3f800000;
              auVar312._28_4_ = 0x3f800000;
              auVar30 = vsubps_avx(auVar312,auVar105);
              fVar193 = auVar30._0_4_ * fVar193 + fVar193;
              fVar298 = auVar30._4_4_ * fVar298 + fVar298;
              fVar197 = auVar30._8_4_ * fVar197 + fVar197;
              fVar301 = auVar30._12_4_ * fVar301 + fVar301;
              fVar228 = auVar30._16_4_ * fVar228 + fVar228;
              fVar303 = auVar30._20_4_ * fVar303 + fVar303;
              fVar229 = auVar30._24_4_ * fVar229 + fVar229;
              auVar106._4_4_ =
                   (fVar230 * auVar183._4_4_ + auVar271._4_4_ * fVar302 + auVar308._4_4_ * fVar250)
                   * fVar298;
              auVar106._0_4_ =
                   (fVar295 * auVar183._0_4_ + auVar271._0_4_ * fVar188 + auVar308._0_4_ * fVar242)
                   * fVar193;
              auVar106._8_4_ =
                   (fVar194 * auVar183._8_4_ + auVar271._8_4_ * fVar192 + auVar308._8_4_ * fVar251)
                   * fVar197;
              auVar106._12_4_ =
                   (fVar145 * auVar183._12_4_ +
                   auVar271._12_4_ * fVar268 + auVar308._12_4_ * fVar253) * fVar301;
              auVar106._16_4_ =
                   (fVar172 * auVar183._16_4_ +
                   auVar271._16_4_ * fVar170 + auVar308._16_4_ * fVar254) * fVar228;
              auVar106._20_4_ =
                   (fVar252 * auVar183._20_4_ +
                   auVar271._20_4_ * fVar240 + auVar308._20_4_ * fVar255) * fVar303;
              auVar106._24_4_ =
                   (fVar287 * auVar183._24_4_ +
                   auVar271._24_4_ * fVar286 + auVar308._24_4_ * fVar256) * fVar229;
              auVar106._28_4_ = auVar155._28_4_ + auVar29._28_4_ + auVar28._28_4_;
              fVar291 = ray->tfar;
              auVar208._4_4_ = fVar291;
              auVar208._0_4_ = fVar291;
              auVar208._8_4_ = fVar291;
              auVar208._12_4_ = fVar291;
              auVar208._16_4_ = fVar291;
              auVar208._20_4_ = fVar291;
              auVar208._24_4_ = fVar291;
              auVar208._28_4_ = fVar291;
              auVar155 = vcmpps_avx(local_120,auVar106,2);
              auVar29 = vcmpps_avx(auVar106,auVar208,2);
              auVar155 = vandps_avx(auVar155,auVar29);
              auVar28 = auVar182 & auVar155;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0x7f,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0xbf,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar28[0x1f]) goto LAB_0107e1a4;
              auVar155 = vandps_avx(auVar182,auVar155);
              auVar28 = vcmpps_avx(ZEXT432(0) << 0x20,auVar154,4);
              auVar30 = auVar155 & auVar28;
              auVar156 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar262._4_4_ = fVar143;
              auVar262._0_4_ = fVar130;
              auVar262._8_4_ = fStack_7d8;
              auVar262._12_4_ = fStack_7d4;
              auVar262._16_4_ = fStack_7d0;
              auVar262._20_4_ = fStack_7cc;
              auVar262._24_4_ = fStack_7c8;
              auVar262._28_4_ = fStack_7c4;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar155 = vandps_avx(auVar28,auVar155);
                auVar156 = ZEXT3264(auVar155);
                auVar107._4_4_ = fVar298 * local_7a0._4_4_;
                auVar107._0_4_ = fVar193 * (float)local_7a0._0_4_;
                auVar107._8_4_ = fVar197 * local_7a0._8_4_;
                auVar107._12_4_ = fVar301 * local_7a0._12_4_;
                auVar107._16_4_ = fVar228 * local_7a0._16_4_;
                auVar107._20_4_ = fVar303 * local_7a0._20_4_;
                auVar107._24_4_ = fVar229 * local_7a0._24_4_;
                auVar107._28_4_ = auVar29._28_4_;
                auVar108._4_4_ = auVar141._4_4_ * fVar298;
                auVar108._0_4_ = auVar141._0_4_ * fVar193;
                auVar108._8_4_ = auVar141._8_4_ * fVar197;
                auVar108._12_4_ = auVar141._12_4_ * fVar301;
                auVar108._16_4_ = auVar141._16_4_ * fVar228;
                auVar108._20_4_ = auVar141._20_4_ * fVar303;
                auVar108._24_4_ = auVar141._24_4_ * fVar229;
                auVar108._28_4_ = auVar141._28_4_;
                auVar239._8_4_ = 0x3f800000;
                auVar239._0_8_ = &DAT_3f8000003f800000;
                auVar239._12_4_ = 0x3f800000;
                auVar239._16_4_ = 0x3f800000;
                auVar239._20_4_ = 0x3f800000;
                auVar239._24_4_ = 0x3f800000;
                auVar239._28_4_ = 0x3f800000;
                auVar155 = vsubps_avx(auVar239,auVar107);
                _local_180 = vblendvps_avx(auVar155,auVar107,auVar307);
                auVar155 = vsubps_avx(auVar239,auVar108);
                _local_380 = vblendvps_avx(auVar155,auVar108,auVar307);
                auVar142 = ZEXT3264(_local_380);
                local_1a0 = auVar106;
              }
            }
            auVar319 = ZEXT3264(local_660);
            auVar155 = auVar156._0_32_;
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0x7f,0) != '\0') ||
                  (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar155 >> 0xbf,0) != '\0') ||
                (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar156[0x1f] < '\0') {
              auVar29 = vsubps_avx(auVar314,auVar262);
              fVar188 = auVar262._0_4_ + auVar29._0_4_ * (float)local_180._0_4_;
              fVar295 = auVar262._4_4_ + auVar29._4_4_ * (float)local_180._4_4_;
              fVar193 = auVar262._8_4_ + auVar29._8_4_ * fStack_178;
              fVar298 = auVar262._12_4_ + auVar29._12_4_ * fStack_174;
              fVar197 = auVar262._16_4_ + auVar29._16_4_ * fStack_170;
              fVar301 = auVar262._20_4_ + auVar29._20_4_ * fStack_16c;
              fVar130 = auVar262._24_4_ + auVar29._24_4_ * fStack_168;
              fVar143 = auVar262._28_4_ + auVar29._28_4_;
              fVar291 = local_7a8->depth_scale;
              auVar109._4_4_ = (fVar295 + fVar295) * fVar291;
              auVar109._0_4_ = (fVar188 + fVar188) * fVar291;
              auVar109._8_4_ = (fVar193 + fVar193) * fVar291;
              auVar109._12_4_ = (fVar298 + fVar298) * fVar291;
              auVar109._16_4_ = (fVar197 + fVar197) * fVar291;
              auVar109._20_4_ = (fVar301 + fVar301) * fVar291;
              auVar109._24_4_ = (fVar130 + fVar130) * fVar291;
              auVar109._28_4_ = fVar143 + fVar143;
              auVar29 = vcmpps_avx(local_1a0,auVar109,6);
              auVar142 = ZEXT3264(auVar29);
              auVar28 = auVar155 & auVar29;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                local_220 = vandps_avx(auVar29,auVar155);
                auVar142 = ZEXT3264(local_220);
                auVar149._0_8_ =
                     CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                              (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
                auVar149._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
                auVar149._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
                auVar150._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
                auVar150._0_16_ = auVar149;
                auVar150._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_368 + (float)uStack_368 + -1.0;
                _local_2c0 = auVar150;
                fStack_2a4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
                auVar156 = ZEXT3264(_local_2c0);
                local_2e0 = _local_180;
                local_2a0 = local_1a0;
                local_270 = local_6b0;
                uStack_268 = uStack_6a8;
                local_260 = local_3f0._0_8_;
                uStack_258 = local_3f0._8_8_;
                local_250 = local_400._0_8_;
                uStack_248 = local_400._8_8_;
                local_240 = local_410._0_8_;
                uStack_238 = local_410._8_8_;
                local_6e0._0_8_ = (context->scene->geometries).items[local_7b0].ptr;
                _local_380 = _local_2c0;
                if ((((Geometry *)local_6e0._0_8_)->mask & ray->mask) == 0) {
                  pRVar124 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar124 = context->args;
                  if ((pRVar124->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar124 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar124 >> 8),1),
                     ((Geometry *)local_6e0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_6e0._8_24_ = auVar238._8_24_;
                    _auStack_7fc = auVar314._4_28_;
                    local_800 = (undefined1  [4])(int)uVar125;
                    auVar325 = vshufps_avx(ZEXT416((uint)(float)(int)local_280),
                                           ZEXT416((uint)(float)(int)local_280),0);
                    local_200[0] = (auVar325._0_4_ + (float)local_180._0_4_ + 0.0) *
                                   (float)local_3e0._0_4_;
                    local_200[1] = (auVar325._4_4_ + (float)local_180._4_4_ + 1.0) *
                                   (float)local_3e0._4_4_;
                    local_200[2] = (auVar325._8_4_ + fStack_178 + 2.0) * fStack_3d8;
                    local_200[3] = (auVar325._12_4_ + fStack_174 + 3.0) * fStack_3d4;
                    fStack_1f0 = (auVar325._0_4_ + fStack_170 + 4.0) * fStack_3d0;
                    fStack_1ec = (auVar325._4_4_ + fStack_16c + 5.0) * fStack_3cc;
                    fStack_1e8 = (auVar325._8_4_ + fStack_168 + 6.0) * fStack_3c8;
                    fStack_1e4 = auVar325._12_4_ + fStack_164 + 7.0;
                    uStack_378 = auVar149._8_8_;
                    uStack_370 = auVar150._16_8_;
                    uStack_368 = local_2c0._24_8_;
                    local_1e0 = auVar149._0_8_;
                    uStack_1d8 = uStack_378;
                    uStack_1d0 = uStack_370;
                    uStack_1c8 = uStack_368;
                    auVar156 = ZEXT3264(local_1a0);
                    local_1c0 = local_1a0;
                    iVar123 = vmovmskps_avx(local_220);
                    uVar125 = CONCAT44((int)((ulong)pRVar124 >> 0x20),iVar123);
                    lVar16 = 0;
                    if (uVar125 != 0) {
                      for (; (uVar125 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                      }
                    }
                    local_7e0 = (uint)lVar16;
                    uStack_7dc = (undefined4)((ulong)lVar16 >> 0x20);
                    local_780._0_8_ = uVar125;
                    local_640._4_28_ = auVar222._4_28_;
                    local_640._0_4_ = (int)CONCAT71((int7)(uVar125 >> 8),iVar123 != 0);
                    if (iVar123 != 0) {
                      _local_700 = local_3f0;
                      _auStack_5b0 = auVar27._16_16_;
                      _local_5c0 = local_400;
                      _local_720 = local_410;
                      _local_540 = auVar36;
                      local_27c = uVar127;
                      do {
                        lVar16 = CONCAT44(uStack_7dc,local_7e0);
                        local_694 = local_200[lVar16];
                        auVar142 = ZEXT464((uint)local_694);
                        local_690 = *(uint *)((long)&local_1e0 + lVar16 * 4);
                        auVar156 = ZEXT464(local_690);
                        local_7a0._0_4_ = ray->tfar;
                        ray->tfar = *(float *)(local_1c0 + lVar16 * 4);
                        fVar160 = 1.0 - local_694;
                        fVar282 = local_694 * 3.0;
                        auVar325 = ZEXT416((uint)((fVar160 * -2.0 * local_694 +
                                                  local_694 * local_694) * 0.5));
                        auVar325 = vshufps_avx(auVar325,auVar325,0);
                        auVar179 = ZEXT416((uint)(((fVar160 + fVar160) * (fVar282 + 2.0) +
                                                  fVar160 * fVar160 * -3.0) * 0.5));
                        auVar179 = vshufps_avx(auVar179,auVar179,0);
                        auVar180 = ZEXT416((uint)(((local_694 + local_694) * (fVar282 + -5.0) +
                                                  local_694 * fVar282) * 0.5));
                        auVar180 = vshufps_avx(auVar180,auVar180,0);
                        auVar181 = ZEXT416((uint)((local_694 * (fVar160 + fVar160) -
                                                  fVar160 * fVar160) * 0.5));
                        auVar181 = vshufps_avx(auVar181,auVar181,0);
                        auVar165._0_4_ =
                             auVar181._0_4_ * (float)local_6b0._0_4_ +
                             auVar180._0_4_ * (float)local_700._0_4_ +
                             auVar325._0_4_ * (float)local_720._0_4_ +
                             auVar179._0_4_ * (float)local_5c0._0_4_;
                        auVar165._4_4_ =
                             auVar181._4_4_ * (float)local_6b0._4_4_ +
                             auVar180._4_4_ * (float)local_700._4_4_ +
                             auVar325._4_4_ * (float)local_720._4_4_ +
                             auVar179._4_4_ * (float)local_5c0._4_4_;
                        auVar165._8_4_ =
                             auVar181._8_4_ * (float)uStack_6a8 +
                             auVar180._8_4_ * (float)uStack_6f8 +
                             auVar325._8_4_ * (float)uStack_718 + auVar179._8_4_ * (float)uStack_5b8
                        ;
                        auVar165._12_4_ =
                             auVar181._12_4_ * uStack_6a8._4_4_ +
                             auVar180._12_4_ * uStack_6f8._4_4_ +
                             auVar325._12_4_ * uStack_718._4_4_ + auVar179._12_4_ * uStack_5b8._4_4_
                        ;
                        local_750.context = context->user;
                        local_6a0 = vmovlps_avx(auVar165);
                        local_698 = vextractps_avx(auVar165,2);
                        local_68c = (undefined4)local_668;
                        local_688 = (undefined4)local_7b0;
                        local_684 = (local_750.context)->instID[0];
                        local_680 = (local_750.context)->instPrimID[0];
                        local_804 = -1;
                        local_750.valid = &local_804;
                        local_750.geometryUserPtr = *(void **)(local_6e0._0_8_ + 0x18);
                        local_750.hit = (RTCHitN *)&local_6a0;
                        local_750.N = 1;
                        local_750.ray = (RTCRayN *)ray;
                        if (*(code **)(local_6e0._0_8_ + 0x48) == (code *)0x0) {
LAB_0107e0b1:
                          p_Var17 = context->args->filter;
                          if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_6e0._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar325 = (*p_Var17)(&local_750);
                            auVar156._0_8_ = auVar325._8_8_;
                            auVar142._0_8_ = auVar325._0_8_;
                            auVar156._8_56_ = extraout_var_02;
                            auVar142._8_56_ = extraout_var_00;
                          }
                          if (*local_750.valid != 0) break;
                        }
                        else {
                          auVar325 = (**(code **)(local_6e0._0_8_ + 0x48))(&local_750);
                          auVar156._0_8_ = auVar325._8_8_;
                          auVar142._0_8_ = auVar325._0_8_;
                          auVar156._8_56_ = extraout_var_01;
                          auVar142._8_56_ = extraout_var;
                          if (*local_750.valid != 0) goto LAB_0107e0b1;
                        }
                        auVar142 = ZEXT464((uint)local_7a0._0_4_);
                        ray->tfar = (float)local_7a0._0_4_;
                        uVar125 = local_780._0_8_ ^ 1L << ((ulong)local_7e0 & 0x3f);
                        lVar16 = 0;
                        if (uVar125 != 0) {
                          for (; (uVar125 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                          }
                        }
                        local_7e0 = (uint)lVar16;
                        uStack_7dc = (undefined4)((ulong)lVar16 >> 0x20);
                        local_780._0_8_ = uVar125;
                        local_640._0_4_ = (int)CONCAT71((int7)(uVar125 >> 8),uVar125 != 0);
                      } while (uVar125 != 0);
                    }
                    pRVar124 = (RTCIntersectArguments *)(ulong)(local_640[0] & 1);
                    auVar319 = ZEXT3264(local_660);
                    uVar125 = (ulong)(uint)local_800;
                  }
                }
                uVar125 = CONCAT71((int7)(uVar125 >> 8),(byte)uVar125 | (byte)pRVar124);
                fVar282 = (float)local_620._0_4_;
                fVar160 = (float)local_620._4_4_;
                fVar171 = fStack_618;
                fVar227 = fStack_614;
                fVar174 = fStack_610;
                fVar187 = fStack_60c;
                fVar189 = fStack_608;
                fVar191 = fStack_604;
                fVar199 = (float)local_5a0._0_4_;
                fVar209 = (float)local_5a0._4_4_;
                fVar211 = fStack_598;
                fVar213 = fStack_594;
                fVar216 = fStack_590;
                fVar224 = fStack_58c;
                fVar225 = fStack_588;
                fVar226 = (float)local_4e0._0_4_;
                fVar288 = (float)local_4e0._4_4_;
                fVar297 = fStack_4d8;
                fVar300 = fStack_4d4;
                fVar195 = fStack_4d0;
                fVar289 = fStack_4cc;
                fVar304 = fStack_4c8;
              }
            }
          }
          lVar128 = lVar128 + 8;
        } while ((int)lVar128 < (int)uVar127);
      }
      if ((uVar125 & 1) != 0) {
        return local_811;
      }
      fVar282 = ray->tfar;
      auVar134._4_4_ = fVar282;
      auVar134._0_4_ = fVar282;
      auVar134._8_4_ = fVar282;
      auVar134._12_4_ = fVar282;
      auVar325 = vcmpps_avx(local_2f0,auVar134,2);
      uVar127 = vmovmskps_avx(auVar325);
      uVar122 = uVar122 & uVar122 + 0xf & uVar127;
      local_811 = uVar122 != 0;
    } while (local_811);
  }
  return local_811;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }